

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  Primitive PVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  uint uVar18;
  undefined1 auVar19 [32];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  bool bVar78;
  undefined1 auVar79 [12];
  bool bVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  uint uVar98;
  ulong uVar99;
  long lVar100;
  undefined1 auVar101 [8];
  long lVar102;
  uint uVar103;
  ulong uVar104;
  ulong uVar105;
  bool bVar106;
  float fVar107;
  float fVar111;
  float fVar138;
  float fVar141;
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar147;
  float fVar149;
  float fVar151;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar139;
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar155;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar192;
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar156;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar191;
  float fVar194;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar175 [32];
  float fVar193;
  float fVar195;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar168 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 bi_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar237;
  float fVar238;
  vint4 ai_1;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar218 [16];
  float fVar239;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar240;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar235 [32];
  undefined1 auVar229 [28];
  undefined1 auVar236 [64];
  float fVar241;
  float fVar242;
  float fVar259;
  float fVar261;
  vint4 ai_2;
  undefined1 auVar243 [16];
  float fVar264;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar263;
  float fVar266;
  float fVar268;
  float fVar270;
  float fVar272;
  undefined1 auVar254 [28];
  float fVar267;
  float fVar269;
  undefined1 auVar255 [32];
  float fVar260;
  float fVar262;
  float fVar265;
  float fVar271;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar258 [32];
  float fVar273;
  float fVar274;
  float fVar290;
  float fVar292;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar291;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar282 [32];
  float fVar300;
  undefined1 auVar283 [32];
  float fVar299;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar301;
  float fVar302;
  float fVar313;
  float fVar315;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar317;
  undefined1 auVar307 [32];
  float fVar314;
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  float fVar319;
  float fVar321;
  float fVar323;
  undefined1 auVar312 [64];
  float fVar325;
  float fVar337;
  float fVar338;
  vint4 ai;
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [32];
  float fVar340;
  undefined1 auVar332 [32];
  float fVar339;
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar347;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  float fVar342;
  float fVar344;
  float fVar346;
  undefined1 auVar336 [64];
  float fVar348;
  float fVar355;
  float fVar356;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  float fVar357;
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar354 [32];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [28];
  undefined1 auVar364 [32];
  float fVar368;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [64];
  float fVar369;
  float fVar374;
  float fVar375;
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  float fVar377;
  float fVar378;
  float fVar379;
  undefined1 auVar372 [32];
  float fVar376;
  float fVar380;
  undefined1 auVar373 [32];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  float fVar386;
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  float fVar387;
  float fVar390;
  float fVar391;
  undefined1 auVar388 [16];
  float fVar392;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar389 [32];
  float fVar397;
  float fVar405;
  float fVar408;
  undefined1 auVar400 [16];
  float fVar398;
  float fVar406;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar415;
  float fVar416;
  float fVar417;
  float fVar418;
  undefined1 auVar401 [32];
  float fVar399;
  float fVar407;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  float fVar423;
  float fVar425;
  float fVar426;
  float fVar427;
  float fVar428;
  float fVar429;
  float fVar430;
  undefined1 auVar424 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_be0;
  undefined8 local_b40;
  undefined8 uStack_b38;
  float local_b28;
  float local_b24;
  undefined1 local_b20 [32];
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 auStack_af0 [16];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined8 *local_9f0;
  ulong local_9e8;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [8];
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar385 [64];
  
  PVar11 = prim[1];
  uVar104 = (ulong)(byte)PVar11;
  lVar102 = uVar104 * 0x25;
  fVar155 = *(float *)(prim + lVar102 + 0x12);
  auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar161 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar225 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar225 = vinsertps_avx(auVar225,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar161 = vsubps_avx(auVar161,*(undefined1 (*) [16])(prim + lVar102 + 6));
  auVar157._0_4_ = fVar155 * auVar161._0_4_;
  auVar157._4_4_ = fVar155 * auVar161._4_4_;
  auVar157._8_4_ = fVar155 * auVar161._8_4_;
  auVar157._12_4_ = fVar155 * auVar161._12_4_;
  auVar326._0_4_ = fVar155 * auVar225._0_4_;
  auVar326._4_4_ = fVar155 * auVar225._4_4_;
  auVar326._8_4_ = fVar155 * auVar225._8_4_;
  auVar326._12_4_ = fVar155 * auVar225._12_4_;
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 4 + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 5 + 6)));
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar118 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 6 + 6)));
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar203 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0xf + 6)));
  auVar222 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar203 = vcvtdq2ps_avx(auVar203);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + uVar104 + 6)));
  auVar222 = vcvtdq2ps_avx(auVar222);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1a + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1b + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1c + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vshufps_avx(auVar326,auVar326,0);
  auVar29 = vshufps_avx(auVar326,auVar326,0x55);
  auVar30 = vshufps_avx(auVar326,auVar326,0xaa);
  fVar155 = auVar30._0_4_;
  fVar300 = auVar30._4_4_;
  fVar110 = auVar30._8_4_;
  fVar111 = auVar30._12_4_;
  fVar241 = auVar29._0_4_;
  fVar259 = auVar29._4_4_;
  fVar261 = auVar29._8_4_;
  fVar264 = auVar29._12_4_;
  fVar217 = auVar28._0_4_;
  fVar237 = auVar28._4_4_;
  fVar238 = auVar28._8_4_;
  fVar239 = auVar28._12_4_;
  auVar388._0_4_ = fVar217 * auVar161._0_4_ + fVar241 * auVar225._0_4_ + fVar155 * auVar118._0_4_;
  auVar388._4_4_ = fVar237 * auVar161._4_4_ + fVar259 * auVar225._4_4_ + fVar300 * auVar118._4_4_;
  auVar388._8_4_ = fVar238 * auVar161._8_4_ + fVar261 * auVar225._8_4_ + fVar110 * auVar118._8_4_;
  auVar388._12_4_ =
       fVar239 * auVar161._12_4_ + fVar264 * auVar225._12_4_ + fVar111 * auVar118._12_4_;
  auVar400._0_4_ = fVar217 * auVar203._0_4_ + fVar241 * auVar222._0_4_ + auVar25._0_4_ * fVar155;
  auVar400._4_4_ = fVar237 * auVar203._4_4_ + fVar259 * auVar222._4_4_ + auVar25._4_4_ * fVar300;
  auVar400._8_4_ = fVar238 * auVar203._8_4_ + fVar261 * auVar222._8_4_ + auVar25._8_4_ * fVar110;
  auVar400._12_4_ = fVar239 * auVar203._12_4_ + fVar264 * auVar222._12_4_ + auVar25._12_4_ * fVar111
  ;
  auVar327._0_4_ = fVar217 * auVar26._0_4_ + fVar241 * auVar165._0_4_ + auVar27._0_4_ * fVar155;
  auVar327._4_4_ = fVar237 * auVar26._4_4_ + fVar259 * auVar165._4_4_ + auVar27._4_4_ * fVar300;
  auVar327._8_4_ = fVar238 * auVar26._8_4_ + fVar261 * auVar165._8_4_ + auVar27._8_4_ * fVar110;
  auVar327._12_4_ = fVar239 * auVar26._12_4_ + fVar264 * auVar165._12_4_ + auVar27._12_4_ * fVar111;
  auVar28 = vshufps_avx(auVar157,auVar157,0);
  auVar29 = vshufps_avx(auVar157,auVar157,0x55);
  auVar30 = vshufps_avx(auVar157,auVar157,0xaa);
  fVar155 = auVar30._0_4_;
  fVar300 = auVar30._4_4_;
  fVar110 = auVar30._8_4_;
  fVar111 = auVar30._12_4_;
  fVar241 = auVar29._0_4_;
  fVar259 = auVar29._4_4_;
  fVar261 = auVar29._8_4_;
  fVar264 = auVar29._12_4_;
  fVar217 = auVar28._0_4_;
  fVar237 = auVar28._4_4_;
  fVar238 = auVar28._8_4_;
  fVar239 = auVar28._12_4_;
  auVar158._0_4_ = fVar217 * auVar161._0_4_ + fVar241 * auVar225._0_4_ + fVar155 * auVar118._0_4_;
  auVar158._4_4_ = fVar237 * auVar161._4_4_ + fVar259 * auVar225._4_4_ + fVar300 * auVar118._4_4_;
  auVar158._8_4_ = fVar238 * auVar161._8_4_ + fVar261 * auVar225._8_4_ + fVar110 * auVar118._8_4_;
  auVar158._12_4_ =
       fVar239 * auVar161._12_4_ + fVar264 * auVar225._12_4_ + fVar111 * auVar118._12_4_;
  auVar112._0_4_ = fVar217 * auVar203._0_4_ + auVar25._0_4_ * fVar155 + fVar241 * auVar222._0_4_;
  auVar112._4_4_ = fVar237 * auVar203._4_4_ + auVar25._4_4_ * fVar300 + fVar259 * auVar222._4_4_;
  auVar112._8_4_ = fVar238 * auVar203._8_4_ + auVar25._8_4_ * fVar110 + fVar261 * auVar222._8_4_;
  auVar112._12_4_ = fVar239 * auVar203._12_4_ + auVar25._12_4_ * fVar111 + fVar264 * auVar222._12_4_
  ;
  auVar349._8_4_ = 0x7fffffff;
  auVar349._0_8_ = 0x7fffffff7fffffff;
  auVar349._12_4_ = 0x7fffffff;
  auVar161 = vandps_avx(auVar388,auVar349);
  auVar243._8_4_ = 0x219392ef;
  auVar243._0_8_ = 0x219392ef219392ef;
  auVar243._12_4_ = 0x219392ef;
  auVar161 = vcmpps_avx(auVar161,auVar243,1);
  auVar225 = vblendvps_avx(auVar388,auVar243,auVar161);
  auVar161 = vandps_avx(auVar400,auVar349);
  auVar161 = vcmpps_avx(auVar161,auVar243,1);
  auVar118 = vblendvps_avx(auVar400,auVar243,auVar161);
  auVar161 = vandps_avx(auVar349,auVar327);
  auVar161 = vcmpps_avx(auVar161,auVar243,1);
  auVar161 = vblendvps_avx(auVar327,auVar243,auVar161);
  auVar199._0_4_ = fVar217 * auVar26._0_4_ + fVar241 * auVar165._0_4_ + auVar27._0_4_ * fVar155;
  auVar199._4_4_ = fVar237 * auVar26._4_4_ + fVar259 * auVar165._4_4_ + auVar27._4_4_ * fVar300;
  auVar199._8_4_ = fVar238 * auVar26._8_4_ + fVar261 * auVar165._8_4_ + auVar27._8_4_ * fVar110;
  auVar199._12_4_ = fVar239 * auVar26._12_4_ + fVar264 * auVar165._12_4_ + auVar27._12_4_ * fVar111;
  auVar203 = vrcpps_avx(auVar225);
  fVar217 = auVar203._0_4_;
  auVar218._0_4_ = fVar217 * auVar225._0_4_;
  fVar237 = auVar203._4_4_;
  auVar218._4_4_ = fVar237 * auVar225._4_4_;
  fVar238 = auVar203._8_4_;
  auVar218._8_4_ = fVar238 * auVar225._8_4_;
  fVar239 = auVar203._12_4_;
  auVar218._12_4_ = fVar239 * auVar225._12_4_;
  auVar303._8_4_ = 0x3f800000;
  auVar303._0_8_ = &DAT_3f8000003f800000;
  auVar303._12_4_ = 0x3f800000;
  auVar225 = vsubps_avx(auVar303,auVar218);
  fVar217 = fVar217 + fVar217 * auVar225._0_4_;
  fVar237 = fVar237 + fVar237 * auVar225._4_4_;
  fVar238 = fVar238 + fVar238 * auVar225._8_4_;
  fVar239 = fVar239 + fVar239 * auVar225._12_4_;
  auVar225 = vrcpps_avx(auVar118);
  fVar241 = auVar225._0_4_;
  auVar275._0_4_ = fVar241 * auVar118._0_4_;
  fVar259 = auVar225._4_4_;
  auVar275._4_4_ = fVar259 * auVar118._4_4_;
  fVar261 = auVar225._8_4_;
  auVar275._8_4_ = fVar261 * auVar118._8_4_;
  fVar264 = auVar225._12_4_;
  auVar275._12_4_ = fVar264 * auVar118._12_4_;
  auVar225 = vsubps_avx(auVar303,auVar275);
  fVar241 = fVar241 + fVar241 * auVar225._0_4_;
  fVar259 = fVar259 + fVar259 * auVar225._4_4_;
  fVar261 = fVar261 + fVar261 * auVar225._8_4_;
  fVar264 = fVar264 + fVar264 * auVar225._12_4_;
  auVar225 = vrcpps_avx(auVar161);
  fVar273 = auVar225._0_4_;
  auVar328._0_4_ = fVar273 * auVar161._0_4_;
  fVar290 = auVar225._4_4_;
  auVar328._4_4_ = fVar290 * auVar161._4_4_;
  fVar292 = auVar225._8_4_;
  auVar328._8_4_ = fVar292 * auVar161._8_4_;
  fVar294 = auVar225._12_4_;
  auVar328._12_4_ = fVar294 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar303,auVar328);
  fVar273 = fVar273 + fVar273 * auVar161._0_4_;
  fVar290 = fVar290 + fVar290 * auVar161._4_4_;
  fVar292 = fVar292 + fVar292 * auVar161._8_4_;
  fVar294 = fVar294 + fVar294 * auVar161._12_4_;
  auVar161 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar102 + 0x16)) *
                           *(float *)(prim + lVar102 + 0x1a)));
  auVar118 = vshufps_avx(auVar161,auVar161,0);
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar104 * 7 + 6);
  auVar161 = vpmovsxwd_avx(auVar161);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar104 * 0xb + 6);
  auVar225 = vpmovsxwd_avx(auVar225);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar203 = vsubps_avx(auVar225,auVar161);
  fVar155 = auVar118._0_4_;
  fVar300 = auVar118._4_4_;
  fVar110 = auVar118._8_4_;
  fVar111 = auVar118._12_4_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar104 * 9 + 6);
  auVar225 = vpmovsxwd_avx(auVar118);
  auVar329._0_4_ = auVar203._0_4_ * fVar155 + auVar161._0_4_;
  auVar329._4_4_ = auVar203._4_4_ * fVar300 + auVar161._4_4_;
  auVar329._8_4_ = auVar203._8_4_ * fVar110 + auVar161._8_4_;
  auVar329._12_4_ = auVar203._12_4_ * fVar111 + auVar161._12_4_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *(ulong *)(prim + uVar104 * 0xd + 6);
  auVar118 = vpmovsxwd_avx(auVar203);
  auVar161 = vcvtdq2ps_avx(auVar225);
  auVar225 = vcvtdq2ps_avx(auVar118);
  auVar225 = vsubps_avx(auVar225,auVar161);
  auVar350._0_4_ = auVar225._0_4_ * fVar155 + auVar161._0_4_;
  auVar350._4_4_ = auVar225._4_4_ * fVar300 + auVar161._4_4_;
  auVar350._8_4_ = auVar225._8_4_ * fVar110 + auVar161._8_4_;
  auVar350._12_4_ = auVar225._12_4_ * fVar111 + auVar161._12_4_;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar104 * 0x12 + 6);
  auVar161 = vpmovsxwd_avx(auVar222);
  uVar99 = (ulong)(uint)((int)(uVar104 * 5) << 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar104 * 2 + uVar99 + 6);
  auVar225 = vpmovsxwd_avx(auVar25);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar161);
  auVar361._0_4_ = auVar225._0_4_ * fVar155 + auVar161._0_4_;
  auVar361._4_4_ = auVar225._4_4_ * fVar300 + auVar161._4_4_;
  auVar361._8_4_ = auVar225._8_4_ * fVar110 + auVar161._8_4_;
  auVar361._12_4_ = auVar225._12_4_ * fVar111 + auVar161._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar99 + 6);
  auVar161 = vpmovsxwd_avx(auVar26);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar104 * 0x18 + 6);
  auVar225 = vpmovsxwd_avx(auVar165);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar118 = vsubps_avx(auVar225,auVar161);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar104 * 0x1d + 6);
  auVar225 = vpmovsxwd_avx(auVar27);
  auVar370._0_4_ = auVar118._0_4_ * fVar155 + auVar161._0_4_;
  auVar370._4_4_ = auVar118._4_4_ * fVar300 + auVar161._4_4_;
  auVar370._8_4_ = auVar118._8_4_ * fVar110 + auVar161._8_4_;
  auVar370._12_4_ = auVar118._12_4_ * fVar111 + auVar161._12_4_;
  auVar161 = vcvtdq2ps_avx(auVar225);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar104 + (ulong)(byte)PVar11 * 0x20 + 6);
  auVar225 = vpmovsxwd_avx(auVar28);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar161);
  auVar381._0_4_ = auVar225._0_4_ * fVar155 + auVar161._0_4_;
  auVar381._4_4_ = auVar225._4_4_ * fVar300 + auVar161._4_4_;
  auVar381._8_4_ = auVar225._8_4_ * fVar110 + auVar161._8_4_;
  auVar381._12_4_ = auVar225._12_4_ * fVar111 + auVar161._12_4_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar11 * 0x20 - uVar104) + 6);
  auVar161 = vpmovsxwd_avx(auVar29);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar104 * 0x23 + 6);
  auVar225 = vpmovsxwd_avx(auVar30);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar161);
  auVar304._0_4_ = auVar161._0_4_ + auVar225._0_4_ * fVar155;
  auVar304._4_4_ = auVar161._4_4_ + auVar225._4_4_ * fVar300;
  auVar304._8_4_ = auVar161._8_4_ + auVar225._8_4_ * fVar110;
  auVar304._12_4_ = auVar161._12_4_ + auVar225._12_4_ * fVar111;
  auVar161 = vsubps_avx(auVar329,auVar158);
  auVar330._0_4_ = fVar217 * auVar161._0_4_;
  auVar330._4_4_ = fVar237 * auVar161._4_4_;
  auVar330._8_4_ = fVar238 * auVar161._8_4_;
  auVar330._12_4_ = fVar239 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar350,auVar158);
  auVar159._0_4_ = fVar217 * auVar161._0_4_;
  auVar159._4_4_ = fVar237 * auVar161._4_4_;
  auVar159._8_4_ = fVar238 * auVar161._8_4_;
  auVar159._12_4_ = fVar239 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar361,auVar112);
  auVar219._0_4_ = fVar241 * auVar161._0_4_;
  auVar219._4_4_ = fVar259 * auVar161._4_4_;
  auVar219._8_4_ = fVar261 * auVar161._8_4_;
  auVar219._12_4_ = fVar264 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar370,auVar112);
  auVar113._0_4_ = fVar241 * auVar161._0_4_;
  auVar113._4_4_ = fVar259 * auVar161._4_4_;
  auVar113._8_4_ = fVar261 * auVar161._8_4_;
  auVar113._12_4_ = fVar264 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar381,auVar199);
  auVar244._0_4_ = fVar273 * auVar161._0_4_;
  auVar244._4_4_ = fVar290 * auVar161._4_4_;
  auVar244._8_4_ = fVar292 * auVar161._8_4_;
  auVar244._12_4_ = fVar294 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar304,auVar199);
  auVar200._0_4_ = fVar273 * auVar161._0_4_;
  auVar200._4_4_ = fVar290 * auVar161._4_4_;
  auVar200._8_4_ = fVar292 * auVar161._8_4_;
  auVar200._12_4_ = fVar294 * auVar161._12_4_;
  auVar161 = vpminsd_avx(auVar330,auVar159);
  auVar225 = vpminsd_avx(auVar219,auVar113);
  auVar161 = vmaxps_avx(auVar161,auVar225);
  auVar225 = vpminsd_avx(auVar244,auVar200);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar351._4_4_ = uVar9;
  auVar351._0_4_ = uVar9;
  auVar351._8_4_ = uVar9;
  auVar351._12_4_ = uVar9;
  auVar225 = vmaxps_avx(auVar225,auVar351);
  auVar161 = vmaxps_avx(auVar161,auVar225);
  local_4d0._0_4_ = auVar161._0_4_ * 0.99999964;
  local_4d0._4_4_ = auVar161._4_4_ * 0.99999964;
  local_4d0._8_4_ = auVar161._8_4_ * 0.99999964;
  local_4d0._12_4_ = auVar161._12_4_ * 0.99999964;
  auVar161 = vpmaxsd_avx(auVar330,auVar159);
  auVar225 = vpmaxsd_avx(auVar219,auVar113);
  auVar161 = vminps_avx(auVar161,auVar225);
  auVar225 = vpmaxsd_avx(auVar244,auVar200);
  uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar201._4_4_ = uVar9;
  auVar201._0_4_ = uVar9;
  auVar201._8_4_ = uVar9;
  auVar201._12_4_ = uVar9;
  auVar225 = vminps_avx(auVar225,auVar201);
  auVar161 = vminps_avx(auVar161,auVar225);
  auVar114._0_4_ = auVar161._0_4_ * 1.0000004;
  auVar114._4_4_ = auVar161._4_4_ * 1.0000004;
  auVar114._8_4_ = auVar161._8_4_ * 1.0000004;
  auVar114._12_4_ = auVar161._12_4_ * 1.0000004;
  auVar161 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar225 = vpcmpgtd_avx(auVar161,_DAT_01ff0cf0);
  auVar161 = vcmpps_avx(local_4d0,auVar114,2);
  auVar161 = vandps_avx(auVar161,auVar225);
  uVar98 = vmovmskps_avx(auVar161);
  if (uVar98 == 0) {
    return;
  }
  uVar98 = uVar98 & 0xff;
  auVar127._16_16_ = mm_lookupmask_ps._240_16_;
  auVar127._0_16_ = mm_lookupmask_ps._240_16_;
  local_3c0 = vblendps_avx(auVar127,ZEXT832(0) << 0x20,0x80);
  local_9f0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar336 = ZEXT464(0) << 0x20;
  local_8f0 = prim;
LAB_0103c769:
  local_8e8 = (ulong)uVar98;
  lVar102 = 0;
  if (local_8e8 != 0) {
    for (; (uVar98 >> lVar102 & 1) == 0; lVar102 = lVar102 + 1) {
    }
  }
  uVar98 = *(uint *)(local_8f0 + 2);
  local_9e8 = (ulong)*(uint *)(local_8f0 + lVar102 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar98].ptr;
  uVar104 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                            local_9e8 *
                            pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar155 = (pGVar12->time_range).lower;
  fVar155 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar155) / ((pGVar12->time_range).upper - fVar155));
  auVar161 = vroundss_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),9);
  auVar161 = vminss_avx(auVar161,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar161 = vmaxss_avx(auVar336._0_16_,auVar161);
  fVar155 = fVar155 - auVar161._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar100 = (long)(int)auVar161._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + 0x10 + lVar100);
  lVar15 = *(long *)(_Var13 + 0x38 + lVar100);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar100);
  auVar161 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
  pfVar2 = (float *)(lVar15 + lVar16 * uVar104);
  fVar239 = auVar161._0_4_;
  fVar241 = auVar161._4_4_;
  fVar259 = auVar161._8_4_;
  fVar261 = auVar161._12_4_;
  lVar1 = uVar104 + 1;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  p_Var17 = pGVar12[4].occlusionFilterN;
  auVar161 = vshufps_avx(ZEXT416((uint)(1.0 - fVar155)),ZEXT416((uint)(1.0 - fVar155)),0);
  pfVar4 = (float *)(*(long *)(_Var13 + lVar100) + lVar14 * uVar104);
  fVar111 = auVar161._0_4_;
  fVar217 = auVar161._4_4_;
  fVar237 = auVar161._8_4_;
  fVar238 = auVar161._12_4_;
  pfVar5 = (float *)(*(long *)(_Var13 + lVar100) + lVar14 * lVar1);
  pfVar6 = (float *)(*(long *)(p_Var17 + lVar100 + 0x38) +
                    uVar104 * *(long *)(p_Var17 + lVar100 + 0x48));
  pfVar7 = (float *)(*(long *)(p_Var17 + lVar100 + 0x38) +
                    *(long *)(p_Var17 + lVar100 + 0x48) * lVar1);
  pfVar8 = (float *)(*(long *)(p_Var17 + lVar100) + *(long *)(p_Var17 + lVar100 + 0x10) * uVar104);
  auVar160._0_4_ = fVar111 * *pfVar4 + fVar239 * *pfVar2;
  auVar160._4_4_ = fVar217 * pfVar4[1] + fVar241 * pfVar2[1];
  auVar160._8_4_ = fVar237 * pfVar4[2] + fVar259 * pfVar2[2];
  auVar160._12_4_ = fVar238 * pfVar4[3] + fVar261 * pfVar2[3];
  pfVar2 = (float *)(*(long *)(p_Var17 + lVar100) + *(long *)(p_Var17 + lVar100 + 0x10) * lVar1);
  auVar202._0_4_ = fVar111 * *pfVar5 + fVar239 * *pfVar3;
  auVar202._4_4_ = fVar217 * pfVar5[1] + fVar241 * pfVar3[1];
  auVar202._8_4_ = fVar237 * pfVar5[2] + fVar259 * pfVar3[2];
  auVar202._12_4_ = fVar238 * pfVar5[3] + fVar261 * pfVar3[3];
  auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar225 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar155 = *(float *)(ray + k * 4 + 0x40);
  auVar362._4_4_ = fVar155;
  auVar362._0_4_ = fVar155;
  auVar362._8_4_ = fVar155;
  auVar362._12_4_ = fVar155;
  fStack_7f0 = fVar155;
  _local_800 = auVar362;
  fStack_7ec = fVar155;
  fStack_7e8 = fVar155;
  fStack_7e4 = fVar155;
  fVar300 = *(float *)(ray + k * 4 + 0x50);
  auVar371._4_4_ = fVar300;
  auVar371._0_4_ = fVar300;
  auVar371._8_4_ = fVar300;
  auVar371._12_4_ = fVar300;
  fStack_810 = fVar300;
  _local_820 = auVar371;
  fStack_80c = fVar300;
  fStack_808 = fVar300;
  fStack_804 = fVar300;
  auVar161 = vunpcklps_avx(auVar362,auVar371);
  fVar110 = *(float *)(ray + k * 4 + 0x60);
  auVar382._4_4_ = fVar110;
  auVar382._0_4_ = fVar110;
  auVar382._8_4_ = fVar110;
  auVar382._12_4_ = fVar110;
  fStack_830 = fVar110;
  _local_840 = auVar382;
  fStack_82c = fVar110;
  fStack_828 = fVar110;
  fStack_824 = fVar110;
  auVar385 = ZEXT3264(_local_840);
  _local_950 = vinsertps_avx(auVar161,auVar382,0x28);
  auVar245._0_4_ = auVar160._0_4_ + (fVar111 * *pfVar8 + fVar239 * *pfVar6) * 0.33333334;
  auVar245._4_4_ = auVar160._4_4_ + (fVar217 * pfVar8[1] + fVar241 * pfVar6[1]) * 0.33333334;
  auVar245._8_4_ = auVar160._8_4_ + (fVar237 * pfVar8[2] + fVar259 * pfVar6[2]) * 0.33333334;
  auVar245._12_4_ = auVar160._12_4_ + (fVar238 * pfVar8[3] + fVar261 * pfVar6[3]) * 0.33333334;
  auVar115._0_4_ = (fVar111 * *pfVar2 + fVar239 * *pfVar7) * 0.33333334;
  auVar115._4_4_ = (fVar217 * pfVar2[1] + fVar241 * pfVar7[1]) * 0.33333334;
  auVar115._8_4_ = (fVar237 * pfVar2[2] + fVar259 * pfVar7[2]) * 0.33333334;
  auVar115._12_4_ = (fVar238 * pfVar2[3] + fVar261 * pfVar7[3]) * 0.33333334;
  auVar203 = vsubps_avx(auVar202,auVar115);
  auVar116._0_4_ = (auVar202._0_4_ + auVar160._0_4_ + auVar245._0_4_ + auVar203._0_4_) * 0.25;
  auVar116._4_4_ = (auVar202._4_4_ + auVar160._4_4_ + auVar245._4_4_ + auVar203._4_4_) * 0.25;
  auVar116._8_4_ = (auVar202._8_4_ + auVar160._8_4_ + auVar245._8_4_ + auVar203._8_4_) * 0.25;
  auVar116._12_4_ = (auVar202._12_4_ + auVar160._12_4_ + auVar245._12_4_ + auVar203._12_4_) * 0.25;
  auVar161 = vsubps_avx(auVar116,auVar225);
  auVar161 = vdpps_avx(auVar161,_local_950,0x7f);
  local_960 = vdpps_avx(_local_950,_local_950,0x7f);
  auVar118 = vrcpss_avx(local_960,local_960);
  fVar111 = auVar161._0_4_ * auVar118._0_4_ * (2.0 - local_960._0_4_ * auVar118._0_4_);
  auVar336 = ZEXT464((uint)fVar111);
  auVar118 = vshufps_avx(ZEXT416((uint)fVar111),ZEXT416((uint)fVar111),0);
  auVar220._0_4_ = auVar225._0_4_ + local_950._0_4_ * auVar118._0_4_;
  auVar220._4_4_ = auVar225._4_4_ + local_950._4_4_ * auVar118._4_4_;
  auVar220._8_4_ = auVar225._8_4_ + local_950._8_4_ * auVar118._8_4_;
  auVar220._12_4_ = auVar225._12_4_ + local_950._12_4_ * auVar118._12_4_;
  auVar161 = vblendps_avx(auVar220,_DAT_01feba10,8);
  _local_a60 = vsubps_avx(auVar160,auVar161);
  auVar312 = ZEXT1664(_local_a60);
  _local_a70 = vsubps_avx(auVar203,auVar161);
  _local_a80 = vsubps_avx(auVar245,auVar161);
  auVar255._8_4_ = 0x3f800000;
  auVar255._0_8_ = &DAT_3f8000003f800000;
  auVar255._12_4_ = 0x3f800000;
  auVar255._16_4_ = 0x3f800000;
  auVar255._20_4_ = 0x3f800000;
  auVar255._24_4_ = 0x3f800000;
  auVar255._28_4_ = 0x3f800000;
  _local_a90 = vsubps_avx(auVar202,auVar161);
  auVar236 = ZEXT1664(_local_a90);
  auVar161 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001250 = auVar161;
  _local_1a0 = auVar161;
  auVar161 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001250 = auVar161;
  _local_1c0 = auVar161;
  auVar161 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001250 = auVar161;
  _local_1e0 = auVar161;
  auVar161 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar161;
  _local_200 = auVar161;
  auVar161 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001290 = auVar161;
  _local_220 = auVar161;
  auVar161 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001290 = auVar161;
  _local_240 = auVar161;
  auVar161 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001290 = auVar161;
  _local_260 = auVar161;
  auVar161 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar161;
  _local_280 = auVar161;
  auVar161 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar161;
  _local_2a0 = auVar161;
  auVar161 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar161;
  _local_2c0 = auVar161;
  auVar161 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar161;
  _local_2e0 = auVar161;
  auVar161 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar161;
  _local_300 = auVar161;
  auVar161 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar161;
  _local_320 = auVar161;
  auVar161 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar161;
  _local_340 = auVar161;
  auVar161 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar161;
  _local_360 = auVar161;
  auVar161 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar161;
  _local_380 = auVar161;
  auVar161 = ZEXT416((uint)(fVar155 * fVar155 + fVar300 * fVar300 + fVar110 * fVar110));
  auVar161 = vshufps_avx(auVar161,auVar161,0);
  local_3a0._16_16_ = auVar161;
  local_3a0._0_16_ = auVar161;
  fVar155 = *(float *)(ray + k * 4 + 0x30);
  local_900 = ZEXT416((uint)fVar111);
  auVar161 = vshufps_avx(ZEXT416((uint)(fVar155 - fVar111)),ZEXT416((uint)(fVar155 - fVar111)),0);
  local_3e0._16_16_ = auVar161;
  local_3e0._0_16_ = auVar161;
  local_710 = vpshufd_avx(ZEXT416(uVar98),0);
  local_720 = vpshufd_avx(ZEXT416(*(uint *)(local_8f0 + lVar102 * 4 + 6)),0);
  register0x00001210 = auVar118;
  _local_7c0 = auVar118;
  uVar99 = 0;
  uVar104 = 1;
  auVar128._8_4_ = 0x7fffffff;
  auVar128._0_8_ = 0x7fffffff7fffffff;
  auVar128._12_4_ = 0x7fffffff;
  auVar128._16_4_ = 0x7fffffff;
  auVar128._20_4_ = 0x7fffffff;
  auVar128._24_4_ = 0x7fffffff;
  auVar128._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_3a0,auVar128);
  auVar161 = vsqrtss_avx(local_960,local_960);
  local_b24 = auVar161._0_4_;
  auVar161 = vsqrtss_avx(local_960,local_960);
  local_b28 = auVar161._0_4_;
  local_910 = 0x3f80000000000000;
  uStack_908 = 0;
  do {
    auVar94._8_8_ = uStack_908;
    auVar94._0_8_ = local_910;
    auVar161 = vmovshdup_avx(auVar94);
    fVar300 = auVar161._0_4_ - (float)local_910;
    auVar161 = vshufps_avx(auVar94,auVar94,0);
    local_9c0._16_16_ = auVar161;
    local_9c0._0_16_ = auVar161;
    auVar225 = vshufps_avx(ZEXT416((uint)fVar300),ZEXT416((uint)fVar300),0);
    local_760._16_16_ = auVar225;
    local_760._0_16_ = auVar225;
    fVar156 = auVar225._0_4_;
    fVar191 = auVar225._4_4_;
    fVar192 = auVar225._8_4_;
    fVar194 = auVar225._12_4_;
    fVar107 = auVar161._0_4_;
    auVar175._0_4_ = fVar107 + fVar156 * 0.0;
    fVar138 = auVar161._4_4_;
    auVar175._4_4_ = fVar138 + fVar191 * 0.14285715;
    fVar141 = auVar161._8_4_;
    auVar175._8_4_ = fVar141 + fVar192 * 0.2857143;
    fVar144 = auVar161._12_4_;
    auVar175._12_4_ = fVar144 + fVar194 * 0.42857146;
    auVar175._16_4_ = fVar107 + fVar156 * 0.5714286;
    auVar175._20_4_ = fVar138 + fVar191 * 0.71428573;
    auVar175._24_4_ = fVar141 + fVar192 * 0.8571429;
    auVar175._28_4_ = fVar144 + fVar194;
    auVar127 = vsubps_avx(auVar255,auVar175);
    fVar110 = auVar127._0_4_;
    fVar111 = auVar127._4_4_;
    fVar217 = auVar127._8_4_;
    fVar237 = auVar127._12_4_;
    fVar238 = auVar127._16_4_;
    fVar239 = auVar127._20_4_;
    fVar241 = auVar127._24_4_;
    fVar240 = auVar236._28_4_;
    fVar301 = (float)local_2a0._0_4_ * auVar175._0_4_ + (float)local_220._0_4_ * fVar110;
    fVar313 = (float)local_2a0._4_4_ * auVar175._4_4_ + (float)local_220._4_4_ * fVar111;
    fVar315 = fStack_298 * auVar175._8_4_ + fStack_218 * fVar217;
    fVar317 = fStack_294 * auVar175._12_4_ + fStack_214 * fVar237;
    fVar319 = fStack_290 * auVar175._16_4_ + fStack_210 * fVar238;
    fVar321 = fStack_28c * auVar175._20_4_ + fStack_20c * fVar239;
    fVar323 = fStack_288 * auVar175._24_4_ + fStack_208 * fVar241;
    fVar259 = (float)local_2c0._0_4_ * auVar175._0_4_ + (float)local_240._0_4_ * fVar110;
    fVar261 = (float)local_2c0._4_4_ * auVar175._4_4_ + (float)local_240._4_4_ * fVar111;
    fVar264 = fStack_2b8 * auVar175._8_4_ + fStack_238 * fVar217;
    fVar273 = fStack_2b4 * auVar175._12_4_ + fStack_234 * fVar237;
    fVar290 = fStack_2b0 * auVar175._16_4_ + fStack_230 * fVar238;
    fVar292 = fStack_2ac * auVar175._20_4_ + fStack_22c * fVar239;
    fVar294 = fStack_2a8 * auVar175._24_4_ + fStack_228 * fVar241;
    fVar242 = (float)local_2e0._0_4_ * auVar175._0_4_ + (float)local_260._0_4_ * fVar110;
    fVar260 = (float)local_2e0._4_4_ * auVar175._4_4_ + (float)local_260._4_4_ * fVar111;
    fVar262 = fStack_2d8 * auVar175._8_4_ + fStack_258 * fVar217;
    fVar265 = fStack_2d4 * auVar175._12_4_ + fStack_254 * fVar237;
    fVar267 = fStack_2d0 * auVar175._16_4_ + fStack_250 * fVar238;
    fVar269 = fStack_2cc * auVar175._20_4_ + fStack_24c * fVar239;
    fVar271 = fStack_2c8 * auVar175._24_4_ + fStack_248 * fVar241;
    fVar274 = (float)local_300._0_4_ * auVar175._0_4_ + (float)local_280._0_4_ * fVar110;
    fVar291 = (float)local_300._4_4_ * auVar175._4_4_ + (float)local_280._4_4_ * fVar111;
    fVar293 = fStack_2f8 * auVar175._8_4_ + fStack_278 * fVar217;
    fVar295 = fStack_2f4 * auVar175._12_4_ + fStack_274 * fVar237;
    fVar296 = fStack_2f0 * auVar175._16_4_ + fStack_270 * fVar238;
    fVar297 = fStack_2ec * auVar175._20_4_ + fStack_26c * fVar239;
    fVar298 = fStack_2e8 * auVar175._24_4_ + fStack_268 * fVar241;
    fVar386 = auVar385._28_4_;
    fVar418 = fVar386 + fStack_224;
    fVar396 = fStack_204 + fVar386;
    auVar364._0_4_ =
         ((float)local_220._0_4_ * auVar175._0_4_ + fVar110 * (float)local_1a0._0_4_) * fVar110 +
         auVar175._0_4_ * fVar301;
    auVar364._4_4_ =
         ((float)local_220._4_4_ * auVar175._4_4_ + fVar111 * (float)local_1a0._4_4_) * fVar111 +
         auVar175._4_4_ * fVar313;
    auVar364._8_4_ =
         (fStack_218 * auVar175._8_4_ + fVar217 * fStack_198) * fVar217 + auVar175._8_4_ * fVar315;
    auVar364._12_4_ =
         (fStack_214 * auVar175._12_4_ + fVar237 * fStack_194) * fVar237 + auVar175._12_4_ * fVar317
    ;
    auVar364._16_4_ =
         (fStack_210 * auVar175._16_4_ + fVar238 * fStack_190) * fVar238 + auVar175._16_4_ * fVar319
    ;
    auVar364._20_4_ =
         (fStack_20c * auVar175._20_4_ + fVar239 * fStack_18c) * fVar239 + auVar175._20_4_ * fVar321
    ;
    auVar364._24_4_ =
         (fStack_208 * auVar175._24_4_ + fVar241 * fStack_188) * fVar241 + auVar175._24_4_ * fVar323
    ;
    auVar364._28_4_ = fStack_2e4 + fVar386;
    auVar372._0_4_ =
         fVar110 * ((float)local_240._0_4_ * auVar175._0_4_ + fVar110 * (float)local_1c0._0_4_) +
         auVar175._0_4_ * fVar259;
    auVar372._4_4_ =
         fVar111 * ((float)local_240._4_4_ * auVar175._4_4_ + fVar111 * (float)local_1c0._4_4_) +
         auVar175._4_4_ * fVar261;
    auVar372._8_4_ =
         fVar217 * (fStack_238 * auVar175._8_4_ + fVar217 * fStack_1b8) + auVar175._8_4_ * fVar264;
    auVar372._12_4_ =
         fVar237 * (fStack_234 * auVar175._12_4_ + fVar237 * fStack_1b4) + auVar175._12_4_ * fVar273
    ;
    auVar372._16_4_ =
         fVar238 * (fStack_230 * auVar175._16_4_ + fVar238 * fStack_1b0) + auVar175._16_4_ * fVar290
    ;
    auVar372._20_4_ =
         fVar239 * (fStack_22c * auVar175._20_4_ + fVar239 * fStack_1ac) + auVar175._20_4_ * fVar292
    ;
    auVar372._24_4_ =
         fVar241 * (fStack_228 * auVar175._24_4_ + fVar241 * fStack_1a8) + auVar175._24_4_ * fVar294
    ;
    auVar372._28_4_ = fVar240 + auVar336._28_4_ + fVar386;
    auVar383._0_4_ =
         fVar110 * ((float)local_260._0_4_ * auVar175._0_4_ + fVar110 * (float)local_1e0._0_4_) +
         auVar175._0_4_ * fVar242;
    auVar383._4_4_ =
         fVar111 * ((float)local_260._4_4_ * auVar175._4_4_ + fVar111 * (float)local_1e0._4_4_) +
         auVar175._4_4_ * fVar260;
    auVar383._8_4_ =
         fVar217 * (fStack_258 * auVar175._8_4_ + fVar217 * fStack_1d8) + auVar175._8_4_ * fVar262;
    auVar383._12_4_ =
         fVar237 * (fStack_254 * auVar175._12_4_ + fVar237 * fStack_1d4) + auVar175._12_4_ * fVar265
    ;
    auVar383._16_4_ =
         fVar238 * (fStack_250 * auVar175._16_4_ + fVar238 * fStack_1d0) + auVar175._16_4_ * fVar267
    ;
    auVar383._20_4_ =
         fVar239 * (fStack_24c * auVar175._20_4_ + fVar239 * fStack_1cc) + auVar175._20_4_ * fVar269
    ;
    auVar383._24_4_ =
         fVar241 * (fStack_248 * auVar175._24_4_ + fVar241 * fStack_1c8) + auVar175._24_4_ * fVar271
    ;
    auVar383._28_4_ = fStack_2c4 + fVar386;
    auVar331._0_4_ =
         auVar175._0_4_ * fVar274 +
         fVar110 * ((float)local_280._0_4_ * auVar175._0_4_ + fVar110 * (float)local_200._0_4_);
    auVar331._4_4_ =
         auVar175._4_4_ * fVar291 +
         fVar111 * ((float)local_280._4_4_ * auVar175._4_4_ + fVar111 * (float)local_200._4_4_);
    auVar331._8_4_ =
         auVar175._8_4_ * fVar293 + fVar217 * (fStack_278 * auVar175._8_4_ + fVar217 * fStack_1f8);
    auVar331._12_4_ =
         auVar175._12_4_ * fVar295 + fVar237 * (fStack_274 * auVar175._12_4_ + fVar237 * fStack_1f4)
    ;
    auVar331._16_4_ =
         auVar175._16_4_ * fVar296 + fVar238 * (fStack_270 * auVar175._16_4_ + fVar238 * fStack_1f0)
    ;
    auVar331._20_4_ =
         auVar175._20_4_ * fVar297 + fVar239 * (fStack_26c * auVar175._20_4_ + fVar239 * fStack_1ec)
    ;
    auVar331._24_4_ =
         auVar175._24_4_ * fVar298 + fVar241 * (fStack_268 * auVar175._24_4_ + fVar241 * fStack_1e8)
    ;
    auVar331._28_4_ = fStack_2c4 + fStack_2a4;
    auVar419._0_4_ =
         (auVar175._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar110) *
         auVar175._0_4_ + fVar110 * fVar301;
    auVar419._4_4_ =
         (auVar175._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar111) *
         auVar175._4_4_ + fVar111 * fVar313;
    auVar419._8_4_ =
         (auVar175._8_4_ * fStack_318 + fStack_298 * fVar217) * auVar175._8_4_ + fVar217 * fVar315;
    auVar419._12_4_ =
         (auVar175._12_4_ * fStack_314 + fStack_294 * fVar237) * auVar175._12_4_ + fVar237 * fVar317
    ;
    auVar419._16_4_ =
         (auVar175._16_4_ * fStack_310 + fStack_290 * fVar238) * auVar175._16_4_ + fVar238 * fVar319
    ;
    auVar419._20_4_ =
         (auVar175._20_4_ * fStack_30c + fStack_28c * fVar239) * auVar175._20_4_ + fVar239 * fVar321
    ;
    auVar419._24_4_ =
         (auVar175._24_4_ * fStack_308 + fStack_288 * fVar241) * auVar175._24_4_ + fVar241 * fVar323
    ;
    auVar419._28_4_ = fStack_2c4 + fVar240 + auVar312._28_4_;
    auVar230._0_4_ =
         (auVar175._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar110) *
         auVar175._0_4_ + fVar110 * fVar259;
    auVar230._4_4_ =
         (auVar175._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar111) *
         auVar175._4_4_ + fVar111 * fVar261;
    auVar230._8_4_ =
         (auVar175._8_4_ * fStack_338 + fStack_2b8 * fVar217) * auVar175._8_4_ + fVar217 * fVar264;
    auVar230._12_4_ =
         (auVar175._12_4_ * fStack_334 + fStack_2b4 * fVar237) * auVar175._12_4_ + fVar237 * fVar273
    ;
    auVar230._16_4_ =
         (auVar175._16_4_ * fStack_330 + fStack_2b0 * fVar238) * auVar175._16_4_ + fVar238 * fVar290
    ;
    auVar230._20_4_ =
         (auVar175._20_4_ * fStack_32c + fStack_2ac * fVar239) * auVar175._20_4_ + fVar239 * fVar292
    ;
    auVar230._24_4_ =
         (auVar175._24_4_ * fStack_328 + fStack_2a8 * fVar241) * auVar175._24_4_ + fVar241 * fVar294
    ;
    auVar230._28_4_ = fStack_2c4 + auVar255._28_4_ + fVar240;
    auVar256._0_4_ =
         auVar175._0_4_ *
         (auVar175._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar110) +
         fVar110 * fVar242;
    auVar256._4_4_ =
         auVar175._4_4_ *
         (auVar175._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar111) +
         fVar111 * fVar260;
    auVar256._8_4_ =
         auVar175._8_4_ * (auVar175._8_4_ * fStack_358 + fStack_2d8 * fVar217) + fVar217 * fVar262;
    auVar256._12_4_ =
         auVar175._12_4_ * (auVar175._12_4_ * fStack_354 + fStack_2d4 * fVar237) + fVar237 * fVar265
    ;
    auVar256._16_4_ =
         auVar175._16_4_ * (auVar175._16_4_ * fStack_350 + fStack_2d0 * fVar238) + fVar238 * fVar267
    ;
    auVar256._20_4_ =
         auVar175._20_4_ * (auVar175._20_4_ * fStack_34c + fStack_2cc * fVar239) + fVar239 * fVar269
    ;
    auVar256._24_4_ =
         auVar175._24_4_ * (auVar175._24_4_ * fStack_348 + fStack_2c8 * fVar241) + fVar241 * fVar271
    ;
    auVar256._28_4_ = fVar396 + auVar255._28_4_ + 1.0;
    auVar282._0_4_ =
         (auVar175._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar110) *
         auVar175._0_4_ + fVar110 * fVar274;
    auVar282._4_4_ =
         (auVar175._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar111) *
         auVar175._4_4_ + fVar111 * fVar291;
    auVar282._8_4_ =
         (auVar175._8_4_ * fStack_378 + fStack_2f8 * fVar217) * auVar175._8_4_ + fVar217 * fVar293;
    auVar282._12_4_ =
         (auVar175._12_4_ * fStack_374 + fStack_2f4 * fVar237) * auVar175._12_4_ + fVar237 * fVar295
    ;
    auVar282._16_4_ =
         (auVar175._16_4_ * fStack_370 + fStack_2f0 * fVar238) * auVar175._16_4_ + fVar238 * fVar296
    ;
    auVar282._20_4_ =
         (auVar175._20_4_ * fStack_36c + fStack_2ec * fVar239) * auVar175._20_4_ + fVar239 * fVar297
    ;
    auVar282._24_4_ =
         (auVar175._24_4_ * fStack_368 + fStack_2e8 * fVar241) * auVar175._24_4_ + fVar241 * fVar298
    ;
    auVar282._28_4_ = fVar418 + fVar386 + 1.0;
    fVar108 = auVar364._0_4_ * fVar110 + auVar419._0_4_ * auVar175._0_4_;
    fVar139 = auVar364._4_4_ * fVar111 + auVar419._4_4_ * auVar175._4_4_;
    fVar142 = auVar364._8_4_ * fVar217 + auVar419._8_4_ * auVar175._8_4_;
    fVar145 = auVar364._12_4_ * fVar237 + auVar419._12_4_ * auVar175._12_4_;
    fVar147 = auVar364._16_4_ * fVar238 + auVar419._16_4_ * auVar175._16_4_;
    fVar149 = auVar364._20_4_ * fVar239 + auVar419._20_4_ * auVar175._20_4_;
    fVar151 = auVar364._24_4_ * fVar241 + auVar419._24_4_ * auVar175._24_4_;
    fVar153 = fVar418 + fStack_2c4;
    fVar109 = auVar372._0_4_ * fVar110 + auVar175._0_4_ * auVar230._0_4_;
    fVar140 = auVar372._4_4_ * fVar111 + auVar175._4_4_ * auVar230._4_4_;
    fVar143 = auVar372._8_4_ * fVar217 + auVar175._8_4_ * auVar230._8_4_;
    fVar146 = auVar372._12_4_ * fVar237 + auVar175._12_4_ * auVar230._12_4_;
    fVar148 = auVar372._16_4_ * fVar238 + auVar175._16_4_ * auVar230._16_4_;
    fVar150 = auVar372._20_4_ * fVar239 + auVar175._20_4_ * auVar230._20_4_;
    fVar152 = auVar372._24_4_ * fVar241 + auVar175._24_4_ * auVar230._24_4_;
    fVar154 = fStack_2c4 + fVar396;
    local_640._0_4_ = auVar383._0_4_ * fVar110 + auVar175._0_4_ * auVar256._0_4_;
    local_640._4_4_ = auVar383._4_4_ * fVar111 + auVar175._4_4_ * auVar256._4_4_;
    fStack_638 = auVar383._8_4_ * fVar217 + auVar175._8_4_ * auVar256._8_4_;
    fStack_634 = auVar383._12_4_ * fVar237 + auVar175._12_4_ * auVar256._12_4_;
    fStack_630 = auVar383._16_4_ * fVar238 + auVar175._16_4_ * auVar256._16_4_;
    fStack_62c = auVar383._20_4_ * fVar239 + auVar175._20_4_ * auVar256._20_4_;
    fStack_628 = auVar383._24_4_ * fVar241 + auVar175._24_4_ * auVar256._24_4_;
    fStack_624 = fVar396 + fStack_2c4;
    local_780._0_4_ = fVar110 * auVar331._0_4_ + auVar175._0_4_ * auVar282._0_4_;
    local_780._4_4_ = fVar111 * auVar331._4_4_ + auVar175._4_4_ * auVar282._4_4_;
    local_780._8_4_ = fVar217 * auVar331._8_4_ + auVar175._8_4_ * auVar282._8_4_;
    local_780._12_4_ = fVar237 * auVar331._12_4_ + auVar175._12_4_ * auVar282._12_4_;
    local_780._16_4_ = fVar238 * auVar331._16_4_ + auVar175._16_4_ * auVar282._16_4_;
    local_780._20_4_ = fVar239 * auVar331._20_4_ + auVar175._20_4_ * auVar282._20_4_;
    local_780._24_4_ = fVar241 * auVar331._24_4_ + auVar175._24_4_ * auVar282._24_4_;
    local_780._28_4_ = auVar127._28_4_ + auVar175._28_4_;
    auVar255 = vsubps_avx(auVar419,auVar364);
    auVar127 = vsubps_avx(auVar230,auVar372);
    auVar128 = vsubps_avx(auVar256,auVar383);
    auVar175 = vsubps_avx(auVar282,auVar331);
    auVar161 = vshufps_avx(ZEXT416((uint)(fVar300 * 0.04761905)),
                           ZEXT416((uint)(fVar300 * 0.04761905)),0);
    fVar267 = auVar161._0_4_;
    fVar325 = fVar267 * auVar255._0_4_ * 3.0;
    fVar269 = auVar161._4_4_;
    fVar337 = fVar269 * auVar255._4_4_ * 3.0;
    local_b00._4_4_ = fVar337;
    local_b00._0_4_ = fVar325;
    fVar296 = auVar161._8_4_;
    fVar338 = fVar296 * auVar255._8_4_ * 3.0;
    fStack_af8 = fVar338;
    fVar294 = auVar161._12_4_;
    fVar340 = fVar294 * auVar255._12_4_ * 3.0;
    fStack_af4 = fVar340;
    fVar342 = fVar267 * auVar255._16_4_ * 3.0;
    unique0x1000799c = fVar342;
    fVar344 = fVar269 * auVar255._20_4_ * 3.0;
    unique0x100079a0 = fVar344;
    fVar346 = fVar296 * auVar255._24_4_ * 3.0;
    unique0x100079a4 = fVar346;
    unique0x100079a8 = auVar331._28_4_;
    fVar387 = fVar267 * auVar127._0_4_ * 3.0;
    fVar390 = fVar269 * auVar127._4_4_ * 3.0;
    local_b20._4_4_ = fVar390;
    local_b20._0_4_ = fVar387;
    fVar391 = fVar296 * auVar127._8_4_ * 3.0;
    local_b20._8_4_ = fVar391;
    fVar392 = fVar294 * auVar127._12_4_ * 3.0;
    local_b20._12_4_ = fVar392;
    fVar393 = fVar267 * auVar127._16_4_ * 3.0;
    local_b20._16_4_ = fVar393;
    fVar394 = fVar269 * auVar127._20_4_ * 3.0;
    local_b20._20_4_ = fVar394;
    fVar395 = fVar296 * auVar127._24_4_ * 3.0;
    local_b20._24_4_ = fVar395;
    local_b20._28_4_ = fVar396;
    fVar397 = fVar267 * auVar128._0_4_ * 3.0;
    fVar405 = fVar269 * auVar128._4_4_ * 3.0;
    auVar38._4_4_ = fVar405;
    auVar38._0_4_ = fVar397;
    fVar408 = fVar296 * auVar128._8_4_ * 3.0;
    auVar38._8_4_ = fVar408;
    fVar410 = fVar294 * auVar128._12_4_ * 3.0;
    auVar38._12_4_ = fVar410;
    fVar412 = fVar267 * auVar128._16_4_ * 3.0;
    auVar38._16_4_ = fVar412;
    fVar414 = fVar269 * auVar128._20_4_ * 3.0;
    auVar38._20_4_ = fVar414;
    fVar416 = fVar296 * auVar128._24_4_ * 3.0;
    auVar38._24_4_ = fVar416;
    auVar38._28_4_ = fVar418;
    fVar239 = fVar267 * auVar175._0_4_ * 3.0;
    fVar241 = fVar269 * auVar175._4_4_ * 3.0;
    auVar31._4_4_ = fVar241;
    auVar31._0_4_ = fVar239;
    fVar292 = fVar296 * auVar175._8_4_ * 3.0;
    auVar31._8_4_ = fVar292;
    fVar294 = fVar294 * auVar175._12_4_ * 3.0;
    auVar31._12_4_ = fVar294;
    fVar267 = fVar267 * auVar175._16_4_ * 3.0;
    auVar31._16_4_ = fVar267;
    fVar269 = fVar269 * auVar175._20_4_ * 3.0;
    auVar31._20_4_ = fVar269;
    fVar296 = fVar296 * auVar175._24_4_ * 3.0;
    auVar31._24_4_ = fVar296;
    auVar31._28_4_ = auVar255._28_4_;
    auVar88._4_4_ = fVar140;
    auVar88._0_4_ = fVar109;
    auVar88._8_4_ = fVar143;
    auVar88._12_4_ = fVar146;
    auVar88._16_4_ = fVar148;
    auVar88._20_4_ = fVar150;
    auVar88._24_4_ = fVar152;
    auVar88._28_4_ = fVar154;
    auVar127 = vperm2f128_avx(auVar88,auVar88,1);
    auVar127 = vshufps_avx(auVar127,auVar88,0x30);
    auVar175 = vshufps_avx(auVar88,auVar127,0x29);
    auVar127 = vperm2f128_avx(_local_640,_local_640,1);
    auVar127 = vshufps_avx(auVar127,_local_640,0x30);
    local_a20 = vshufps_avx(_local_640,auVar127,0x29);
    auVar128 = vsubps_avx(local_780,auVar31);
    auVar127 = vperm2f128_avx(auVar128,auVar128,1);
    auVar127 = vshufps_avx(auVar127,auVar128,0x30);
    local_7a0 = vshufps_avx(auVar128,auVar127,0x29);
    local_560 = vsubps_avx(auVar175,auVar88);
    local_540 = vsubps_avx(local_a20,_local_640);
    fVar110 = local_560._0_4_;
    fVar259 = local_560._4_4_;
    auVar404._4_4_ = fVar405 * fVar259;
    auVar404._0_4_ = fVar397 * fVar110;
    fVar240 = local_560._8_4_;
    auVar404._8_4_ = fVar408 * fVar240;
    fVar271 = local_560._12_4_;
    auVar404._12_4_ = fVar410 * fVar271;
    fVar298 = local_560._16_4_;
    auVar404._16_4_ = fVar412 * fVar298;
    fVar323 = local_560._20_4_;
    auVar404._20_4_ = fVar414 * fVar323;
    fVar20 = local_560._24_4_;
    auVar404._24_4_ = fVar416 * fVar20;
    auVar404._28_4_ = auVar128._28_4_;
    fVar111 = local_540._0_4_;
    fVar261 = local_540._4_4_;
    auVar32._4_4_ = fVar390 * fVar261;
    auVar32._0_4_ = fVar387 * fVar111;
    fVar242 = local_540._8_4_;
    auVar32._8_4_ = fVar391 * fVar242;
    fVar274 = local_540._12_4_;
    auVar32._12_4_ = fVar392 * fVar274;
    fVar301 = local_540._16_4_;
    auVar32._16_4_ = fVar393 * fVar301;
    fVar386 = local_540._20_4_;
    auVar32._20_4_ = fVar394 * fVar386;
    fVar21 = local_540._24_4_;
    auVar32._24_4_ = fVar395 * fVar21;
    auVar32._28_4_ = auVar127._28_4_;
    auVar404 = vsubps_avx(auVar32,auVar404);
    auVar86._4_4_ = fVar139;
    auVar86._0_4_ = fVar108;
    auVar86._8_4_ = fVar142;
    auVar86._12_4_ = fVar145;
    auVar86._16_4_ = fVar147;
    auVar86._20_4_ = fVar149;
    auVar86._24_4_ = fVar151;
    auVar86._28_4_ = fVar153;
    auVar127 = vperm2f128_avx(auVar86,auVar86,1);
    auVar127 = vshufps_avx(auVar127,auVar86,0x30);
    auVar31 = vshufps_avx(auVar86,auVar127,0x29);
    _local_580 = vsubps_avx(auVar31,auVar86);
    auVar33._4_4_ = fVar261 * fVar337;
    auVar33._0_4_ = fVar111 * fVar325;
    auVar33._8_4_ = fVar242 * fVar338;
    auVar33._12_4_ = fVar274 * fVar340;
    auVar33._16_4_ = fVar301 * fVar342;
    auVar33._20_4_ = fVar386 * fVar344;
    auVar33._24_4_ = fVar21 * fVar346;
    auVar33._28_4_ = auVar127._28_4_;
    fVar217 = local_580._0_4_;
    fVar264 = local_580._4_4_;
    auVar34._4_4_ = fVar405 * fVar264;
    auVar34._0_4_ = fVar397 * fVar217;
    fVar260 = local_580._8_4_;
    auVar34._8_4_ = fVar408 * fVar260;
    fVar291 = local_580._12_4_;
    auVar34._12_4_ = fVar410 * fVar291;
    fVar313 = local_580._16_4_;
    auVar34._16_4_ = fVar412 * fVar313;
    fVar418 = local_580._20_4_;
    auVar34._20_4_ = fVar414 * fVar418;
    fVar22 = local_580._24_4_;
    auVar34._24_4_ = fVar416 * fVar22;
    auVar34._28_4_ = fVar153;
    auVar32 = vsubps_avx(auVar34,auVar33);
    auVar35._4_4_ = fVar390 * fVar264;
    auVar35._0_4_ = fVar387 * fVar217;
    auVar35._8_4_ = fVar391 * fVar260;
    auVar35._12_4_ = fVar392 * fVar291;
    auVar35._16_4_ = fVar393 * fVar313;
    auVar35._20_4_ = fVar394 * fVar418;
    auVar35._24_4_ = fVar395 * fVar22;
    auVar35._28_4_ = fVar153;
    auVar36._4_4_ = fVar259 * fVar337;
    auVar36._0_4_ = fVar110 * fVar325;
    auVar36._8_4_ = fVar240 * fVar338;
    auVar36._12_4_ = fVar271 * fVar340;
    auVar36._16_4_ = fVar298 * fVar342;
    auVar36._20_4_ = fVar323 * fVar344;
    auVar36._24_4_ = fVar20 * fVar346;
    auVar36._28_4_ = auVar372._28_4_;
    auVar33 = vsubps_avx(auVar36,auVar35);
    fVar300 = auVar33._28_4_;
    fVar297 = auVar32._28_4_ + fVar300;
    auVar231._0_4_ = fVar217 * fVar217 + fVar110 * fVar110 + fVar111 * fVar111;
    auVar231._4_4_ = fVar264 * fVar264 + fVar259 * fVar259 + fVar261 * fVar261;
    auVar231._8_4_ = fVar260 * fVar260 + fVar240 * fVar240 + fVar242 * fVar242;
    auVar231._12_4_ = fVar291 * fVar291 + fVar271 * fVar271 + fVar274 * fVar274;
    auVar231._16_4_ = fVar313 * fVar313 + fVar298 * fVar298 + fVar301 * fVar301;
    auVar231._20_4_ = fVar418 * fVar418 + fVar323 * fVar323 + fVar386 * fVar386;
    auVar231._24_4_ = fVar22 * fVar22 + fVar20 * fVar20 + fVar21 * fVar21;
    auVar231._28_4_ = fVar300 + fVar300 + fVar297;
    auVar127 = vrcpps_avx(auVar231);
    fVar319 = auVar127._0_4_;
    fVar321 = auVar127._4_4_;
    auVar37._4_4_ = fVar321 * auVar231._4_4_;
    auVar37._0_4_ = fVar319 * auVar231._0_4_;
    fVar263 = auVar127._8_4_;
    auVar37._8_4_ = fVar263 * auVar231._8_4_;
    fVar266 = auVar127._12_4_;
    auVar37._12_4_ = fVar266 * auVar231._12_4_;
    fVar268 = auVar127._16_4_;
    auVar37._16_4_ = fVar268 * auVar231._16_4_;
    fVar270 = auVar127._20_4_;
    auVar37._20_4_ = fVar270 * auVar231._20_4_;
    fVar272 = auVar127._24_4_;
    auVar37._24_4_ = fVar272 * auVar231._24_4_;
    auVar37._28_4_ = auVar372._28_4_;
    auVar129._8_4_ = 0x3f800000;
    auVar129._0_8_ = &DAT_3f8000003f800000;
    auVar129._12_4_ = 0x3f800000;
    auVar129._16_4_ = 0x3f800000;
    auVar129._20_4_ = 0x3f800000;
    auVar129._24_4_ = 0x3f800000;
    auVar129._28_4_ = 0x3f800000;
    auVar34 = vsubps_avx(auVar129,auVar37);
    fVar319 = auVar34._0_4_ * fVar319 + fVar319;
    fVar321 = auVar34._4_4_ * fVar321 + fVar321;
    fVar263 = auVar34._8_4_ * fVar263 + fVar263;
    fVar266 = auVar34._12_4_ * fVar266 + fVar266;
    fVar268 = auVar34._16_4_ * fVar268 + fVar268;
    fVar270 = auVar34._20_4_ * fVar270 + fVar270;
    fVar272 = auVar34._24_4_ * fVar272 + fVar272;
    auVar128 = vperm2f128_avx(local_b20,local_b20,1);
    auVar128 = vshufps_avx(auVar128,local_b20,0x30);
    local_740 = vshufps_avx(local_b20,auVar128,0x29);
    auVar128 = vperm2f128_avx(auVar38,auVar38,1);
    auVar128 = vshufps_avx(auVar128,auVar38,0x30);
    local_980 = vshufps_avx(auVar38,auVar128,0x29);
    fVar398 = local_980._0_4_;
    fVar406 = local_980._4_4_;
    auVar366._4_4_ = fVar406 * fVar259;
    auVar366._0_4_ = fVar398 * fVar110;
    fVar409 = local_980._8_4_;
    auVar366._8_4_ = fVar409 * fVar240;
    fVar411 = local_980._12_4_;
    auVar366._12_4_ = fVar411 * fVar271;
    fVar413 = local_980._16_4_;
    auVar366._16_4_ = fVar413 * fVar298;
    fVar415 = local_980._20_4_;
    auVar366._20_4_ = fVar415 * fVar323;
    fVar417 = local_980._24_4_;
    auVar366._24_4_ = fVar417 * fVar20;
    auVar366._28_4_ = auVar128._28_4_;
    fVar237 = local_740._0_4_;
    fVar273 = local_740._4_4_;
    auVar39._4_4_ = fVar261 * fVar273;
    auVar39._0_4_ = fVar111 * fVar237;
    fVar262 = local_740._8_4_;
    auVar39._8_4_ = fVar242 * fVar262;
    fVar293 = local_740._12_4_;
    auVar39._12_4_ = fVar274 * fVar293;
    fVar315 = local_740._16_4_;
    auVar39._16_4_ = fVar301 * fVar315;
    fVar299 = local_740._20_4_;
    auVar39._20_4_ = fVar386 * fVar299;
    fVar23 = local_740._24_4_;
    auVar39._24_4_ = fVar21 * fVar23;
    auVar39._28_4_ = fVar396;
    auVar35 = vsubps_avx(auVar39,auVar366);
    auVar128 = vperm2f128_avx(_local_b00,_local_b00,1);
    auVar128 = vshufps_avx(auVar128,_local_b00,0x30);
    local_ae0 = vshufps_avx(_local_b00,auVar128,0x29);
    fVar238 = local_ae0._0_4_;
    fVar290 = local_ae0._4_4_;
    auVar40._4_4_ = fVar261 * fVar290;
    auVar40._0_4_ = fVar111 * fVar238;
    fVar265 = local_ae0._8_4_;
    auVar40._8_4_ = fVar242 * fVar265;
    fVar295 = local_ae0._12_4_;
    auVar40._12_4_ = fVar274 * fVar295;
    fVar317 = local_ae0._16_4_;
    auVar40._16_4_ = fVar301 * fVar317;
    fVar396 = local_ae0._20_4_;
    auVar40._20_4_ = fVar386 * fVar396;
    fVar24 = local_ae0._24_4_;
    auVar40._24_4_ = fVar21 * fVar24;
    auVar40._28_4_ = auVar128._28_4_;
    auVar41._4_4_ = fVar406 * fVar264;
    auVar41._0_4_ = fVar398 * fVar217;
    auVar41._8_4_ = fVar409 * fVar260;
    auVar41._12_4_ = fVar411 * fVar291;
    auVar41._16_4_ = fVar413 * fVar313;
    auVar41._20_4_ = fVar415 * fVar418;
    uVar18 = local_980._28_4_;
    auVar41._24_4_ = fVar417 * fVar22;
    auVar41._28_4_ = uVar18;
    auVar36 = vsubps_avx(auVar41,auVar40);
    auVar42._4_4_ = fVar264 * fVar273;
    auVar42._0_4_ = fVar217 * fVar237;
    auVar42._8_4_ = fVar260 * fVar262;
    auVar42._12_4_ = fVar291 * fVar293;
    auVar42._16_4_ = fVar313 * fVar315;
    auVar42._20_4_ = fVar418 * fVar299;
    auVar42._24_4_ = fVar22 * fVar23;
    auVar42._28_4_ = uVar18;
    auVar43._4_4_ = fVar259 * fVar290;
    auVar43._0_4_ = fVar110 * fVar238;
    auVar43._8_4_ = fVar240 * fVar265;
    auVar43._12_4_ = fVar271 * fVar295;
    auVar43._16_4_ = fVar298 * fVar317;
    auVar43._20_4_ = fVar323 * fVar396;
    auVar43._24_4_ = fVar20 * fVar24;
    auVar43._28_4_ = auVar419._28_4_;
    auVar128 = vsubps_avx(auVar43,auVar42);
    fVar300 = auVar128._28_4_;
    auVar44._4_4_ =
         (auVar404._4_4_ * auVar404._4_4_ +
         auVar32._4_4_ * auVar32._4_4_ + auVar33._4_4_ * auVar33._4_4_) * fVar321;
    auVar44._0_4_ =
         (auVar404._0_4_ * auVar404._0_4_ +
         auVar32._0_4_ * auVar32._0_4_ + auVar33._0_4_ * auVar33._0_4_) * fVar319;
    auVar44._8_4_ =
         (auVar404._8_4_ * auVar404._8_4_ +
         auVar32._8_4_ * auVar32._8_4_ + auVar33._8_4_ * auVar33._8_4_) * fVar263;
    auVar44._12_4_ =
         (auVar404._12_4_ * auVar404._12_4_ +
         auVar32._12_4_ * auVar32._12_4_ + auVar33._12_4_ * auVar33._12_4_) * fVar266;
    auVar44._16_4_ =
         (auVar404._16_4_ * auVar404._16_4_ +
         auVar32._16_4_ * auVar32._16_4_ + auVar33._16_4_ * auVar33._16_4_) * fVar268;
    auVar44._20_4_ =
         (auVar404._20_4_ * auVar404._20_4_ +
         auVar32._20_4_ * auVar32._20_4_ + auVar33._20_4_ * auVar33._20_4_) * fVar270;
    auVar44._24_4_ =
         (auVar404._24_4_ * auVar404._24_4_ +
         auVar32._24_4_ * auVar32._24_4_ + auVar33._24_4_ * auVar33._24_4_) * fVar272;
    auVar44._28_4_ = auVar404._28_4_ + fVar297;
    auVar45._4_4_ =
         (auVar35._4_4_ * auVar35._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar128._4_4_ * auVar128._4_4_) * fVar321;
    auVar45._0_4_ =
         (auVar35._0_4_ * auVar35._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar128._0_4_ * auVar128._0_4_) * fVar319;
    auVar45._8_4_ =
         (auVar35._8_4_ * auVar35._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar128._8_4_ * auVar128._8_4_) * fVar263;
    auVar45._12_4_ =
         (auVar35._12_4_ * auVar35._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar128._12_4_ * auVar128._12_4_) * fVar266;
    auVar45._16_4_ =
         (auVar35._16_4_ * auVar35._16_4_ +
         auVar36._16_4_ * auVar36._16_4_ + auVar128._16_4_ * auVar128._16_4_) * fVar268;
    auVar45._20_4_ =
         (auVar35._20_4_ * auVar35._20_4_ +
         auVar36._20_4_ * auVar36._20_4_ + auVar128._20_4_ * auVar128._20_4_) * fVar270;
    auVar45._24_4_ =
         (auVar35._24_4_ * auVar35._24_4_ +
         auVar36._24_4_ * auVar36._24_4_ + auVar128._24_4_ * auVar128._24_4_) * fVar272;
    auVar45._28_4_ = auVar34._28_4_ + auVar127._28_4_;
    auVar127 = vmaxps_avx(auVar44,auVar45);
    auVar128 = vperm2f128_avx(local_780,local_780,1);
    auVar128 = vshufps_avx(auVar128,local_780,0x30);
    local_7e0 = vshufps_avx(local_780,auVar128,0x29);
    local_620._0_4_ = (float)local_780._0_4_ + fVar239;
    local_620._4_4_ = local_780._4_4_ + fVar241;
    local_620._8_4_ = local_780._8_4_ + fVar292;
    local_620._12_4_ = local_780._12_4_ + fVar294;
    local_620._16_4_ = local_780._16_4_ + fVar267;
    local_620._20_4_ = local_780._20_4_ + fVar269;
    local_620._24_4_ = local_780._24_4_ + fVar296;
    local_620._28_4_ = local_780._28_4_ + auVar255._28_4_;
    auVar128 = vmaxps_avx(local_780,local_620);
    auVar255 = vmaxps_avx(local_7a0,local_7e0);
    auVar128 = vmaxps_avx(auVar128,auVar255);
    auVar255 = vrsqrtps_avx(auVar231);
    fVar239 = auVar255._0_4_;
    fVar241 = auVar255._4_4_;
    fVar292 = auVar255._8_4_;
    fVar294 = auVar255._12_4_;
    fVar267 = auVar255._16_4_;
    fVar269 = auVar255._20_4_;
    fVar296 = auVar255._24_4_;
    local_400 = fVar239 * 1.5 + fVar239 * fVar239 * fVar239 * auVar231._0_4_ * -0.5;
    fStack_3fc = fVar241 * 1.5 + fVar241 * fVar241 * fVar241 * auVar231._4_4_ * -0.5;
    fStack_3f8 = fVar292 * 1.5 + fVar292 * fVar292 * fVar292 * auVar231._8_4_ * -0.5;
    fStack_3f4 = fVar294 * 1.5 + fVar294 * fVar294 * fVar294 * auVar231._12_4_ * -0.5;
    fStack_3f0 = fVar267 * 1.5 + fVar267 * fVar267 * fVar267 * auVar231._16_4_ * -0.5;
    fStack_3ec = fVar269 * 1.5 + fVar269 * fVar269 * fVar269 * auVar231._20_4_ * -0.5;
    fStack_3e8 = fVar296 * 1.5 + fVar296 * fVar296 * fVar296 * auVar231._24_4_ * -0.5;
    fStack_3e4 = auVar255._28_4_ + auVar231._28_4_;
    auVar89._4_4_ = fVar140;
    auVar89._0_4_ = fVar109;
    auVar89._8_4_ = fVar143;
    auVar89._12_4_ = fVar146;
    auVar89._16_4_ = fVar148;
    auVar89._20_4_ = fVar150;
    auVar89._24_4_ = fVar152;
    auVar89._28_4_ = fVar154;
    local_9a0 = vsubps_avx(ZEXT832(0) << 0x20,auVar89);
    auVar404 = vsubps_avx(ZEXT832(0) << 0x20,_local_640);
    fVar423 = auVar404._0_4_;
    fVar425 = auVar404._4_4_;
    fVar426 = auVar404._8_4_;
    fVar427 = auVar404._12_4_;
    fVar428 = auVar404._16_4_;
    fVar429 = auVar404._20_4_;
    fVar430 = auVar404._24_4_;
    fVar239 = local_9a0._0_4_;
    fVar292 = local_9a0._4_4_;
    fVar267 = local_9a0._8_4_;
    fVar296 = local_9a0._12_4_;
    fVar319 = local_9a0._16_4_;
    fVar263 = local_9a0._20_4_;
    fVar268 = local_9a0._24_4_;
    auVar87._4_4_ = fVar139;
    auVar87._0_4_ = fVar108;
    auVar87._8_4_ = fVar142;
    auVar87._12_4_ = fVar145;
    auVar87._16_4_ = fVar147;
    auVar87._20_4_ = fVar149;
    auVar87._24_4_ = fVar151;
    auVar87._28_4_ = fVar153;
    auVar32 = vsubps_avx(ZEXT832(0) << 0x20,auVar87);
    fVar241 = auVar32._0_4_;
    fVar294 = auVar32._4_4_;
    fVar269 = auVar32._8_4_;
    fVar297 = auVar32._12_4_;
    fVar321 = auVar32._16_4_;
    fVar266 = auVar32._20_4_;
    fVar270 = auVar32._24_4_;
    auVar389._0_4_ =
         (float)local_800._0_4_ * fVar241 +
         (float)local_820._0_4_ * fVar239 + fVar423 * (float)local_840._0_4_;
    auVar389._4_4_ =
         (float)local_800._4_4_ * fVar294 +
         (float)local_820._4_4_ * fVar292 + fVar425 * (float)local_840._4_4_;
    auVar389._8_4_ = fStack_7f8 * fVar269 + fStack_818 * fVar267 + fVar426 * fStack_838;
    auVar389._12_4_ = fStack_7f4 * fVar297 + fStack_814 * fVar296 + fVar427 * fStack_834;
    auVar389._16_4_ = fStack_7f0 * fVar321 + fStack_810 * fVar319 + fVar428 * fStack_830;
    auVar389._20_4_ = fStack_7ec * fVar266 + fStack_80c * fVar263 + fVar429 * fStack_82c;
    auVar389._24_4_ = fStack_7e8 * fVar270 + fStack_808 * fVar268 + fVar430 * fStack_828;
    auVar389._28_4_ = fVar300 + auVar36._28_4_ + fVar300 + auVar255._28_4_;
    auVar401._0_4_ = fVar241 * fVar241 + fVar239 * fVar239 + fVar423 * fVar423;
    auVar401._4_4_ = fVar294 * fVar294 + fVar292 * fVar292 + fVar425 * fVar425;
    auVar401._8_4_ = fVar269 * fVar269 + fVar267 * fVar267 + fVar426 * fVar426;
    auVar401._12_4_ = fVar297 * fVar297 + fVar296 * fVar296 + fVar427 * fVar427;
    auVar401._16_4_ = fVar321 * fVar321 + fVar319 * fVar319 + fVar428 * fVar428;
    auVar401._20_4_ = fVar266 * fVar266 + fVar263 * fVar263 + fVar429 * fVar429;
    auVar401._24_4_ = fVar270 * fVar270 + fVar268 * fVar268 + fVar430 * fVar430;
    auVar401._28_4_ = auVar419._28_4_ + auVar419._28_4_ + fVar300;
    fVar348 = (float)local_800._0_4_ * fVar217 * local_400 +
              fVar110 * local_400 * (float)local_820._0_4_ +
              fVar111 * local_400 * (float)local_840._0_4_;
    fVar355 = (float)local_800._4_4_ * fVar264 * fStack_3fc +
              fVar259 * fStack_3fc * (float)local_820._4_4_ +
              fVar261 * fStack_3fc * (float)local_840._4_4_;
    fVar356 = fStack_7f8 * fVar260 * fStack_3f8 +
              fVar240 * fStack_3f8 * fStack_818 + fVar242 * fStack_3f8 * fStack_838;
    fVar357 = fStack_7f4 * fVar291 * fStack_3f4 +
              fVar271 * fStack_3f4 * fStack_814 + fVar274 * fStack_3f4 * fStack_834;
    fVar358 = fStack_7f0 * fVar313 * fStack_3f0 +
              fVar298 * fStack_3f0 * fStack_810 + fVar301 * fStack_3f0 * fStack_830;
    fVar359 = fStack_7ec * fVar418 * fStack_3ec +
              fVar323 * fStack_3ec * fStack_80c + fVar386 * fStack_3ec * fStack_82c;
    fVar360 = fStack_7e8 * fVar22 * fStack_3e8 +
              fVar20 * fStack_3e8 * fStack_808 + fVar21 * fStack_3e8 * fStack_828;
    fVar300 = fStack_7e4 + fStack_804 + fStack_824;
    fVar369 = fVar241 * fVar217 * local_400 +
              fVar110 * local_400 * fVar239 + fVar423 * fVar111 * local_400;
    fVar374 = fVar294 * fVar264 * fStack_3fc +
              fVar259 * fStack_3fc * fVar292 + fVar425 * fVar261 * fStack_3fc;
    fVar375 = fVar269 * fVar260 * fStack_3f8 +
              fVar240 * fStack_3f8 * fVar267 + fVar426 * fVar242 * fStack_3f8;
    fVar376 = fVar297 * fVar291 * fStack_3f4 +
              fVar271 * fStack_3f4 * fVar296 + fVar427 * fVar274 * fStack_3f4;
    fVar377 = fVar321 * fVar313 * fStack_3f0 +
              fVar298 * fStack_3f0 * fVar319 + fVar428 * fVar301 * fStack_3f0;
    fVar378 = fVar266 * fVar418 * fStack_3ec +
              fVar323 * fStack_3ec * fVar263 + fVar429 * fVar386 * fStack_3ec;
    fVar379 = fVar270 * fVar22 * fStack_3e8 +
              fVar20 * fStack_3e8 * fVar268 + fVar430 * fVar21 * fStack_3e8;
    fVar380 = fStack_804 + fVar300;
    auVar46._4_4_ = fVar355 * fVar374;
    auVar46._0_4_ = fVar348 * fVar369;
    auVar46._8_4_ = fVar356 * fVar375;
    auVar46._12_4_ = fVar357 * fVar376;
    auVar46._16_4_ = fVar358 * fVar377;
    auVar46._20_4_ = fVar359 * fVar378;
    auVar46._24_4_ = fVar360 * fVar379;
    auVar46._28_4_ = fVar300;
    auVar255 = vsubps_avx(auVar389,auVar46);
    auVar47._4_4_ = fVar374 * fVar374;
    auVar47._0_4_ = fVar369 * fVar369;
    auVar47._8_4_ = fVar375 * fVar375;
    auVar47._12_4_ = fVar376 * fVar376;
    auVar47._16_4_ = fVar377 * fVar377;
    auVar47._20_4_ = fVar378 * fVar378;
    auVar47._24_4_ = fVar379 * fVar379;
    auVar47._28_4_ = fStack_804;
    auVar33 = vsubps_avx(auVar401,auVar47);
    auVar312 = ZEXT3264(auVar33);
    auVar404 = vsqrtps_avx(auVar127);
    fVar300 = (auVar404._0_4_ + auVar128._0_4_) * 1.0000002;
    fVar272 = (auVar404._4_4_ + auVar128._4_4_) * 1.0000002;
    fVar193 = (auVar404._8_4_ + auVar128._8_4_) * 1.0000002;
    fVar195 = (auVar404._12_4_ + auVar128._12_4_) * 1.0000002;
    fVar196 = (auVar404._16_4_ + auVar128._16_4_) * 1.0000002;
    fVar197 = (auVar404._20_4_ + auVar128._20_4_) * 1.0000002;
    fVar198 = (auVar404._24_4_ + auVar128._24_4_) * 1.0000002;
    auVar48._4_4_ = fVar272 * fVar272;
    auVar48._0_4_ = fVar300 * fVar300;
    auVar48._8_4_ = fVar193 * fVar193;
    auVar48._12_4_ = fVar195 * fVar195;
    auVar48._16_4_ = fVar196 * fVar196;
    auVar48._20_4_ = fVar197 * fVar197;
    auVar48._24_4_ = fVar198 * fVar198;
    auVar48._28_4_ = auVar404._28_4_ + auVar128._28_4_;
    fVar399 = auVar255._0_4_ + auVar255._0_4_;
    fVar407 = auVar255._4_4_ + auVar255._4_4_;
    local_5a0._0_8_ = CONCAT44(fVar407,fVar399);
    local_5a0._8_4_ = auVar255._8_4_ + auVar255._8_4_;
    local_5a0._12_4_ = auVar255._12_4_ + auVar255._12_4_;
    local_5a0._16_4_ = auVar255._16_4_ + auVar255._16_4_;
    local_5a0._20_4_ = auVar255._20_4_ + auVar255._20_4_;
    local_5a0._24_4_ = auVar255._24_4_ + auVar255._24_4_;
    fVar300 = auVar255._28_4_;
    local_5a0._28_4_ = fVar300 + fVar300;
    auVar128 = vsubps_avx(auVar33,auVar48);
    local_420._4_4_ = fVar355 * fVar355;
    local_420._0_4_ = fVar348 * fVar348;
    local_420._8_4_ = fVar356 * fVar356;
    local_420._12_4_ = fVar357 * fVar357;
    local_420._16_4_ = fVar358 * fVar358;
    local_420._20_4_ = fVar359 * fVar359;
    local_420._24_4_ = fVar360 * fVar360;
    local_420._28_4_ = local_580._28_4_;
    auVar385 = ZEXT3264(local_420);
    local_660 = vsubps_avx(local_3a0,local_420);
    auVar49._4_4_ = fVar407 * fVar407;
    auVar49._0_4_ = fVar399 * fVar399;
    auVar49._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
    auVar49._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
    auVar49._16_4_ = local_5a0._16_4_ * local_5a0._16_4_;
    auVar49._20_4_ = local_5a0._20_4_ * local_5a0._20_4_;
    auVar49._24_4_ = local_5a0._24_4_ * local_5a0._24_4_;
    auVar49._28_4_ = fVar300;
    fVar272 = local_660._0_4_;
    fVar193 = local_660._4_4_;
    fVar195 = local_660._8_4_;
    fVar196 = local_660._12_4_;
    fVar197 = local_660._16_4_;
    fVar198 = local_660._20_4_;
    fVar368 = local_660._24_4_;
    auVar50._4_4_ = fVar193 * 4.0 * auVar128._4_4_;
    auVar50._0_4_ = fVar272 * 4.0 * auVar128._0_4_;
    auVar50._8_4_ = fVar195 * 4.0 * auVar128._8_4_;
    auVar50._12_4_ = fVar196 * 4.0 * auVar128._12_4_;
    auVar50._16_4_ = fVar197 * 4.0 * auVar128._16_4_;
    auVar50._20_4_ = fVar198 * 4.0 * auVar128._20_4_;
    auVar50._24_4_ = fVar368 * 4.0 * auVar128._24_4_;
    auVar50._28_4_ = 0x40800000;
    auVar255 = vsubps_avx(auVar49,auVar50);
    auVar127 = vcmpps_avx(auVar255,ZEXT832(0) << 0x20,5);
    fVar300 = local_660._28_4_;
    if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar127 >> 0x7f,0) == '\0') &&
          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar127 >> 0xbf,0) == '\0') &&
        (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar127[0x1f])
    {
      auVar232._8_4_ = 0x7f800000;
      auVar232._0_8_ = 0x7f8000007f800000;
      auVar232._12_4_ = 0x7f800000;
      auVar232._16_4_ = 0x7f800000;
      auVar232._20_4_ = 0x7f800000;
      auVar232._24_4_ = 0x7f800000;
      auVar232._28_4_ = 0x7f800000;
      auVar420._8_4_ = 0xff800000;
      auVar420._0_8_ = 0xff800000ff800000;
      auVar420._12_4_ = 0xff800000;
      auVar420._16_4_ = 0xff800000;
      auVar420._20_4_ = 0xff800000;
      auVar420._24_4_ = 0xff800000;
      auVar420._28_4_ = 0xff800000;
    }
    else {
      auVar36 = vsqrtps_avx(auVar255);
      auVar307._0_4_ = fVar272 + fVar272;
      auVar307._4_4_ = fVar193 + fVar193;
      auVar307._8_4_ = fVar195 + fVar195;
      auVar307._12_4_ = fVar196 + fVar196;
      auVar307._16_4_ = fVar197 + fVar197;
      auVar307._20_4_ = fVar198 + fVar198;
      auVar307._24_4_ = fVar368 + fVar368;
      auVar307._28_4_ = fVar300 + fVar300;
      auVar35 = vrcpps_avx(auVar307);
      auVar34 = vcmpps_avx(auVar255,ZEXT832(0) << 0x20,5);
      fVar302 = auVar35._0_4_;
      fVar314 = auVar35._4_4_;
      auVar51._4_4_ = auVar307._4_4_ * fVar314;
      auVar51._0_4_ = auVar307._0_4_ * fVar302;
      fVar316 = auVar35._8_4_;
      auVar51._8_4_ = auVar307._8_4_ * fVar316;
      fVar318 = auVar35._12_4_;
      auVar51._12_4_ = auVar307._12_4_ * fVar318;
      fVar320 = auVar35._16_4_;
      auVar51._16_4_ = auVar307._16_4_ * fVar320;
      fVar322 = auVar35._20_4_;
      auVar51._20_4_ = auVar307._20_4_ * fVar322;
      fVar324 = auVar35._24_4_;
      auVar51._24_4_ = auVar307._24_4_ * fVar324;
      auVar51._28_4_ = auVar307._28_4_;
      auVar233._8_4_ = 0x3f800000;
      auVar233._0_8_ = &DAT_3f8000003f800000;
      auVar233._12_4_ = 0x3f800000;
      auVar233._16_4_ = 0x3f800000;
      auVar233._20_4_ = 0x3f800000;
      auVar233._24_4_ = 0x3f800000;
      auVar233._28_4_ = 0x3f800000;
      auVar255 = vsubps_avx(auVar233,auVar51);
      fVar302 = fVar302 + fVar302 * auVar255._0_4_;
      fVar314 = fVar314 + fVar314 * auVar255._4_4_;
      fVar316 = fVar316 + fVar316 * auVar255._8_4_;
      fVar318 = fVar318 + fVar318 * auVar255._12_4_;
      fVar320 = fVar320 + fVar320 * auVar255._16_4_;
      fVar322 = fVar322 + fVar322 * auVar255._20_4_;
      fVar324 = fVar324 + fVar324 * auVar255._24_4_;
      auVar332._0_8_ = CONCAT44(fVar407,fVar399) ^ 0x8000000080000000;
      auVar332._8_4_ = -local_5a0._8_4_;
      auVar332._12_4_ = -local_5a0._12_4_;
      auVar332._16_4_ = -local_5a0._16_4_;
      auVar332._20_4_ = -local_5a0._20_4_;
      auVar332._24_4_ = -local_5a0._24_4_;
      auVar332._28_4_ = -local_5a0._28_4_;
      auVar37 = vsubps_avx(auVar332,auVar36);
      fVar399 = auVar37._0_4_ * fVar302;
      fVar407 = auVar37._4_4_ * fVar314;
      auVar52._4_4_ = fVar407;
      auVar52._0_4_ = fVar399;
      fVar339 = auVar37._8_4_ * fVar316;
      auVar52._8_4_ = fVar339;
      fVar341 = auVar37._12_4_ * fVar318;
      auVar52._12_4_ = fVar341;
      fVar343 = auVar37._16_4_ * fVar320;
      auVar52._16_4_ = fVar343;
      fVar345 = auVar37._20_4_ * fVar322;
      auVar52._20_4_ = fVar345;
      fVar347 = auVar37._24_4_ * fVar324;
      auVar52._24_4_ = fVar347;
      auVar52._28_4_ = auVar37._28_4_;
      auVar36 = vsubps_avx(auVar36,local_5a0);
      fVar302 = auVar36._0_4_ * fVar302;
      fVar314 = auVar36._4_4_ * fVar314;
      auVar53._4_4_ = fVar314;
      auVar53._0_4_ = fVar302;
      fVar316 = auVar36._8_4_ * fVar316;
      auVar53._8_4_ = fVar316;
      fVar318 = auVar36._12_4_ * fVar318;
      auVar53._12_4_ = fVar318;
      fVar320 = auVar36._16_4_ * fVar320;
      auVar53._16_4_ = fVar320;
      fVar322 = auVar36._20_4_ * fVar322;
      auVar53._20_4_ = fVar322;
      fVar324 = auVar36._24_4_ * fVar324;
      auVar53._24_4_ = fVar324;
      auVar53._28_4_ = auVar36._28_4_;
      fStack_4e4 = fVar380 + auVar35._28_4_ + auVar255._28_4_;
      local_500[0] = local_400 * (fVar369 + fVar348 * fVar399);
      local_500[1] = fStack_3fc * (fVar374 + fVar355 * fVar407);
      local_500[2] = fStack_3f8 * (fVar375 + fVar356 * fVar339);
      local_500[3] = fStack_3f4 * (fVar376 + fVar357 * fVar341);
      fStack_4f0 = fStack_3f0 * (fVar377 + fVar358 * fVar343);
      fStack_4ec = fStack_3ec * (fVar378 + fVar359 * fVar345);
      fStack_4e8 = fStack_3e8 * (fVar379 + fVar360 * fVar347);
      local_520[0] = local_400 * (fVar369 + fVar348 * fVar302);
      local_520[1] = fStack_3fc * (fVar374 + fVar355 * fVar314);
      local_520[2] = fStack_3f8 * (fVar375 + fVar356 * fVar316);
      local_520[3] = fStack_3f4 * (fVar376 + fVar357 * fVar318);
      fStack_510 = fStack_3f0 * (fVar377 + fVar358 * fVar320);
      fStack_50c = fStack_3ec * (fVar378 + fVar359 * fVar322);
      fStack_508 = fStack_3e8 * (fVar379 + fVar360 * fVar324);
      fStack_504 = fVar380 + fStack_4e4;
      auVar308._8_4_ = 0x7f800000;
      auVar308._0_8_ = 0x7f8000007f800000;
      auVar308._12_4_ = 0x7f800000;
      auVar308._16_4_ = 0x7f800000;
      auVar308._20_4_ = 0x7f800000;
      auVar308._24_4_ = 0x7f800000;
      auVar308._28_4_ = 0x7f800000;
      auVar232 = vblendvps_avx(auVar308,auVar52,auVar34);
      auVar333._8_4_ = 0x7fffffff;
      auVar333._0_8_ = 0x7fffffff7fffffff;
      auVar333._12_4_ = 0x7fffffff;
      auVar333._16_4_ = 0x7fffffff;
      auVar333._20_4_ = 0x7fffffff;
      auVar333._24_4_ = 0x7fffffff;
      auVar333._28_4_ = 0x7fffffff;
      auVar255 = vandps_avx(local_420,auVar333);
      auVar255 = vmaxps_avx(local_4c0,auVar255);
      auVar54._4_4_ = auVar255._4_4_ * 1.9073486e-06;
      auVar54._0_4_ = auVar255._0_4_ * 1.9073486e-06;
      auVar54._8_4_ = auVar255._8_4_ * 1.9073486e-06;
      auVar54._12_4_ = auVar255._12_4_ * 1.9073486e-06;
      auVar54._16_4_ = auVar255._16_4_ * 1.9073486e-06;
      auVar54._20_4_ = auVar255._20_4_ * 1.9073486e-06;
      auVar54._24_4_ = auVar255._24_4_ * 1.9073486e-06;
      auVar54._28_4_ = auVar255._28_4_;
      auVar255 = vandps_avx(local_660,auVar333);
      auVar255 = vcmpps_avx(auVar255,auVar54,1);
      auVar309._8_4_ = 0xff800000;
      auVar309._0_8_ = 0xff800000ff800000;
      auVar309._12_4_ = 0xff800000;
      auVar309._16_4_ = 0xff800000;
      auVar309._20_4_ = 0xff800000;
      auVar309._24_4_ = 0xff800000;
      auVar309._28_4_ = 0xff800000;
      auVar312 = ZEXT3264(auVar309);
      auVar420 = vblendvps_avx(auVar309,auVar53,auVar34);
      auVar35 = auVar34 & auVar255;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        auVar127 = vandps_avx(auVar255,auVar34);
        auVar161 = vpackssdw_avx(auVar127._0_16_,auVar127._16_16_);
        auVar255 = vcmpps_avx(auVar128,ZEXT832(0) << 0x20,2);
        auVar354._8_4_ = 0xff800000;
        auVar354._0_8_ = 0xff800000ff800000;
        auVar354._12_4_ = 0xff800000;
        auVar354._16_4_ = 0xff800000;
        auVar354._20_4_ = 0xff800000;
        auVar354._24_4_ = 0xff800000;
        auVar354._28_4_ = 0xff800000;
        auVar403._8_4_ = 0x7f800000;
        auVar403._0_8_ = 0x7f8000007f800000;
        auVar403._12_4_ = 0x7f800000;
        auVar403._16_4_ = 0x7f800000;
        auVar403._20_4_ = 0x7f800000;
        auVar403._24_4_ = 0x7f800000;
        auVar403._28_4_ = 0x7f800000;
        auVar128 = vblendvps_avx(auVar403,auVar354,auVar255);
        auVar225 = vpmovsxwd_avx(auVar161);
        auVar161 = vpunpckhwd_avx(auVar161,auVar161);
        auVar289._16_16_ = auVar161;
        auVar289._0_16_ = auVar225;
        auVar232 = vblendvps_avx(auVar232,auVar128,auVar289);
        auVar128 = vblendvps_avx(auVar354,auVar403,auVar255);
        auVar312 = ZEXT3264(auVar128);
        auVar420 = vblendvps_avx(auVar420,auVar128,auVar289);
        auVar128 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar215._0_4_ = auVar127._0_4_ ^ auVar128._0_4_;
        auVar215._4_4_ = auVar127._4_4_ ^ auVar128._4_4_;
        auVar215._8_4_ = auVar127._8_4_ ^ auVar128._8_4_;
        auVar215._12_4_ = auVar127._12_4_ ^ auVar128._12_4_;
        auVar215._16_4_ = auVar127._16_4_ ^ auVar128._16_4_;
        auVar215._20_4_ = auVar127._20_4_ ^ auVar128._20_4_;
        auVar215._24_4_ = auVar127._24_4_ ^ auVar128._24_4_;
        auVar215._28_4_ = auVar127._28_4_ ^ auVar128._28_4_;
        auVar127 = vorps_avx(auVar255,auVar215);
        auVar127 = vandps_avx(auVar34,auVar127);
      }
    }
    auVar128 = local_3c0 & auVar127;
    if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar128 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar128 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar128 >> 0x7f,0) == '\0') &&
          (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar128 >> 0xbf,0) == '\0') &&
        (auVar128 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar128[0x1f])
    {
      auVar336 = ZEXT1664((undefined1  [16])0x0);
      auVar255._8_4_ = 0x3f800000;
      auVar255._0_8_ = &DAT_3f8000003f800000;
      auVar255._12_4_ = 0x3f800000;
      auVar255._16_4_ = 0x3f800000;
      auVar255._20_4_ = 0x3f800000;
      auVar255._24_4_ = 0x3f800000;
      auVar255._28_4_ = 0x3f800000;
    }
    else {
      auVar161 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_900._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_900._0_4_)),0);
      auVar176._16_16_ = auVar161;
      auVar176._0_16_ = auVar161;
      local_5c0 = vminps_avx(auVar176,auVar420);
      auVar130._0_4_ =
           (float)local_800._0_4_ * fVar325 +
           (float)local_820._0_4_ * fVar387 + fVar397 * (float)local_840._0_4_;
      auVar130._4_4_ =
           (float)local_800._4_4_ * fVar337 +
           (float)local_820._4_4_ * fVar390 + fVar405 * (float)local_840._4_4_;
      auVar130._8_4_ = fStack_7f8 * fVar338 + fStack_818 * fVar391 + fVar408 * fStack_838;
      auVar130._12_4_ = fStack_7f4 * fVar340 + fStack_814 * fVar392 + fVar410 * fStack_834;
      auVar130._16_4_ = fStack_7f0 * fVar342 + fStack_810 * fVar393 + fVar412 * fStack_830;
      auVar130._20_4_ = fStack_7ec * fVar344 + fStack_80c * fVar394 + fVar414 * fStack_82c;
      auVar130._24_4_ = fStack_7e8 * fVar346 + fStack_808 * fVar395 + fVar416 * fStack_828;
      auVar130._28_4_ = auVar331._28_4_ + auVar32._28_4_ + 1.0;
      auVar128 = vrcpps_avx(auVar130);
      fVar399 = auVar128._0_4_;
      fVar407 = auVar128._4_4_;
      auVar55._4_4_ = auVar130._4_4_ * fVar407;
      auVar55._0_4_ = auVar130._0_4_ * fVar399;
      fVar302 = auVar128._8_4_;
      auVar55._8_4_ = auVar130._8_4_ * fVar302;
      fVar314 = auVar128._12_4_;
      auVar55._12_4_ = auVar130._12_4_ * fVar314;
      fVar316 = auVar128._16_4_;
      auVar55._16_4_ = auVar130._16_4_ * fVar316;
      fVar318 = auVar128._20_4_;
      auVar55._20_4_ = auVar130._20_4_ * fVar318;
      fVar320 = auVar128._24_4_;
      auVar55._24_4_ = auVar130._24_4_ * fVar320;
      auVar55._28_4_ = 0x3f800000;
      auVar402._8_4_ = 0x3f800000;
      auVar402._0_8_ = &DAT_3f8000003f800000;
      auVar402._12_4_ = 0x3f800000;
      auVar402._16_4_ = 0x3f800000;
      auVar402._20_4_ = 0x3f800000;
      auVar402._24_4_ = 0x3f800000;
      auVar402._28_4_ = 0x3f800000;
      auVar34 = vsubps_avx(auVar402,auVar55);
      auVar365._8_4_ = 0x7fffffff;
      auVar365._0_8_ = 0x7fffffff7fffffff;
      auVar365._12_4_ = 0x7fffffff;
      auVar365._16_4_ = 0x7fffffff;
      auVar365._20_4_ = 0x7fffffff;
      auVar365._24_4_ = 0x7fffffff;
      auVar365._28_4_ = 0x7fffffff;
      auVar128 = vandps_avx(auVar365,auVar130);
      auVar421._8_4_ = 0x219392ef;
      auVar421._0_8_ = 0x219392ef219392ef;
      auVar421._12_4_ = 0x219392ef;
      auVar421._16_4_ = 0x219392ef;
      auVar421._20_4_ = 0x219392ef;
      auVar421._24_4_ = 0x219392ef;
      auVar421._28_4_ = 0x219392ef;
      auVar255 = vcmpps_avx(auVar128,auVar421,1);
      auVar56._4_4_ =
           (fVar407 + fVar407 * auVar34._4_4_) *
           -(fVar294 * fVar337 + fVar390 * fVar292 + fVar425 * fVar405);
      auVar56._0_4_ =
           (fVar399 + fVar399 * auVar34._0_4_) *
           -(fVar241 * fVar325 + fVar387 * fVar239 + fVar423 * fVar397);
      auVar56._8_4_ =
           (fVar302 + fVar302 * auVar34._8_4_) *
           -(fVar269 * fVar338 + fVar391 * fVar267 + fVar426 * fVar408);
      auVar56._12_4_ =
           (fVar314 + fVar314 * auVar34._12_4_) *
           -(fVar297 * fVar340 + fVar392 * fVar296 + fVar427 * fVar410);
      auVar56._16_4_ =
           (fVar316 + fVar316 * auVar34._16_4_) *
           -(fVar321 * fVar342 + fVar393 * fVar319 + fVar428 * fVar412);
      auVar56._20_4_ =
           (fVar318 + fVar318 * auVar34._20_4_) *
           -(fVar266 * fVar344 + fVar394 * fVar263 + fVar429 * fVar414);
      auVar56._24_4_ =
           (fVar320 + fVar320 * auVar34._24_4_) *
           -(fVar270 * fVar346 + fVar395 * fVar268 + fVar430 * fVar416);
      auVar56._28_4_ = -(auVar32._28_4_ + auVar232._28_4_ + 1.0);
      auVar79 = ZEXT812(0);
      auVar363 = ZEXT1228(auVar79) << 0x20;
      auVar128 = vcmpps_avx(auVar130,ZEXT1232(auVar79) << 0x20,1);
      auVar128 = vorps_avx(auVar255,auVar128);
      auVar373._8_4_ = 0xff800000;
      auVar373._0_8_ = 0xff800000ff800000;
      auVar373._12_4_ = 0xff800000;
      auVar373._16_4_ = 0xff800000;
      auVar373._20_4_ = 0xff800000;
      auVar373._24_4_ = 0xff800000;
      auVar373._28_4_ = 0xff800000;
      auVar128 = vblendvps_avx(auVar56,auVar373,auVar128);
      auVar32 = vcmpps_avx(auVar130,ZEXT1232(auVar79) << 0x20,6);
      auVar255 = vorps_avx(auVar255,auVar32);
      auVar384._8_4_ = 0x7f800000;
      auVar384._0_8_ = 0x7f8000007f800000;
      auVar384._12_4_ = 0x7f800000;
      auVar384._16_4_ = 0x7f800000;
      auVar384._20_4_ = 0x7f800000;
      auVar384._24_4_ = 0x7f800000;
      auVar384._28_4_ = 0x7f800000;
      auVar385 = ZEXT3264(auVar384);
      auVar255 = vblendvps_avx(auVar56,auVar384,auVar255);
      auVar32 = vmaxps_avx(local_3e0,auVar232);
      auVar32 = vmaxps_avx(auVar32,auVar128);
      auVar34 = vminps_avx(local_5c0,auVar255);
      auVar366 = ZEXT1232(auVar79) << 0x20;
      auVar128 = vsubps_avx(auVar366,auVar175);
      auVar255 = vsubps_avx(auVar366,local_a20);
      auVar57._4_4_ = auVar255._4_4_ * -fVar406;
      auVar57._0_4_ = auVar255._0_4_ * -fVar398;
      auVar57._8_4_ = auVar255._8_4_ * -fVar409;
      auVar57._12_4_ = auVar255._12_4_ * -fVar411;
      auVar57._16_4_ = auVar255._16_4_ * -fVar413;
      auVar57._20_4_ = auVar255._20_4_ * -fVar415;
      auVar57._24_4_ = auVar255._24_4_ * -fVar417;
      auVar57._28_4_ = auVar255._28_4_;
      auVar58._4_4_ = fVar273 * auVar128._4_4_;
      auVar58._0_4_ = fVar237 * auVar128._0_4_;
      auVar58._8_4_ = fVar262 * auVar128._8_4_;
      auVar58._12_4_ = fVar293 * auVar128._12_4_;
      auVar58._16_4_ = fVar315 * auVar128._16_4_;
      auVar58._20_4_ = fVar299 * auVar128._20_4_;
      auVar58._24_4_ = fVar23 * auVar128._24_4_;
      auVar58._28_4_ = auVar128._28_4_;
      auVar128 = vsubps_avx(auVar57,auVar58);
      auVar255 = vsubps_avx(auVar366,auVar31);
      auVar59._4_4_ = fVar290 * auVar255._4_4_;
      auVar59._0_4_ = fVar238 * auVar255._0_4_;
      auVar59._8_4_ = fVar265 * auVar255._8_4_;
      auVar59._12_4_ = fVar295 * auVar255._12_4_;
      auVar59._16_4_ = fVar317 * auVar255._16_4_;
      auVar59._20_4_ = fVar396 * auVar255._20_4_;
      uVar9 = auVar255._28_4_;
      auVar59._24_4_ = fVar24 * auVar255._24_4_;
      auVar59._28_4_ = uVar9;
      auVar35 = vsubps_avx(auVar128,auVar59);
      auVar60._4_4_ = (float)local_840._4_4_ * -fVar406;
      auVar60._0_4_ = (float)local_840._0_4_ * -fVar398;
      auVar60._8_4_ = fStack_838 * -fVar409;
      auVar60._12_4_ = fStack_834 * -fVar411;
      auVar60._16_4_ = fStack_830 * -fVar413;
      auVar60._20_4_ = fStack_82c * -fVar415;
      auVar60._24_4_ = fStack_828 * -fVar417;
      auVar60._28_4_ = uVar18 ^ 0x80000000;
      auVar61._4_4_ = (float)local_820._4_4_ * fVar273;
      auVar61._0_4_ = (float)local_820._0_4_ * fVar237;
      auVar61._8_4_ = fStack_818 * fVar262;
      auVar61._12_4_ = fStack_814 * fVar293;
      auVar61._16_4_ = fStack_810 * fVar315;
      auVar61._20_4_ = fStack_80c * fVar299;
      auVar61._24_4_ = fStack_808 * fVar23;
      auVar61._28_4_ = uVar9;
      auVar128 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar290 * (float)local_800._4_4_;
      auVar62._0_4_ = fVar238 * (float)local_800._0_4_;
      auVar62._8_4_ = fVar265 * fStack_7f8;
      auVar62._12_4_ = fVar295 * fStack_7f4;
      auVar62._16_4_ = fVar317 * fStack_7f0;
      auVar62._20_4_ = fVar396 * fStack_7ec;
      auVar62._24_4_ = fVar24 * fStack_7e8;
      auVar62._28_4_ = uVar9;
      auVar255._8_4_ = 0x3f800000;
      auVar255._0_8_ = &DAT_3f8000003f800000;
      auVar255._12_4_ = 0x3f800000;
      auVar255._16_4_ = 0x3f800000;
      auVar255._20_4_ = 0x3f800000;
      auVar255._24_4_ = 0x3f800000;
      auVar255._28_4_ = 0x3f800000;
      auVar36 = vsubps_avx(auVar128,auVar62);
      auVar128 = vrcpps_avx(auVar36);
      fVar237 = auVar128._0_4_;
      fVar238 = auVar128._4_4_;
      auVar63._4_4_ = auVar36._4_4_ * fVar238;
      auVar63._0_4_ = auVar36._0_4_ * fVar237;
      fVar239 = auVar128._8_4_;
      auVar63._8_4_ = auVar36._8_4_ * fVar239;
      fVar241 = auVar128._12_4_;
      auVar63._12_4_ = auVar36._12_4_ * fVar241;
      fVar273 = auVar128._16_4_;
      auVar63._16_4_ = auVar36._16_4_ * fVar273;
      fVar290 = auVar128._20_4_;
      auVar63._20_4_ = auVar36._20_4_ * fVar290;
      fVar292 = auVar128._24_4_;
      auVar63._24_4_ = auVar36._24_4_ * fVar292;
      auVar63._28_4_ = fStack_7e4;
      auVar37 = vsubps_avx(auVar255,auVar63);
      auVar131._8_4_ = 0x7fffffff;
      auVar131._0_8_ = 0x7fffffff7fffffff;
      auVar131._12_4_ = 0x7fffffff;
      auVar131._16_4_ = 0x7fffffff;
      auVar131._20_4_ = 0x7fffffff;
      auVar131._24_4_ = 0x7fffffff;
      auVar131._28_4_ = 0x7fffffff;
      auVar128 = vandps_avx(auVar36,auVar131);
      auVar175 = vcmpps_avx(auVar128,auVar421,1);
      auVar312 = ZEXT3264(auVar175);
      auVar64._4_4_ = (fVar238 + fVar238 * auVar37._4_4_) * -auVar35._4_4_;
      auVar64._0_4_ = (fVar237 + fVar237 * auVar37._0_4_) * -auVar35._0_4_;
      auVar64._8_4_ = (fVar239 + fVar239 * auVar37._8_4_) * -auVar35._8_4_;
      auVar64._12_4_ = (fVar241 + fVar241 * auVar37._12_4_) * -auVar35._12_4_;
      auVar64._16_4_ = (fVar273 + fVar273 * auVar37._16_4_) * -auVar35._16_4_;
      auVar64._20_4_ = (fVar290 + fVar290 * auVar37._20_4_) * -auVar35._20_4_;
      auVar64._24_4_ = (fVar292 + fVar292 * auVar37._24_4_) * -auVar35._24_4_;
      auVar64._28_4_ = auVar35._28_4_ ^ 0x80000000;
      auVar128 = vcmpps_avx(auVar36,auVar366,1);
      auVar128 = vorps_avx(auVar175,auVar128);
      auVar132._8_4_ = 0xff800000;
      auVar132._0_8_ = 0xff800000ff800000;
      auVar132._12_4_ = 0xff800000;
      auVar132._16_4_ = 0xff800000;
      auVar132._20_4_ = 0xff800000;
      auVar132._24_4_ = 0xff800000;
      auVar132._28_4_ = 0xff800000;
      auVar128 = vblendvps_avx(auVar64,auVar132,auVar128);
      _local_9e0 = vmaxps_avx(auVar32,auVar128);
      auVar128 = vcmpps_avx(auVar36,ZEXT1232(auVar79) << 0x20,6);
      auVar128 = vorps_avx(auVar175,auVar128);
      auVar128 = vblendvps_avx(auVar64,auVar384,auVar128);
      auVar127 = vandps_avx(local_3c0,auVar127);
      local_440 = vminps_avx(auVar34,auVar128);
      auVar128 = vcmpps_avx(_local_9e0,local_440,2);
      auVar175 = auVar127 & auVar128;
      if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar175 >> 0x7f,0) == '\0') &&
            (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar175 >> 0xbf,0) == '\0') &&
          (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar175[0x1f]) {
        auVar336 = ZEXT864(0) << 0x20;
      }
      else {
        auVar175 = vminps_avx(local_780,local_620);
        auVar32 = vminps_avx(local_7a0,local_7e0);
        auVar175 = vminps_avx(auVar175,auVar32);
        auVar175 = vsubps_avx(auVar175,auVar404);
        auVar127 = vandps_avx(auVar128,auVar127);
        auVar97._4_4_ = local_500[1];
        auVar97._0_4_ = local_500[0];
        auVar97._8_4_ = local_500[2];
        auVar97._12_4_ = local_500[3];
        auVar97._16_4_ = fStack_4f0;
        auVar97._20_4_ = fStack_4ec;
        auVar97._24_4_ = fStack_4e8;
        auVar97._28_4_ = fStack_4e4;
        auVar128 = vminps_avx(auVar97,auVar255);
        auVar128 = vmaxps_avx(auVar128,ZEXT832(0) << 0x20);
        local_500[0] = fVar107 + fVar156 * (auVar128._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar138 + fVar191 * (auVar128._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar141 + fVar192 * (auVar128._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar144 + fVar194 * (auVar128._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar107 + fVar156 * (auVar128._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar138 + fVar191 * (auVar128._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar141 + fVar192 * (auVar128._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar144 + auVar128._28_4_ + 7.0;
        auVar96._4_4_ = local_520[1];
        auVar96._0_4_ = local_520[0];
        auVar96._8_4_ = local_520[2];
        auVar96._12_4_ = local_520[3];
        auVar96._16_4_ = fStack_510;
        auVar96._20_4_ = fStack_50c;
        auVar96._24_4_ = fStack_508;
        auVar96._28_4_ = fStack_504;
        auVar128 = vminps_avx(auVar96,auVar255);
        auVar128 = vmaxps_avx(auVar128,ZEXT832(0) << 0x20);
        local_520[0] = fVar107 + fVar156 * (auVar128._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar138 + fVar191 * (auVar128._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar141 + fVar192 * (auVar128._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar144 + fVar194 * (auVar128._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar107 + fVar156 * (auVar128._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar138 + fVar191 * (auVar128._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar141 + fVar192 * (auVar128._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar144 + auVar128._28_4_ + 7.0;
        auVar65._4_4_ = auVar175._4_4_ * 0.99999976;
        auVar65._0_4_ = auVar175._0_4_ * 0.99999976;
        auVar65._8_4_ = auVar175._8_4_ * 0.99999976;
        auVar65._12_4_ = auVar175._12_4_ * 0.99999976;
        auVar65._16_4_ = auVar175._16_4_ * 0.99999976;
        auVar65._20_4_ = auVar175._20_4_ * 0.99999976;
        auVar65._24_4_ = auVar175._24_4_ * 0.99999976;
        auVar65._28_4_ = 0x3f7ffffc;
        auVar128 = vmaxps_avx(ZEXT1232(auVar79) << 0x20,auVar65);
        auVar66._4_4_ = auVar128._4_4_ * auVar128._4_4_;
        auVar66._0_4_ = auVar128._0_4_ * auVar128._0_4_;
        auVar66._8_4_ = auVar128._8_4_ * auVar128._8_4_;
        auVar66._12_4_ = auVar128._12_4_ * auVar128._12_4_;
        auVar66._16_4_ = auVar128._16_4_ * auVar128._16_4_;
        auVar66._20_4_ = auVar128._20_4_ * auVar128._20_4_;
        auVar66._24_4_ = auVar128._24_4_ * auVar128._24_4_;
        auVar66._28_4_ = auVar128._28_4_;
        local_ac0 = vsubps_avx(auVar33,auVar66);
        auVar67._4_4_ = local_ac0._4_4_ * fVar193 * 4.0;
        auVar67._0_4_ = local_ac0._0_4_ * fVar272 * 4.0;
        auVar67._8_4_ = local_ac0._8_4_ * fVar195 * 4.0;
        auVar67._12_4_ = local_ac0._12_4_ * fVar196 * 4.0;
        auVar67._16_4_ = local_ac0._16_4_ * fVar197 * 4.0;
        auVar67._20_4_ = local_ac0._20_4_ * fVar198 * 4.0;
        auVar67._24_4_ = local_ac0._24_4_ * fVar368 * 4.0;
        auVar67._28_4_ = auVar128._28_4_;
        auVar175 = vsubps_avx(auVar49,auVar67);
        _local_8e0 = ZEXT1232(ZEXT412(0)) << 0x20;
        local_940 = vcmpps_avx(auVar175,ZEXT832(0) << 0x20,5);
        auVar128 = local_940;
        if ((((((((local_940 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_940 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_940 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_940 >> 0x7f,0) == '\0') &&
              (local_940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_940 >> 0xbf,0) == '\0') &&
            (local_940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_940[0x1f]) {
          _local_640 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar229 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar254 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar177._8_4_ = 0x7f800000;
          auVar177._0_8_ = 0x7f8000007f800000;
          auVar177._12_4_ = 0x7f800000;
          auVar177._16_4_ = 0x7f800000;
          auVar177._20_4_ = 0x7f800000;
          auVar177._24_4_ = 0x7f800000;
          auVar177._28_4_ = 0x7f800000;
          auVar283._8_4_ = 0xff800000;
          auVar283._0_8_ = 0xff800000ff800000;
          auVar283._12_4_ = 0xff800000;
          auVar283._16_4_ = 0xff800000;
          auVar283._20_4_ = 0xff800000;
          auVar283._24_4_ = 0xff800000;
          auVar283._28_4_ = 0xff800000;
          local_ac0 = auVar31;
          local_940 = auVar38;
          _local_8a0 = _local_8e0;
        }
        else {
          auVar404 = vsqrtps_avx(auVar175);
          auVar178._0_4_ = fVar272 + fVar272;
          auVar178._4_4_ = fVar193 + fVar193;
          auVar178._8_4_ = fVar195 + fVar195;
          auVar178._12_4_ = fVar196 + fVar196;
          auVar178._16_4_ = fVar197 + fVar197;
          auVar178._20_4_ = fVar198 + fVar198;
          auVar178._24_4_ = fVar368 + fVar368;
          auVar178._28_4_ = fVar300 + fVar300;
          auVar31 = vrcpps_avx(auVar178);
          fVar300 = auVar31._0_4_;
          fVar237 = auVar31._4_4_;
          auVar68._4_4_ = auVar178._4_4_ * fVar237;
          auVar68._0_4_ = auVar178._0_4_ * fVar300;
          fVar238 = auVar31._8_4_;
          auVar68._8_4_ = auVar178._8_4_ * fVar238;
          fVar239 = auVar31._12_4_;
          auVar68._12_4_ = auVar178._12_4_ * fVar239;
          fVar241 = auVar31._16_4_;
          auVar68._16_4_ = auVar178._16_4_ * fVar241;
          fVar273 = auVar31._20_4_;
          auVar68._20_4_ = auVar178._20_4_ * fVar273;
          fVar290 = auVar31._24_4_;
          auVar68._24_4_ = auVar178._24_4_ * fVar290;
          auVar68._28_4_ = auVar178._28_4_;
          auVar255 = vsubps_avx(auVar255,auVar68);
          fVar300 = fVar300 + fVar300 * auVar255._0_4_;
          fVar237 = fVar237 + fVar237 * auVar255._4_4_;
          fVar238 = fVar238 + fVar238 * auVar255._8_4_;
          fVar239 = fVar239 + fVar239 * auVar255._12_4_;
          fVar241 = fVar241 + fVar241 * auVar255._16_4_;
          fVar273 = fVar273 + fVar273 * auVar255._20_4_;
          fVar290 = fVar290 + fVar290 * auVar255._24_4_;
          fVar295 = auVar31._28_4_ + auVar255._28_4_;
          auVar179._0_8_ = local_5a0._0_8_ ^ 0x8000000080000000;
          auVar179._8_4_ = -local_5a0._8_4_;
          auVar179._12_4_ = -local_5a0._12_4_;
          auVar179._16_4_ = -local_5a0._16_4_;
          auVar179._20_4_ = -local_5a0._20_4_;
          auVar179._24_4_ = -local_5a0._24_4_;
          auVar179._28_4_ = -local_5a0._28_4_;
          auVar255 = vsubps_avx(auVar179,auVar404);
          fVar292 = auVar255._0_4_ * fVar300;
          fVar294 = auVar255._4_4_ * fVar237;
          auVar69._4_4_ = fVar294;
          auVar69._0_4_ = fVar292;
          fVar262 = auVar255._8_4_ * fVar238;
          auVar69._8_4_ = fVar262;
          fVar265 = auVar255._12_4_ * fVar239;
          auVar69._12_4_ = fVar265;
          fVar267 = auVar255._16_4_ * fVar241;
          auVar69._16_4_ = fVar267;
          fVar269 = auVar255._20_4_ * fVar273;
          auVar69._20_4_ = fVar269;
          fVar293 = auVar255._24_4_ * fVar290;
          auVar69._24_4_ = fVar293;
          auVar69._28_4_ = auVar255._28_4_;
          auVar255 = vsubps_avx(auVar404,local_5a0);
          fVar300 = auVar255._0_4_ * fVar300;
          fVar237 = auVar255._4_4_ * fVar237;
          auVar70._4_4_ = fVar237;
          auVar70._0_4_ = fVar300;
          fVar238 = auVar255._8_4_ * fVar238;
          auVar70._8_4_ = fVar238;
          fVar239 = auVar255._12_4_ * fVar239;
          auVar70._12_4_ = fVar239;
          fVar241 = auVar255._16_4_ * fVar241;
          auVar70._16_4_ = fVar241;
          fVar273 = auVar255._20_4_ * fVar273;
          auVar70._20_4_ = fVar273;
          fVar290 = auVar255._24_4_ * fVar290;
          auVar70._24_4_ = fVar290;
          auVar70._28_4_ = 0x3f800000;
          auVar19._4_4_ = fStack_3fc;
          auVar19._0_4_ = local_400;
          auVar19._8_4_ = fStack_3f8;
          auVar19._12_4_ = fStack_3f4;
          auVar19._16_4_ = fStack_3f0;
          auVar19._20_4_ = fStack_3ec;
          auVar19._24_4_ = fStack_3e8;
          auVar19._28_4_ = fStack_3e4;
          fVar296 = local_400 * (fVar292 * fVar348 + fVar369);
          fVar297 = fStack_3fc * (fVar294 * fVar355 + fVar374);
          fVar315 = fStack_3f8 * (fVar262 * fVar356 + fVar375);
          fVar317 = fStack_3f4 * (fVar265 * fVar357 + fVar376);
          fVar319 = fStack_3f0 * (fVar267 * fVar358 + fVar377);
          fVar321 = fStack_3ec * (fVar269 * fVar359 + fVar378);
          fVar299 = fStack_3e8 * (fVar293 * fVar360 + fVar379);
          auVar234._0_4_ = fVar108 + fVar217 * fVar296;
          auVar234._4_4_ = fVar139 + fVar264 * fVar297;
          auVar234._8_4_ = fVar142 + fVar260 * fVar315;
          auVar234._12_4_ = fVar145 + fVar291 * fVar317;
          auVar234._16_4_ = fVar147 + fVar313 * fVar319;
          auVar234._20_4_ = fVar149 + fVar418 * fVar321;
          auVar234._24_4_ = fVar151 + fVar22 * fVar299;
          auVar234._28_4_ = fVar153 + auVar255._28_4_ + fVar380;
          auVar71._4_4_ = (float)local_800._4_4_ * fVar294;
          auVar71._0_4_ = (float)local_800._0_4_ * fVar292;
          auVar71._8_4_ = fStack_7f8 * fVar262;
          auVar71._12_4_ = fStack_7f4 * fVar265;
          auVar71._16_4_ = fStack_7f0 * fVar267;
          auVar71._20_4_ = fStack_7ec * fVar269;
          auVar71._24_4_ = fStack_7e8 * fVar293;
          auVar71._28_4_ = fVar295;
          local_a20 = vsubps_avx(auVar71,auVar234);
          auVar257._0_4_ = fVar109 + fVar110 * fVar296;
          auVar257._4_4_ = fVar140 + fVar259 * fVar297;
          auVar257._8_4_ = fVar143 + fVar240 * fVar315;
          auVar257._12_4_ = fVar146 + fVar271 * fVar317;
          auVar257._16_4_ = fVar148 + fVar298 * fVar319;
          auVar257._20_4_ = fVar150 + fVar323 * fVar321;
          auVar257._24_4_ = fVar152 + fVar20 * fVar299;
          auVar257._28_4_ = fVar154 + fVar295;
          auVar72._4_4_ = (float)local_820._4_4_ * fVar294;
          auVar72._0_4_ = (float)local_820._0_4_ * fVar292;
          auVar72._8_4_ = fStack_818 * fVar262;
          auVar72._12_4_ = fStack_814 * fVar265;
          auVar72._16_4_ = fStack_810 * fVar267;
          auVar72._20_4_ = fStack_80c * fVar269;
          auVar72._24_4_ = fStack_808 * fVar293;
          auVar72._28_4_ = fVar144;
          _local_b00 = vsubps_avx(auVar72,auVar257);
          auVar284._0_4_ = (float)local_640._0_4_ + fVar111 * fVar296;
          auVar284._4_4_ = (float)local_640._4_4_ + fVar261 * fVar297;
          auVar284._8_4_ = fStack_638 + fVar242 * fVar315;
          auVar284._12_4_ = fStack_634 + fVar274 * fVar317;
          auVar284._16_4_ = fStack_630 + fVar301 * fVar319;
          auVar284._20_4_ = fStack_62c + fVar386 * fVar321;
          auVar284._24_4_ = fStack_628 + fVar21 * fVar299;
          auVar284._28_4_ = fStack_624 + 0.0;
          auVar73._4_4_ = (float)local_840._4_4_ * fVar294;
          auVar73._0_4_ = (float)local_840._0_4_ * fVar292;
          auVar73._8_4_ = fStack_838 * fVar262;
          auVar73._12_4_ = fStack_834 * fVar265;
          auVar73._16_4_ = fStack_830 * fVar267;
          auVar73._20_4_ = fStack_82c * fVar269;
          auVar73._24_4_ = fStack_828 * fVar293;
          auVar73._28_4_ = fVar144;
          local_b20 = vsubps_avx(auVar73,auVar284);
          fVar292 = local_400 * (fVar300 * fVar348 + fVar369);
          fVar294 = fStack_3fc * (fVar237 * fVar355 + fVar374);
          fVar262 = fStack_3f8 * (fVar238 * fVar356 + fVar375);
          fVar265 = fStack_3f4 * (fVar239 * fVar357 + fVar376);
          fVar267 = fStack_3f0 * (fVar241 * fVar358 + fVar377);
          fVar269 = fStack_3ec * (fVar273 * fVar359 + fVar378);
          fVar293 = fStack_3e8 * (fVar290 * fVar360 + fVar379);
          auVar310._0_4_ = fVar108 + fVar217 * fVar292;
          auVar310._4_4_ = fVar139 + fVar264 * fVar294;
          auVar310._8_4_ = fVar142 + fVar260 * fVar262;
          auVar310._12_4_ = fVar145 + fVar291 * fVar265;
          auVar310._16_4_ = fVar147 + fVar313 * fVar267;
          auVar310._20_4_ = fVar149 + fVar418 * fVar269;
          auVar310._24_4_ = fVar151 + fVar22 * fVar293;
          auVar310._28_4_ = fVar153 + fVar144;
          auVar74._4_4_ = fVar237 * (float)local_800._4_4_;
          auVar74._0_4_ = fVar300 * (float)local_800._0_4_;
          auVar74._8_4_ = fVar238 * fStack_7f8;
          auVar74._12_4_ = fVar239 * fStack_7f4;
          auVar74._16_4_ = fVar241 * fStack_7f0;
          auVar74._20_4_ = fVar273 * fStack_7ec;
          auVar74._24_4_ = fVar290 * fStack_7e8;
          auVar74._28_4_ = fStack_7e4;
          _local_8e0 = vsubps_avx(auVar74,auVar310);
          auVar311._0_4_ = fVar109 + fVar110 * fVar292;
          auVar311._4_4_ = fVar140 + fVar259 * fVar294;
          auVar311._8_4_ = fVar143 + fVar240 * fVar262;
          auVar311._12_4_ = fVar146 + fVar271 * fVar265;
          auVar311._16_4_ = fVar148 + fVar298 * fVar267;
          auVar311._20_4_ = fVar150 + fVar323 * fVar269;
          auVar311._24_4_ = fVar152 + fVar20 * fVar293;
          auVar311._28_4_ = fVar154 + local_8e0._28_4_;
          auVar75._4_4_ = (float)local_820._4_4_ * fVar237;
          auVar75._0_4_ = (float)local_820._0_4_ * fVar300;
          auVar75._8_4_ = fStack_818 * fVar238;
          auVar75._12_4_ = fStack_814 * fVar239;
          auVar75._16_4_ = fStack_810 * fVar241;
          auVar75._20_4_ = fStack_80c * fVar273;
          auVar75._24_4_ = fStack_808 * fVar290;
          auVar75._28_4_ = fStack_7e4;
          _local_8a0 = vsubps_avx(auVar75,auVar311);
          auVar285._0_4_ = (float)local_640._0_4_ + fVar111 * fVar292;
          auVar285._4_4_ = (float)local_640._4_4_ + fVar261 * fVar294;
          auVar285._8_4_ = fStack_638 + fVar242 * fVar262;
          auVar285._12_4_ = fStack_634 + fVar274 * fVar265;
          auVar285._16_4_ = fStack_630 + fVar301 * fVar267;
          auVar285._20_4_ = fStack_62c + fVar386 * fVar269;
          auVar285._24_4_ = fStack_628 + fVar21 * fVar293;
          auVar285._28_4_ = fStack_624 + local_b20._28_4_ + fVar380;
          auVar76._4_4_ = (float)local_840._4_4_ * fVar237;
          auVar76._0_4_ = (float)local_840._0_4_ * fVar300;
          auVar76._8_4_ = fStack_838 * fVar238;
          auVar76._12_4_ = fStack_834 * fVar239;
          auVar76._16_4_ = fStack_830 * fVar241;
          auVar76._20_4_ = fStack_82c * fVar273;
          auVar76._24_4_ = fStack_828 * fVar290;
          auVar76._28_4_ = local_8a0._28_4_;
          _local_640 = vsubps_avx(auVar76,auVar285);
          auVar175 = vcmpps_avx(auVar175,_DAT_02020f00,5);
          auVar286._8_4_ = 0x7f800000;
          auVar286._0_8_ = 0x7f8000007f800000;
          auVar286._12_4_ = 0x7f800000;
          auVar286._16_4_ = 0x7f800000;
          auVar286._20_4_ = 0x7f800000;
          auVar286._24_4_ = 0x7f800000;
          auVar286._28_4_ = 0x7f800000;
          auVar177 = vblendvps_avx(auVar286,auVar69,auVar175);
          auVar334._8_4_ = 0x7fffffff;
          auVar334._0_8_ = 0x7fffffff7fffffff;
          auVar334._12_4_ = 0x7fffffff;
          auVar334._16_4_ = 0x7fffffff;
          auVar334._20_4_ = 0x7fffffff;
          auVar334._24_4_ = 0x7fffffff;
          auVar334._28_4_ = 0x7fffffff;
          auVar255 = vandps_avx(auVar334,local_420);
          auVar255 = vmaxps_avx(local_4c0,auVar255);
          auVar77._4_4_ = auVar255._4_4_ * 1.9073486e-06;
          auVar77._0_4_ = auVar255._0_4_ * 1.9073486e-06;
          auVar77._8_4_ = auVar255._8_4_ * 1.9073486e-06;
          auVar77._12_4_ = auVar255._12_4_ * 1.9073486e-06;
          auVar77._16_4_ = auVar255._16_4_ * 1.9073486e-06;
          auVar77._20_4_ = auVar255._20_4_ * 1.9073486e-06;
          auVar77._24_4_ = auVar255._24_4_ * 1.9073486e-06;
          auVar77._28_4_ = auVar255._28_4_;
          auVar255 = vandps_avx(auVar334,local_660);
          auVar255 = vcmpps_avx(auVar255,auVar77,1);
          auVar287._8_4_ = 0xff800000;
          auVar287._0_8_ = 0xff800000ff800000;
          auVar287._12_4_ = 0xff800000;
          auVar287._16_4_ = 0xff800000;
          auVar287._20_4_ = 0xff800000;
          auVar287._24_4_ = 0xff800000;
          auVar287._28_4_ = 0xff800000;
          auVar283 = vblendvps_avx(auVar287,auVar70,auVar175);
          auVar31 = auVar175 & auVar255;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0x7f,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0xbf,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar31[0x1f] < '\0') {
            auVar128 = vandps_avx(auVar255,auVar175);
            auVar161 = vpackssdw_avx(auVar128._0_16_,auVar128._16_16_);
            auVar404 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar31 = vcmpps_avx(local_ac0,auVar404,2);
            auVar422._8_4_ = 0xff800000;
            auVar422._0_8_ = 0xff800000ff800000;
            auVar422._12_4_ = 0xff800000;
            auVar422._16_4_ = 0xff800000;
            auVar422._20_4_ = 0xff800000;
            auVar422._24_4_ = 0xff800000;
            auVar422._28_4_ = 0xff800000;
            auVar424._8_4_ = 0x7f800000;
            auVar424._0_8_ = 0x7f8000007f800000;
            auVar424._12_4_ = 0x7f800000;
            auVar424._16_4_ = 0x7f800000;
            auVar424._20_4_ = 0x7f800000;
            auVar424._24_4_ = 0x7f800000;
            auVar424._28_4_ = 0x7f800000;
            auVar255 = vblendvps_avx(auVar424,auVar422,auVar31);
            auVar225 = vpmovsxwd_avx(auVar161);
            auVar161 = vpunpckhwd_avx(auVar161,auVar161);
            auVar335._16_16_ = auVar161;
            auVar335._0_16_ = auVar225;
            auVar177 = vblendvps_avx(auVar177,auVar255,auVar335);
            auVar19 = vblendvps_avx(auVar422,auVar424,auVar31);
            auVar283 = vblendvps_avx(auVar283,auVar19,auVar335);
            auVar255 = vcmpps_avx(auVar404,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar216._0_4_ = auVar128._0_4_ ^ auVar255._0_4_;
            auVar216._4_4_ = auVar128._4_4_ ^ auVar255._4_4_;
            auVar216._8_4_ = auVar128._8_4_ ^ auVar255._8_4_;
            auVar216._12_4_ = auVar128._12_4_ ^ auVar255._12_4_;
            auVar216._16_4_ = auVar128._16_4_ ^ auVar255._16_4_;
            auVar216._20_4_ = auVar128._20_4_ ^ auVar255._20_4_;
            auVar216._24_4_ = auVar128._24_4_ ^ auVar255._24_4_;
            auVar216._28_4_ = auVar128._28_4_ ^ auVar255._28_4_;
            auVar128 = vorps_avx(auVar31,auVar216);
            auVar128 = vandps_avx(auVar175,auVar128);
          }
          auVar385 = ZEXT3264(auVar19);
          auVar229 = local_a20._0_28_;
          auVar254 = local_b00._0_28_;
          auVar363 = local_b20._0_28_;
        }
        _local_4a0 = _local_9e0;
        local_480 = vminps_avx(local_440,auVar177);
        _local_460 = vmaxps_avx(_local_9e0,auVar283);
        auVar255 = vcmpps_avx(_local_9e0,local_480,2);
        local_540 = vandps_avx(auVar127,auVar255);
        local_5e0 = local_540;
        auVar255 = vcmpps_avx(_local_460,local_440,2);
        _local_860 = vandps_avx(auVar127,auVar255);
        auVar312 = ZEXT3264(_local_860);
        local_600 = _local_860;
        auVar127 = vorps_avx(_local_860,local_540);
        if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar127 >> 0x7f,0) == '\0') &&
              (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar127 >> 0xbf,0) == '\0') &&
            (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar127[0x1f]) {
          auVar336 = ZEXT864(0) << 0x20;
        }
        else {
          _local_580 = _local_460;
          local_8c0 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5c0._0_4_ = auVar128._0_4_ ^ local_8c0._0_4_;
          local_5c0._4_4_ = auVar128._4_4_ ^ local_8c0._4_4_;
          local_5c0._8_4_ = auVar128._8_4_ ^ local_8c0._8_4_;
          local_5c0._12_4_ = auVar128._12_4_ ^ local_8c0._12_4_;
          local_5c0._16_4_ = auVar128._16_4_ ^ local_8c0._16_4_;
          local_5c0._20_4_ = auVar128._20_4_ ^ local_8c0._20_4_;
          local_5c0._24_4_ = auVar128._24_4_ ^ local_8c0._24_4_;
          local_5c0._28_4_ = (uint)auVar128._28_4_ ^ (uint)local_8c0._28_4_;
          auVar133._0_4_ =
               auVar229._0_4_ * (float)local_800._0_4_ +
               auVar254._0_4_ * (float)local_820._0_4_ + auVar363._0_4_ * (float)local_840._0_4_;
          auVar133._4_4_ =
               auVar229._4_4_ * (float)local_800._4_4_ +
               auVar254._4_4_ * (float)local_820._4_4_ + auVar363._4_4_ * (float)local_840._4_4_;
          auVar133._8_4_ =
               auVar229._8_4_ * fStack_7f8 +
               auVar254._8_4_ * fStack_818 + auVar363._8_4_ * fStack_838;
          auVar133._12_4_ =
               auVar229._12_4_ * fStack_7f4 +
               auVar254._12_4_ * fStack_814 + auVar363._12_4_ * fStack_834;
          auVar133._16_4_ =
               auVar229._16_4_ * fStack_7f0 +
               auVar254._16_4_ * fStack_810 + auVar363._16_4_ * fStack_830;
          auVar133._20_4_ =
               auVar229._20_4_ * fStack_7ec +
               auVar254._20_4_ * fStack_80c + auVar363._20_4_ * fStack_82c;
          auVar133._24_4_ =
               auVar229._24_4_ * fStack_7e8 +
               auVar254._24_4_ * fStack_808 + auVar363._24_4_ * fStack_828;
          auVar133._28_4_ = local_8c0._28_4_ + local_460._28_4_ + auVar128._28_4_;
          auVar180._8_4_ = 0x7fffffff;
          auVar180._0_8_ = 0x7fffffff7fffffff;
          auVar180._12_4_ = 0x7fffffff;
          auVar180._16_4_ = 0x7fffffff;
          auVar180._20_4_ = 0x7fffffff;
          auVar180._24_4_ = 0x7fffffff;
          auVar180._28_4_ = 0x7fffffff;
          auVar127 = vandps_avx(auVar133,auVar180);
          auVar181._8_4_ = 0x3e99999a;
          auVar181._0_8_ = 0x3e99999a3e99999a;
          auVar181._12_4_ = 0x3e99999a;
          auVar181._16_4_ = 0x3e99999a;
          auVar181._20_4_ = 0x3e99999a;
          auVar181._24_4_ = 0x3e99999a;
          auVar181._28_4_ = 0x3e99999a;
          auVar127 = vcmpps_avx(auVar127,auVar181,1);
          auVar127 = vorps_avx(auVar127,local_5c0);
          auVar182._8_4_ = 3;
          auVar182._0_8_ = 0x300000003;
          auVar182._12_4_ = 3;
          auVar182._16_4_ = 3;
          auVar182._20_4_ = 3;
          auVar182._24_4_ = 3;
          auVar182._28_4_ = 3;
          auVar210._8_4_ = 2;
          auVar210._0_8_ = 0x200000002;
          auVar210._12_4_ = 2;
          auVar210._16_4_ = 2;
          auVar210._20_4_ = 2;
          auVar210._24_4_ = 2;
          auVar210._28_4_ = 2;
          auVar127 = vblendvps_avx(auVar210,auVar182,auVar127);
          local_5a0 = ZEXT432((uint)uVar104);
          auVar225 = vpshufd_avx(ZEXT416((uint)uVar104),0);
          auVar161 = vpcmpgtd_avx(auVar127._16_16_,auVar225);
          local_660._0_16_ = auVar225;
          auVar225 = vpcmpgtd_avx(auVar127._0_16_,auVar225);
          auVar183._16_16_ = auVar161;
          auVar183._0_16_ = auVar225;
          local_560 = vblendps_avx(ZEXT1632(auVar225),auVar183,0xf0);
          local_5e0 = vandnps_avx(local_560,local_540);
          auVar127 = local_540 & ~local_560;
          auVar236 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar336 = ZEXT464(0) << 0x20;
          local_620._0_8_ = uVar104;
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0x7f,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0xbf,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar127[0x1f] < '\0') {
            local_880._4_4_ = (float)local_9e0._4_4_ + (float)local_7c0._4_4_;
            local_880._0_4_ = (float)local_9e0._0_4_ + (float)local_7c0._0_4_;
            fStack_878 = fStack_9d8 + fStack_7b8;
            fStack_874 = fStack_9d4 + fStack_7b4;
            fStack_870 = fStack_9d0 + fStack_7b0;
            fStack_86c = fStack_9cc + fStack_7ac;
            fStack_868 = fStack_9c8 + fStack_7a8;
            fStack_864 = fStack_9c4 + fStack_7a4;
            do {
              auVar246 = auVar236._0_16_;
              auVar184._8_4_ = 0x7f800000;
              auVar184._0_8_ = 0x7f8000007f800000;
              auVar184._12_4_ = 0x7f800000;
              auVar184._16_4_ = 0x7f800000;
              auVar184._20_4_ = 0x7f800000;
              auVar184._24_4_ = 0x7f800000;
              auVar184._28_4_ = 0x7f800000;
              auVar127 = vblendvps_avx(auVar184,_local_9e0,local_5e0);
              auVar128 = vshufps_avx(auVar127,auVar127,0xb1);
              auVar128 = vminps_avx(auVar127,auVar128);
              auVar255 = vshufpd_avx(auVar128,auVar128,5);
              auVar128 = vminps_avx(auVar128,auVar255);
              auVar255 = vperm2f128_avx(auVar128,auVar128,1);
              auVar128 = vminps_avx(auVar128,auVar255);
              auVar128 = vcmpps_avx(auVar127,auVar128,0);
              auVar255 = local_5e0 & auVar128;
              auVar127 = local_5e0;
              if ((((((((auVar255 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar255 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar255 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar255 >> 0x7f,0) != '\0') ||
                    (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar255 >> 0xbf,0) != '\0') ||
                  (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar255[0x1f] < '\0') {
                auVar127 = vandps_avx(auVar128,local_5e0);
              }
              uVar103 = vmovmskps_avx(auVar127);
              uVar18 = 0;
              if (uVar103 != 0) {
                for (; (uVar103 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar104 = (ulong)uVar18;
              *(undefined4 *)(local_5e0 + uVar104 * 4) = 0;
              fVar300 = local_500[uVar104];
              uVar18 = *(uint *)(local_4a0 + uVar104 * 4);
              fVar110 = local_b24;
              if ((float)local_960._0_4_ < 0.0) {
                fVar110 = sqrtf((float)local_960._0_4_);
                auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar246._8_4_ = 0x7fffffff;
                auVar246._0_8_ = 0x7fffffff7fffffff;
                auVar246._12_4_ = 0x7fffffff;
              }
              auVar367 = ZEXT464(uVar18);
              auVar225 = vminps_avx(_local_a60,_local_a80);
              auVar161 = vmaxps_avx(_local_a60,_local_a80);
              auVar118 = vminps_avx(_local_a70,_local_a90);
              auVar203 = vminps_avx(auVar225,auVar118);
              auVar225 = vmaxps_avx(_local_a70,_local_a90);
              auVar118 = vmaxps_avx(auVar161,auVar225);
              auVar161 = vandps_avx(auVar203,auVar246);
              auVar225 = vandps_avx(auVar118,auVar246);
              auVar161 = vmaxps_avx(auVar161,auVar225);
              auVar225 = vmovshdup_avx(auVar161);
              auVar225 = vmaxss_avx(auVar225,auVar161);
              auVar161 = vshufpd_avx(auVar161,auVar161,1);
              auVar161 = vmaxss_avx(auVar161,auVar225);
              local_a20._0_4_ = auVar161._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar110 * 1.9073486e-06;
              local_7e0._0_16_ = vshufps_avx(auVar118,auVar118,0xff);
              lVar102 = 4;
              do {
                local_b20._0_4_ = 1.0 - fVar300;
                auVar161 = vshufps_avx(ZEXT416((uint)fVar300),ZEXT416((uint)fVar300),0);
                fVar110 = auVar161._0_4_;
                fVar111 = auVar161._4_4_;
                fVar217 = auVar161._8_4_;
                fVar237 = auVar161._12_4_;
                auVar161 = vshufps_avx(ZEXT416((uint)local_b20._0_4_),ZEXT416((uint)local_b20._0_4_)
                                       ,0);
                fVar238 = auVar161._0_4_;
                fVar239 = auVar161._4_4_;
                fVar241 = auVar161._8_4_;
                fVar259 = auVar161._12_4_;
                fVar261 = (float)local_a70._0_4_ * fVar110 + (float)local_a80._0_4_ * fVar238;
                fVar264 = (float)local_a70._4_4_ * fVar111 + (float)local_a80._4_4_ * fVar239;
                fVar273 = fStack_a68 * fVar217 + fStack_a78 * fVar241;
                fVar290 = fStack_a64 * fVar237 + fStack_a74 * fVar259;
                auVar276._0_4_ =
                     fVar238 * ((float)local_a80._0_4_ * fVar110 + fVar238 * (float)local_a60._0_4_)
                     + fVar110 * fVar261;
                auVar276._4_4_ =
                     fVar239 * ((float)local_a80._4_4_ * fVar111 + fVar239 * (float)local_a60._4_4_)
                     + fVar111 * fVar264;
                auVar276._8_4_ =
                     fVar241 * (fStack_a78 * fVar217 + fVar241 * fStack_a58) + fVar217 * fVar273;
                auVar276._12_4_ =
                     fVar259 * (fStack_a74 * fVar237 + fVar259 * fStack_a54) + fVar237 * fVar290;
                auVar221._0_4_ =
                     fVar238 * fVar261 +
                     fVar110 * (fVar110 * (float)local_a90._0_4_ + (float)local_a70._0_4_ * fVar238)
                ;
                auVar221._4_4_ =
                     fVar239 * fVar264 +
                     fVar111 * (fVar111 * (float)local_a90._4_4_ + (float)local_a70._4_4_ * fVar239)
                ;
                auVar221._8_4_ =
                     fVar241 * fVar273 + fVar217 * (fVar217 * fStack_a88 + fStack_a68 * fVar241);
                auVar221._12_4_ =
                     fVar259 * fVar290 + fVar237 * (fVar237 * fStack_a84 + fStack_a64 * fVar259);
                auVar161 = vshufps_avx(auVar367._0_16_,auVar367._0_16_,0);
                auVar162._0_4_ = auVar161._0_4_ * (float)local_950._0_4_ + 0.0;
                auVar162._4_4_ = auVar161._4_4_ * (float)local_950._4_4_ + 0.0;
                auVar162._8_4_ = auVar161._8_4_ * fStack_948 + 0.0;
                auVar162._12_4_ = auVar161._12_4_ * fStack_944 + 0.0;
                auVar117._0_4_ = fVar238 * auVar276._0_4_ + fVar110 * auVar221._0_4_;
                auVar117._4_4_ = fVar239 * auVar276._4_4_ + fVar111 * auVar221._4_4_;
                auVar117._8_4_ = fVar241 * auVar276._8_4_ + fVar217 * auVar221._8_4_;
                auVar117._12_4_ = fVar259 * auVar276._12_4_ + fVar237 * auVar221._12_4_;
                local_940._0_16_ = auVar117;
                auVar161 = vsubps_avx(auVar162,auVar117);
                _local_b00 = auVar161;
                auVar161 = vdpps_avx(auVar161,auVar161,0x7f);
                fVar110 = auVar161._0_4_;
                local_be0 = auVar367._0_4_;
                if (fVar110 < 0.0) {
                  local_b20._0_16_ = ZEXT416((uint)local_b20._0_4_);
                  local_ac0._0_16_ = auVar276;
                  local_ae0._0_16_ = auVar221;
                  fVar111 = sqrtf(fVar110);
                  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar221 = local_ae0._0_16_;
                  auVar276 = local_ac0._0_16_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar161,auVar161);
                  fVar111 = auVar225._0_4_;
                }
                auVar225 = vsubps_avx(auVar221,auVar276);
                auVar305._0_4_ = auVar225._0_4_ * 3.0;
                auVar305._4_4_ = auVar225._4_4_ * 3.0;
                auVar305._8_4_ = auVar225._8_4_ * 3.0;
                auVar305._12_4_ = auVar225._12_4_ * 3.0;
                auVar225 = vshufps_avx(ZEXT416((uint)(fVar300 * 6.0)),ZEXT416((uint)(fVar300 * 6.0))
                                       ,0);
                auVar118 = ZEXT416((uint)(((float)local_b20._0_4_ - (fVar300 + fVar300)) * 6.0));
                auVar203 = vshufps_avx(auVar118,auVar118,0);
                auVar118 = ZEXT416((uint)((fVar300 -
                                          ((float)local_b20._0_4_ + (float)local_b20._0_4_)) * 6.0))
                ;
                auVar222 = vshufps_avx(auVar118,auVar118,0);
                auVar25 = vshufps_avx(ZEXT416((uint)((float)local_b20._0_4_ * 6.0)),
                                      ZEXT416((uint)((float)local_b20._0_4_ * 6.0)),0);
                auVar118 = vdpps_avx(auVar305,auVar305,0x7f);
                auVar163._0_4_ =
                     auVar25._0_4_ * (float)local_a60._0_4_ +
                     auVar222._0_4_ * (float)local_a80._0_4_ +
                     auVar225._0_4_ * (float)local_a90._0_4_ +
                     auVar203._0_4_ * (float)local_a70._0_4_;
                auVar163._4_4_ =
                     auVar25._4_4_ * (float)local_a60._4_4_ +
                     auVar222._4_4_ * (float)local_a80._4_4_ +
                     auVar225._4_4_ * (float)local_a90._4_4_ +
                     auVar203._4_4_ * (float)local_a70._4_4_;
                auVar163._8_4_ =
                     auVar25._8_4_ * fStack_a58 +
                     auVar222._8_4_ * fStack_a78 +
                     auVar225._8_4_ * fStack_a88 + auVar203._8_4_ * fStack_a68;
                auVar163._12_4_ =
                     auVar25._12_4_ * fStack_a54 +
                     auVar222._12_4_ * fStack_a74 +
                     auVar225._12_4_ * fStack_a84 + auVar203._12_4_ * fStack_a64;
                auVar225 = vblendps_avx(auVar118,_DAT_01feba10,0xe);
                auVar203 = vrsqrtss_avx(auVar225,auVar225);
                fVar237 = auVar203._0_4_;
                fVar217 = auVar118._0_4_;
                auVar203 = vdpps_avx(auVar305,auVar163,0x7f);
                auVar222 = vshufps_avx(auVar118,auVar118,0);
                auVar164._0_4_ = auVar163._0_4_ * auVar222._0_4_;
                auVar164._4_4_ = auVar163._4_4_ * auVar222._4_4_;
                auVar164._8_4_ = auVar163._8_4_ * auVar222._8_4_;
                auVar164._12_4_ = auVar163._12_4_ * auVar222._12_4_;
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                auVar247._0_4_ = auVar305._0_4_ * auVar203._0_4_;
                auVar247._4_4_ = auVar305._4_4_ * auVar203._4_4_;
                auVar247._8_4_ = auVar305._8_4_ * auVar203._8_4_;
                auVar247._12_4_ = auVar305._12_4_ * auVar203._12_4_;
                auVar25 = vsubps_avx(auVar164,auVar247);
                auVar203 = vrcpss_avx(auVar225,auVar225);
                auVar225 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(local_be0 * (float)local_740._0_4_)));
                auVar203 = ZEXT416((uint)(auVar203._0_4_ * (2.0 - fVar217 * auVar203._0_4_)));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                uVar104 = CONCAT44(auVar305._4_4_,auVar305._0_4_);
                auVar277._0_8_ = uVar104 ^ 0x8000000080000000;
                auVar277._8_4_ = -auVar305._8_4_;
                auVar277._12_4_ = -auVar305._12_4_;
                auVar222 = ZEXT416((uint)(fVar237 * 1.5 +
                                         fVar217 * -0.5 * fVar237 * fVar237 * fVar237));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar223._0_4_ = auVar222._0_4_ * auVar25._0_4_ * auVar203._0_4_;
                auVar223._4_4_ = auVar222._4_4_ * auVar25._4_4_ * auVar203._4_4_;
                auVar223._8_4_ = auVar222._8_4_ * auVar25._8_4_ * auVar203._8_4_;
                auVar223._12_4_ = auVar222._12_4_ * auVar25._12_4_ * auVar203._12_4_;
                auVar352._0_4_ = auVar305._0_4_ * auVar222._0_4_;
                auVar352._4_4_ = auVar305._4_4_ * auVar222._4_4_;
                auVar352._8_4_ = auVar305._8_4_ * auVar222._8_4_;
                auVar352._12_4_ = auVar305._12_4_ * auVar222._12_4_;
                local_b20._0_16_ = auVar305;
                local_ac0._0_4_ = auVar225._0_4_;
                if (fVar217 < 0.0) {
                  local_ae0._0_4_ = fVar111;
                  local_980._0_16_ = auVar277;
                  local_9a0._0_16_ = auVar352;
                  local_9c0._0_16_ = auVar223;
                  fVar237 = sqrtf(fVar217);
                  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar223 = local_9c0._0_16_;
                  auVar277 = local_980._0_16_;
                  auVar352 = local_9a0._0_16_;
                  fVar217 = (float)local_ac0._0_4_;
                  fVar111 = (float)local_ae0._0_4_;
                }
                else {
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  fVar237 = auVar118._0_4_;
                  fVar217 = auVar225._0_4_;
                }
                auVar225 = vdpps_avx(_local_b00,auVar352,0x7f);
                fVar111 = ((float)local_a20._0_4_ / fVar237) * (fVar111 + 1.0) +
                          fVar217 + fVar111 * (float)local_a20._0_4_;
                auVar118 = vdpps_avx(auVar277,auVar352,0x7f);
                auVar203 = vdpps_avx(_local_b00,auVar223,0x7f);
                auVar222 = vdpps_avx(_local_950,auVar352,0x7f);
                auVar25 = vdpps_avx(_local_b00,auVar277,0x7f);
                fVar237 = auVar118._0_4_ + auVar203._0_4_;
                fVar238 = auVar225._0_4_;
                auVar119._0_4_ = fVar238 * fVar238;
                auVar119._4_4_ = auVar225._4_4_ * auVar225._4_4_;
                auVar119._8_4_ = auVar225._8_4_ * auVar225._8_4_;
                auVar119._12_4_ = auVar225._12_4_ * auVar225._12_4_;
                auVar203 = vsubps_avx(auVar161,auVar119);
                auVar118 = vdpps_avx(_local_b00,_local_950,0x7f);
                fVar239 = auVar25._0_4_ - fVar238 * fVar237;
                fVar241 = auVar118._0_4_ - fVar238 * auVar222._0_4_;
                auVar118 = vrsqrtss_avx(auVar203,auVar203);
                fVar259 = auVar203._0_4_;
                fVar238 = auVar118._0_4_;
                fVar238 = fVar238 * 1.5 + fVar259 * -0.5 * fVar238 * fVar238 * fVar238;
                if (fVar259 < 0.0) {
                  local_ae0._0_16_ = auVar225;
                  local_980._0_4_ = fVar111;
                  local_9a0._0_16_ = ZEXT416((uint)fVar237);
                  local_9c0._0_16_ = auVar222;
                  local_760._0_4_ = fVar239;
                  local_780._0_4_ = fVar241;
                  local_7a0._0_4_ = fVar238;
                  fVar259 = sqrtf(fVar259);
                  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar111 = (float)local_980._0_4_;
                  fVar238 = (float)local_7a0._0_4_;
                  fVar239 = (float)local_760._0_4_;
                  fVar241 = (float)local_780._0_4_;
                  auVar222 = local_9c0._0_16_;
                  auVar225 = local_ae0._0_16_;
                  auVar118 = local_9a0._0_16_;
                  fVar217 = (float)local_ac0._0_4_;
                }
                else {
                  auVar118 = vsqrtss_avx(auVar203,auVar203);
                  fVar259 = auVar118._0_4_;
                  auVar118 = ZEXT416((uint)fVar237);
                }
                auVar385 = ZEXT1664(local_b20._0_16_);
                auVar165 = vpermilps_avx(local_940._0_16_,0xff);
                auVar26 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xff);
                fVar239 = fVar239 * fVar238 - auVar26._0_4_;
                auVar248._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
                auVar248._8_4_ = auVar222._8_4_ ^ 0x80000000;
                auVar248._12_4_ = auVar222._12_4_ ^ 0x80000000;
                auVar278._0_4_ = -fVar239;
                auVar278._4_4_ = 0x80000000;
                auVar278._8_4_ = 0x80000000;
                auVar278._12_4_ = 0x80000000;
                fVar237 = auVar118._0_4_ * fVar241 * fVar238;
                auVar312 = ZEXT464((uint)fVar237);
                auVar203 = vinsertps_avx(ZEXT416((uint)(fVar241 * fVar238)),auVar248,0x10);
                auVar25 = vmovsldup_avx(ZEXT416((uint)(fVar237 - auVar222._0_4_ * fVar239)));
                auVar203 = vdivps_avx(auVar203,auVar25);
                auVar165 = ZEXT416((uint)(fVar259 - auVar165._0_4_));
                auVar222 = vinsertps_avx(auVar225,auVar165,0x10);
                auVar224._0_4_ = auVar222._0_4_ * auVar203._0_4_;
                auVar224._4_4_ = auVar222._4_4_ * auVar203._4_4_;
                auVar224._8_4_ = auVar222._8_4_ * auVar203._8_4_;
                auVar224._12_4_ = auVar222._12_4_ * auVar203._12_4_;
                auVar118 = vinsertps_avx(auVar278,auVar118,0x1c);
                auVar118 = vdivps_avx(auVar118,auVar25);
                auVar204._0_4_ = auVar222._0_4_ * auVar118._0_4_;
                auVar204._4_4_ = auVar222._4_4_ * auVar118._4_4_;
                auVar204._8_4_ = auVar222._8_4_ * auVar118._8_4_;
                auVar204._12_4_ = auVar222._12_4_ * auVar118._12_4_;
                auVar118 = vhaddps_avx(auVar224,auVar224);
                auVar203 = vhaddps_avx(auVar204,auVar204);
                fVar300 = fVar300 - auVar118._0_4_;
                local_be0 = local_be0 - auVar203._0_4_;
                auVar367 = ZEXT464((uint)local_be0);
                auVar249._8_4_ = 0x7fffffff;
                auVar249._0_8_ = 0x7fffffff7fffffff;
                auVar249._12_4_ = 0x7fffffff;
                auVar236 = ZEXT1664(auVar249);
                auVar225 = vandps_avx(auVar225,auVar249);
                if (fVar111 <= auVar225._0_4_) {
LAB_0103e1b0:
                  bVar78 = false;
                }
                else {
                  auVar225 = vandps_avx(auVar165,auVar249);
                  if ((float)local_7e0._0_4_ * 1.9073486e-06 + fVar217 + fVar111 <= auVar225._0_4_)
                  goto LAB_0103e1b0;
                  local_be0 = local_be0 + (float)local_900._0_4_;
                  auVar367 = ZEXT464((uint)local_be0);
                  bVar78 = true;
                  if ((((fVar155 <= local_be0) &&
                       (fVar111 = *(float *)(ray + k * 4 + 0x80), local_be0 <= fVar111)) &&
                      (0.0 <= fVar300)) && (fVar300 <= 1.0)) {
                    auVar161 = vrsqrtss_avx(auVar161,auVar161);
                    fVar217 = auVar161._0_4_;
                    auVar101 = (undefined1  [8])(context->scene->geometries).items[uVar98].ptr;
                    if ((((Geometry *)auVar101)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar161 = ZEXT416((uint)(fVar217 * 1.5 +
                                               fVar110 * -0.5 * fVar217 * fVar217 * fVar217));
                      auVar161 = vshufps_avx(auVar161,auVar161,0);
                      auVar166._0_4_ = auVar161._0_4_ * (float)local_b00._0_4_;
                      auVar166._4_4_ = auVar161._4_4_ * (float)local_b00._4_4_;
                      auVar166._8_4_ = auVar161._8_4_ * fStack_af8;
                      auVar166._12_4_ = auVar161._12_4_ * fStack_af4;
                      auVar120._0_4_ = local_b20._0_4_ + auVar26._0_4_ * auVar166._0_4_;
                      auVar120._4_4_ = local_b20._4_4_ + auVar26._4_4_ * auVar166._4_4_;
                      auVar120._8_4_ = local_b20._8_4_ + auVar26._8_4_ * auVar166._8_4_;
                      auVar120._12_4_ = local_b20._12_4_ + auVar26._12_4_ * auVar166._12_4_;
                      auVar161 = vshufps_avx(auVar166,auVar166,0xc9);
                      auVar225 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xc9);
                      auVar167._0_4_ = auVar225._0_4_ * auVar166._0_4_;
                      auVar167._4_4_ = auVar225._4_4_ * auVar166._4_4_;
                      auVar167._8_4_ = auVar225._8_4_ * auVar166._8_4_;
                      auVar167._12_4_ = auVar225._12_4_ * auVar166._12_4_;
                      auVar205._0_4_ = local_b20._0_4_ * auVar161._0_4_;
                      auVar205._4_4_ = local_b20._4_4_ * auVar161._4_4_;
                      auVar205._8_4_ = local_b20._8_4_ * auVar161._8_4_;
                      auVar205._12_4_ = local_b20._12_4_ * auVar161._12_4_;
                      auVar118 = vsubps_avx(auVar205,auVar167);
                      auVar161 = vshufps_avx(auVar118,auVar118,0xc9);
                      auVar225 = vshufps_avx(auVar120,auVar120,0xc9);
                      auVar206._0_4_ = auVar225._0_4_ * auVar161._0_4_;
                      auVar206._4_4_ = auVar225._4_4_ * auVar161._4_4_;
                      auVar206._8_4_ = auVar225._8_4_ * auVar161._8_4_;
                      auVar206._12_4_ = auVar225._12_4_ * auVar161._12_4_;
                      auVar161 = vshufps_avx(auVar118,auVar118,0xd2);
                      auVar121._0_4_ = auVar120._0_4_ * auVar161._0_4_;
                      auVar121._4_4_ = auVar120._4_4_ * auVar161._4_4_;
                      auVar121._8_4_ = auVar120._8_4_ * auVar161._8_4_;
                      auVar121._12_4_ = auVar120._12_4_ * auVar161._12_4_;
                      auVar161 = vsubps_avx(auVar206,auVar121);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar101)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        uVar9 = vextractps_avx(auVar161,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar9;
                        uVar9 = vextractps_avx(auVar161,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                        *(int *)(ray + k * 4 + 0xe0) = auVar161._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar300;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9e8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar98;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar225 = vshufps_avx(ZEXT416((uint)fVar300),ZEXT416((uint)fVar300),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar161,auVar161,0x55);
                        auVar118 = vshufps_avx(auVar161,auVar161,0xaa);
                        local_6e0 = vshufps_avx(auVar161,auVar161,0);
                        auStack_6f0 = auVar118;
                        local_6d0 = auVar225;
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar18 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar18,uVar18);
                        _uStack_688 = CONCAT44(uVar18,uVar18);
                        uVar18 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar18,uVar18);
                        _uStack_678 = CONCAT44(uVar18,uVar18);
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        local_b40 = *local_9f0;
                        uStack_b38 = local_9f0[1];
                        local_a50.valid = (int *)&local_b40;
                        local_a50.geometryUserPtr = ((Geometry *)auVar101)->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_700;
                        local_a50.N = 4;
                        local_a50.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar101)->intersectionFilterN != (RTCFilterFunctionN)0x0)
                        {
                          local_b00 = auVar101;
                          auVar312 = ZEXT464((uint)fVar237);
                          auVar385 = ZEXT1664(local_b20._0_16_);
                          (*((Geometry *)auVar101)->intersectionFilterN)(&local_a50);
                          auVar336._8_56_ = extraout_var;
                          auVar336._0_8_ = extraout_XMM1_Qa;
                          auVar225 = auVar336._0_16_;
                          auVar101 = local_b00;
                        }
                        auVar90._8_8_ = uStack_b38;
                        auVar90._0_8_ = local_b40;
                        if (auVar90 == (undefined1  [16])0x0) {
                          auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar225 = vpcmpeqd_avx(auVar225,auVar225);
                          auVar161 = auVar161 ^ auVar225;
                          auVar236 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar336 = ZEXT864(0);
                        }
                        else {
                          p_Var17 = context->args->filter;
                          auVar236 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar336 = ZEXT1664(ZEXT816(0));
                          auVar225 = vpcmpeqd_avx(auVar118,auVar118);
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar101)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar312 = ZEXT1664(auVar312._0_16_);
                            auVar385 = ZEXT1664(auVar385._0_16_);
                            (*p_Var17)(&local_a50);
                            auVar225 = vpcmpeqd_avx(auVar225,auVar225);
                            auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar236 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar91._8_8_ = uStack_b38;
                          auVar91._0_8_ = local_b40;
                          auVar118 = vpcmpeqd_avx(auVar91,_DAT_01feba10);
                          auVar161 = auVar118 ^ auVar225;
                          if (auVar91 != (undefined1  [16])0x0) {
                            auVar118 = auVar118 ^ auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])local_a50.hit);
                            *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x10));
                            *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x20));
                            *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x30));
                            *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x40));
                            *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x50));
                            *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x60));
                            *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x70));
                            *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x80));
                            *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar225;
                          }
                        }
                        auVar367 = ZEXT464((uint)local_be0);
                        auVar168._8_8_ = 0x100000001;
                        auVar168._0_8_ = 0x100000001;
                        if ((auVar168 & auVar161) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar111;
                        }
                      }
                    }
                  }
                }
                auVar127 = local_5e0;
                bVar106 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar78) && (bVar106));
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar134._4_4_ = uVar9;
              auVar134._0_4_ = uVar9;
              auVar134._8_4_ = uVar9;
              auVar134._12_4_ = uVar9;
              auVar134._16_4_ = uVar9;
              auVar134._20_4_ = uVar9;
              auVar134._24_4_ = uVar9;
              auVar134._28_4_ = uVar9;
              auVar128 = vcmpps_avx(_local_880,auVar134,2);
              local_5e0 = vandps_avx(auVar128,local_5e0);
              auVar127 = auVar127 & auVar128;
              uVar104 = local_620._0_8_;
            } while ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar127 >> 0x7f,0) != '\0') ||
                       (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar127 >> 0xbf,0) != '\0') ||
                     (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar127[0x1f] < '\0');
          }
          auVar135._0_4_ =
               (float)local_8e0._0_4_ * (float)local_800._0_4_ +
               (float)local_8a0._0_4_ * (float)local_820._0_4_ +
               (float)local_640._0_4_ * (float)local_840._0_4_;
          auVar135._4_4_ =
               (float)local_8e0._4_4_ * (float)local_800._4_4_ +
               (float)local_8a0._4_4_ * (float)local_820._4_4_ +
               (float)local_640._4_4_ * (float)local_840._4_4_;
          auVar135._8_4_ =
               fStack_8d8 * fStack_7f8 + fStack_898 * fStack_818 + fStack_638 * fStack_838;
          auVar135._12_4_ =
               fStack_8d4 * fStack_7f4 + fStack_894 * fStack_814 + fStack_634 * fStack_834;
          auVar135._16_4_ =
               fStack_8d0 * fStack_7f0 + fStack_890 * fStack_810 + fStack_630 * fStack_830;
          auVar135._20_4_ =
               fStack_8cc * fStack_7ec + fStack_88c * fStack_80c + fStack_62c * fStack_82c;
          auVar135._24_4_ =
               fStack_8c8 * fStack_7e8 + fStack_888 * fStack_808 + fStack_628 * fStack_828;
          auVar135._28_4_ = fStack_8c4 + fStack_884 + fStack_624;
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar185._16_4_ = 0x7fffffff;
          auVar185._20_4_ = 0x7fffffff;
          auVar185._24_4_ = 0x7fffffff;
          auVar185._28_4_ = 0x7fffffff;
          auVar127 = vandps_avx(auVar135,auVar185);
          auVar186._8_4_ = 0x3e99999a;
          auVar186._0_8_ = 0x3e99999a3e99999a;
          auVar186._12_4_ = 0x3e99999a;
          auVar186._16_4_ = 0x3e99999a;
          auVar186._20_4_ = 0x3e99999a;
          auVar186._24_4_ = 0x3e99999a;
          auVar186._28_4_ = 0x3e99999a;
          auVar127 = vcmpps_avx(auVar127,auVar186,1);
          auVar128 = vorps_avx(auVar127,local_5c0);
          auVar187._0_4_ = (float)local_580._0_4_ + (float)local_7c0._0_4_;
          auVar187._4_4_ = (float)local_580._4_4_ + (float)local_7c0._4_4_;
          auVar187._8_4_ = fStack_578 + fStack_7b8;
          auVar187._12_4_ = fStack_574 + fStack_7b4;
          auVar187._16_4_ = fStack_570 + fStack_7b0;
          auVar187._20_4_ = fStack_56c + fStack_7ac;
          auVar187._24_4_ = fStack_568 + fStack_7a8;
          auVar187._28_4_ = fStack_564 + fStack_7a4;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar211._4_4_ = uVar9;
          auVar211._0_4_ = uVar9;
          auVar211._8_4_ = uVar9;
          auVar211._12_4_ = uVar9;
          auVar211._16_4_ = uVar9;
          auVar211._20_4_ = uVar9;
          auVar211._24_4_ = uVar9;
          auVar211._28_4_ = uVar9;
          auVar127 = vcmpps_avx(auVar187,auVar211,2);
          _local_880 = vandps_avx(auVar127,_local_860);
          auVar188._8_4_ = 3;
          auVar188._0_8_ = 0x300000003;
          auVar188._12_4_ = 3;
          auVar188._16_4_ = 3;
          auVar188._20_4_ = 3;
          auVar188._24_4_ = 3;
          auVar188._28_4_ = 3;
          auVar212._8_4_ = 2;
          auVar212._0_8_ = 0x200000002;
          auVar212._12_4_ = 2;
          auVar212._16_4_ = 2;
          auVar212._20_4_ = 2;
          auVar212._24_4_ = 2;
          auVar212._28_4_ = 2;
          auVar127 = vblendvps_avx(auVar212,auVar188,auVar128);
          auVar161 = vpcmpgtd_avx(auVar127._16_16_,local_660._0_16_);
          auVar225 = vpshufd_avx(local_5a0._0_16_,0);
          auVar225 = vpcmpgtd_avx(auVar127._0_16_,auVar225);
          auVar189._16_16_ = auVar161;
          auVar189._0_16_ = auVar225;
          _local_8e0 = vblendps_avx(ZEXT1632(auVar225),auVar189,0xf0);
          local_600 = vandnps_avx(_local_8e0,_local_880);
          auVar127 = _local_880 & ~_local_8e0;
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0x7f,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0xbf,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar127[0x1f] < '\0') {
            _local_9e0 = _local_460;
            local_860._4_4_ = (float)local_460._4_4_ + (float)local_7c0._4_4_;
            local_860._0_4_ = (float)local_460._0_4_ + (float)local_7c0._0_4_;
            fStack_858 = fStack_458 + fStack_7b8;
            fStack_854 = fStack_454 + fStack_7b4;
            fStack_850 = fStack_450 + fStack_7b0;
            fStack_84c = fStack_44c + fStack_7ac;
            fStack_848 = fStack_448 + fStack_7a8;
            fStack_844 = fStack_444 + fStack_7a4;
            do {
              auVar250 = auVar236._0_16_;
              auVar190._8_4_ = 0x7f800000;
              auVar190._0_8_ = 0x7f8000007f800000;
              auVar190._12_4_ = 0x7f800000;
              auVar190._16_4_ = 0x7f800000;
              auVar190._20_4_ = 0x7f800000;
              auVar190._24_4_ = 0x7f800000;
              auVar190._28_4_ = 0x7f800000;
              auVar127 = vblendvps_avx(auVar190,_local_9e0,local_600);
              auVar128 = vshufps_avx(auVar127,auVar127,0xb1);
              auVar128 = vminps_avx(auVar127,auVar128);
              auVar255 = vshufpd_avx(auVar128,auVar128,5);
              auVar128 = vminps_avx(auVar128,auVar255);
              auVar255 = vperm2f128_avx(auVar128,auVar128,1);
              auVar128 = vminps_avx(auVar128,auVar255);
              auVar128 = vcmpps_avx(auVar127,auVar128,0);
              auVar255 = local_600 & auVar128;
              auVar127 = local_600;
              if ((((((((auVar255 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar255 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar255 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar255 >> 0x7f,0) != '\0') ||
                    (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar255 >> 0xbf,0) != '\0') ||
                  (auVar255 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar255[0x1f] < '\0') {
                auVar127 = vandps_avx(auVar128,local_600);
              }
              uVar103 = vmovmskps_avx(auVar127);
              uVar18 = 0;
              if (uVar103 != 0) {
                for (; (uVar103 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar104 = (ulong)uVar18;
              *(undefined4 *)(local_600 + uVar104 * 4) = 0;
              fVar300 = local_520[uVar104];
              uVar18 = *(uint *)(local_440 + uVar104 * 4);
              fVar110 = local_b28;
              if ((float)local_960._0_4_ < 0.0) {
                fVar110 = sqrtf((float)local_960._0_4_);
                auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar250._8_4_ = 0x7fffffff;
                auVar250._0_8_ = 0x7fffffff7fffffff;
                auVar250._12_4_ = 0x7fffffff;
              }
              auVar367 = ZEXT464(uVar18);
              auVar225 = vminps_avx(_local_a60,_local_a80);
              auVar161 = vmaxps_avx(_local_a60,_local_a80);
              auVar118 = vminps_avx(_local_a70,_local_a90);
              auVar203 = vminps_avx(auVar225,auVar118);
              auVar225 = vmaxps_avx(_local_a70,_local_a90);
              auVar118 = vmaxps_avx(auVar161,auVar225);
              auVar161 = vandps_avx(auVar203,auVar250);
              auVar225 = vandps_avx(auVar118,auVar250);
              auVar161 = vmaxps_avx(auVar161,auVar225);
              auVar225 = vmovshdup_avx(auVar161);
              auVar225 = vmaxss_avx(auVar225,auVar161);
              auVar161 = vshufpd_avx(auVar161,auVar161,1);
              auVar161 = vmaxss_avx(auVar161,auVar225);
              local_a20._0_4_ = auVar161._0_4_ * 1.9073486e-06;
              local_740._0_4_ = fVar110 * 1.9073486e-06;
              local_7e0._0_16_ = vshufps_avx(auVar118,auVar118,0xff);
              lVar102 = 4;
              do {
                local_b20._0_4_ = 1.0 - fVar300;
                auVar161 = vshufps_avx(ZEXT416((uint)fVar300),ZEXT416((uint)fVar300),0);
                fVar110 = auVar161._0_4_;
                fVar111 = auVar161._4_4_;
                fVar217 = auVar161._8_4_;
                fVar237 = auVar161._12_4_;
                auVar161 = vshufps_avx(ZEXT416((uint)local_b20._0_4_),ZEXT416((uint)local_b20._0_4_)
                                       ,0);
                fVar238 = auVar161._0_4_;
                fVar239 = auVar161._4_4_;
                fVar241 = auVar161._8_4_;
                fVar259 = auVar161._12_4_;
                fVar261 = (float)local_a70._0_4_ * fVar110 + (float)local_a80._0_4_ * fVar238;
                fVar264 = (float)local_a70._4_4_ * fVar111 + (float)local_a80._4_4_ * fVar239;
                fVar273 = fStack_a68 * fVar217 + fStack_a78 * fVar241;
                fVar290 = fStack_a64 * fVar237 + fStack_a74 * fVar259;
                auVar279._0_4_ =
                     fVar238 * ((float)local_a80._0_4_ * fVar110 + fVar238 * (float)local_a60._0_4_)
                     + fVar110 * fVar261;
                auVar279._4_4_ =
                     fVar239 * ((float)local_a80._4_4_ * fVar111 + fVar239 * (float)local_a60._4_4_)
                     + fVar111 * fVar264;
                auVar279._8_4_ =
                     fVar241 * (fStack_a78 * fVar217 + fVar241 * fStack_a58) + fVar217 * fVar273;
                auVar279._12_4_ =
                     fVar259 * (fStack_a74 * fVar237 + fVar259 * fStack_a54) + fVar237 * fVar290;
                auVar226._0_4_ =
                     fVar238 * fVar261 +
                     fVar110 * (fVar110 * (float)local_a90._0_4_ + (float)local_a70._0_4_ * fVar238)
                ;
                auVar226._4_4_ =
                     fVar239 * fVar264 +
                     fVar111 * (fVar111 * (float)local_a90._4_4_ + (float)local_a70._4_4_ * fVar239)
                ;
                auVar226._8_4_ =
                     fVar241 * fVar273 + fVar217 * (fVar217 * fStack_a88 + fStack_a68 * fVar241);
                auVar226._12_4_ =
                     fVar259 * fVar290 + fVar237 * (fVar237 * fStack_a84 + fStack_a64 * fVar259);
                auVar161 = vshufps_avx(auVar367._0_16_,auVar367._0_16_,0);
                auVar169._0_4_ = auVar161._0_4_ * (float)local_950._0_4_ + 0.0;
                auVar169._4_4_ = auVar161._4_4_ * (float)local_950._4_4_ + 0.0;
                auVar169._8_4_ = auVar161._8_4_ * fStack_948 + 0.0;
                auVar169._12_4_ = auVar161._12_4_ * fStack_944 + 0.0;
                auVar122._0_4_ = fVar238 * auVar279._0_4_ + fVar110 * auVar226._0_4_;
                auVar122._4_4_ = fVar239 * auVar279._4_4_ + fVar111 * auVar226._4_4_;
                auVar122._8_4_ = fVar241 * auVar279._8_4_ + fVar217 * auVar226._8_4_;
                auVar122._12_4_ = fVar259 * auVar279._12_4_ + fVar237 * auVar226._12_4_;
                local_940._0_16_ = auVar122;
                auVar161 = vsubps_avx(auVar169,auVar122);
                _local_b00 = auVar161;
                auVar161 = vdpps_avx(auVar161,auVar161,0x7f);
                fVar110 = auVar161._0_4_;
                local_be0 = auVar367._0_4_;
                if (fVar110 < 0.0) {
                  local_b20._0_16_ = ZEXT416((uint)local_b20._0_4_);
                  local_ac0._0_16_ = auVar279;
                  local_ae0._0_16_ = auVar226;
                  fVar111 = sqrtf(fVar110);
                  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar226 = local_ae0._0_16_;
                  auVar279 = local_ac0._0_16_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar161,auVar161);
                  fVar111 = auVar225._0_4_;
                }
                auVar225 = vsubps_avx(auVar226,auVar279);
                auVar306._0_4_ = auVar225._0_4_ * 3.0;
                auVar306._4_4_ = auVar225._4_4_ * 3.0;
                auVar306._8_4_ = auVar225._8_4_ * 3.0;
                auVar306._12_4_ = auVar225._12_4_ * 3.0;
                auVar225 = vshufps_avx(ZEXT416((uint)(fVar300 * 6.0)),ZEXT416((uint)(fVar300 * 6.0))
                                       ,0);
                auVar118 = ZEXT416((uint)(((float)local_b20._0_4_ - (fVar300 + fVar300)) * 6.0));
                auVar203 = vshufps_avx(auVar118,auVar118,0);
                auVar118 = ZEXT416((uint)((fVar300 -
                                          ((float)local_b20._0_4_ + (float)local_b20._0_4_)) * 6.0))
                ;
                auVar222 = vshufps_avx(auVar118,auVar118,0);
                auVar25 = vshufps_avx(ZEXT416((uint)((float)local_b20._0_4_ * 6.0)),
                                      ZEXT416((uint)((float)local_b20._0_4_ * 6.0)),0);
                auVar118 = vdpps_avx(auVar306,auVar306,0x7f);
                auVar170._0_4_ =
                     auVar25._0_4_ * (float)local_a60._0_4_ +
                     auVar222._0_4_ * (float)local_a80._0_4_ +
                     auVar225._0_4_ * (float)local_a90._0_4_ +
                     auVar203._0_4_ * (float)local_a70._0_4_;
                auVar170._4_4_ =
                     auVar25._4_4_ * (float)local_a60._4_4_ +
                     auVar222._4_4_ * (float)local_a80._4_4_ +
                     auVar225._4_4_ * (float)local_a90._4_4_ +
                     auVar203._4_4_ * (float)local_a70._4_4_;
                auVar170._8_4_ =
                     auVar25._8_4_ * fStack_a58 +
                     auVar222._8_4_ * fStack_a78 +
                     auVar225._8_4_ * fStack_a88 + auVar203._8_4_ * fStack_a68;
                auVar170._12_4_ =
                     auVar25._12_4_ * fStack_a54 +
                     auVar222._12_4_ * fStack_a74 +
                     auVar225._12_4_ * fStack_a84 + auVar203._12_4_ * fStack_a64;
                auVar225 = vblendps_avx(auVar118,_DAT_01feba10,0xe);
                auVar203 = vrsqrtss_avx(auVar225,auVar225);
                fVar237 = auVar203._0_4_;
                fVar217 = auVar118._0_4_;
                auVar203 = vdpps_avx(auVar306,auVar170,0x7f);
                auVar222 = vshufps_avx(auVar118,auVar118,0);
                auVar171._0_4_ = auVar170._0_4_ * auVar222._0_4_;
                auVar171._4_4_ = auVar170._4_4_ * auVar222._4_4_;
                auVar171._8_4_ = auVar170._8_4_ * auVar222._8_4_;
                auVar171._12_4_ = auVar170._12_4_ * auVar222._12_4_;
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                auVar251._0_4_ = auVar306._0_4_ * auVar203._0_4_;
                auVar251._4_4_ = auVar306._4_4_ * auVar203._4_4_;
                auVar251._8_4_ = auVar306._8_4_ * auVar203._8_4_;
                auVar251._12_4_ = auVar306._12_4_ * auVar203._12_4_;
                auVar25 = vsubps_avx(auVar171,auVar251);
                auVar203 = vrcpss_avx(auVar225,auVar225);
                auVar225 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(local_be0 * (float)local_740._0_4_)));
                auVar203 = ZEXT416((uint)(auVar203._0_4_ * (2.0 - fVar217 * auVar203._0_4_)));
                auVar203 = vshufps_avx(auVar203,auVar203,0);
                uVar104 = CONCAT44(auVar306._4_4_,auVar306._0_4_);
                auVar280._0_8_ = uVar104 ^ 0x8000000080000000;
                auVar280._8_4_ = -auVar306._8_4_;
                auVar280._12_4_ = -auVar306._12_4_;
                auVar222 = ZEXT416((uint)(fVar237 * 1.5 +
                                         fVar217 * -0.5 * fVar237 * fVar237 * fVar237));
                auVar222 = vshufps_avx(auVar222,auVar222,0);
                auVar227._0_4_ = auVar222._0_4_ * auVar25._0_4_ * auVar203._0_4_;
                auVar227._4_4_ = auVar222._4_4_ * auVar25._4_4_ * auVar203._4_4_;
                auVar227._8_4_ = auVar222._8_4_ * auVar25._8_4_ * auVar203._8_4_;
                auVar227._12_4_ = auVar222._12_4_ * auVar25._12_4_ * auVar203._12_4_;
                auVar353._0_4_ = auVar306._0_4_ * auVar222._0_4_;
                auVar353._4_4_ = auVar306._4_4_ * auVar222._4_4_;
                auVar353._8_4_ = auVar306._8_4_ * auVar222._8_4_;
                auVar353._12_4_ = auVar306._12_4_ * auVar222._12_4_;
                local_b20._0_16_ = auVar306;
                local_ac0._0_4_ = auVar225._0_4_;
                if (fVar217 < 0.0) {
                  local_ae0._0_4_ = fVar111;
                  local_980._0_16_ = auVar280;
                  local_9a0._0_16_ = auVar353;
                  local_9c0._0_16_ = auVar227;
                  fVar237 = sqrtf(fVar217);
                  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar227 = local_9c0._0_16_;
                  auVar280 = local_980._0_16_;
                  auVar353 = local_9a0._0_16_;
                  fVar217 = (float)local_ac0._0_4_;
                  fVar111 = (float)local_ae0._0_4_;
                }
                else {
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  fVar237 = auVar118._0_4_;
                  fVar217 = auVar225._0_4_;
                }
                auVar225 = vdpps_avx(_local_b00,auVar353,0x7f);
                fVar111 = ((float)local_a20._0_4_ / fVar237) * (fVar111 + 1.0) +
                          fVar217 + fVar111 * (float)local_a20._0_4_;
                auVar118 = vdpps_avx(auVar280,auVar353,0x7f);
                auVar203 = vdpps_avx(_local_b00,auVar227,0x7f);
                auVar222 = vdpps_avx(_local_950,auVar353,0x7f);
                auVar25 = vdpps_avx(_local_b00,auVar280,0x7f);
                fVar237 = auVar118._0_4_ + auVar203._0_4_;
                fVar238 = auVar225._0_4_;
                auVar123._0_4_ = fVar238 * fVar238;
                auVar123._4_4_ = auVar225._4_4_ * auVar225._4_4_;
                auVar123._8_4_ = auVar225._8_4_ * auVar225._8_4_;
                auVar123._12_4_ = auVar225._12_4_ * auVar225._12_4_;
                auVar203 = vsubps_avx(auVar161,auVar123);
                auVar118 = vdpps_avx(_local_b00,_local_950,0x7f);
                fVar239 = auVar25._0_4_ - fVar238 * fVar237;
                fVar241 = auVar118._0_4_ - fVar238 * auVar222._0_4_;
                auVar118 = vrsqrtss_avx(auVar203,auVar203);
                fVar259 = auVar203._0_4_;
                fVar238 = auVar118._0_4_;
                fVar238 = fVar238 * 1.5 + fVar259 * -0.5 * fVar238 * fVar238 * fVar238;
                if (fVar259 < 0.0) {
                  local_ae0._0_16_ = auVar225;
                  local_980._0_4_ = fVar111;
                  local_9a0._0_16_ = ZEXT416((uint)fVar237);
                  local_9c0._0_16_ = auVar222;
                  local_760._0_4_ = fVar239;
                  local_780._0_4_ = fVar241;
                  local_7a0._0_4_ = fVar238;
                  fVar259 = sqrtf(fVar259);
                  auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar111 = (float)local_980._0_4_;
                  fVar238 = (float)local_7a0._0_4_;
                  fVar239 = (float)local_760._0_4_;
                  fVar241 = (float)local_780._0_4_;
                  auVar222 = local_9c0._0_16_;
                  auVar225 = local_ae0._0_16_;
                  auVar118 = local_9a0._0_16_;
                  fVar217 = (float)local_ac0._0_4_;
                }
                else {
                  auVar118 = vsqrtss_avx(auVar203,auVar203);
                  fVar259 = auVar118._0_4_;
                  auVar118 = ZEXT416((uint)fVar237);
                }
                auVar385 = ZEXT1664(local_b20._0_16_);
                auVar165 = vpermilps_avx(local_940._0_16_,0xff);
                auVar26 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xff);
                fVar239 = fVar239 * fVar238 - auVar26._0_4_;
                auVar252._0_8_ = auVar222._0_8_ ^ 0x8000000080000000;
                auVar252._8_4_ = auVar222._8_4_ ^ 0x80000000;
                auVar252._12_4_ = auVar222._12_4_ ^ 0x80000000;
                auVar281._0_4_ = -fVar239;
                auVar281._4_4_ = 0x80000000;
                auVar281._8_4_ = 0x80000000;
                auVar281._12_4_ = 0x80000000;
                fVar237 = auVar118._0_4_ * fVar241 * fVar238;
                auVar312 = ZEXT464((uint)fVar237);
                auVar203 = vinsertps_avx(ZEXT416((uint)(fVar241 * fVar238)),auVar252,0x10);
                auVar25 = vmovsldup_avx(ZEXT416((uint)(fVar237 - auVar222._0_4_ * fVar239)));
                auVar203 = vdivps_avx(auVar203,auVar25);
                auVar165 = ZEXT416((uint)(fVar259 - auVar165._0_4_));
                auVar222 = vinsertps_avx(auVar225,auVar165,0x10);
                auVar228._0_4_ = auVar222._0_4_ * auVar203._0_4_;
                auVar228._4_4_ = auVar222._4_4_ * auVar203._4_4_;
                auVar228._8_4_ = auVar222._8_4_ * auVar203._8_4_;
                auVar228._12_4_ = auVar222._12_4_ * auVar203._12_4_;
                auVar118 = vinsertps_avx(auVar281,auVar118,0x1c);
                auVar118 = vdivps_avx(auVar118,auVar25);
                auVar207._0_4_ = auVar222._0_4_ * auVar118._0_4_;
                auVar207._4_4_ = auVar222._4_4_ * auVar118._4_4_;
                auVar207._8_4_ = auVar222._8_4_ * auVar118._8_4_;
                auVar207._12_4_ = auVar222._12_4_ * auVar118._12_4_;
                auVar118 = vhaddps_avx(auVar228,auVar228);
                auVar203 = vhaddps_avx(auVar207,auVar207);
                fVar300 = fVar300 - auVar118._0_4_;
                local_be0 = local_be0 - auVar203._0_4_;
                auVar367 = ZEXT464((uint)local_be0);
                auVar253._8_4_ = 0x7fffffff;
                auVar253._0_8_ = 0x7fffffff7fffffff;
                auVar253._12_4_ = 0x7fffffff;
                auVar236 = ZEXT1664(auVar253);
                auVar225 = vandps_avx(auVar225,auVar253);
                if (fVar111 <= auVar225._0_4_) {
LAB_0103ed91:
                  bVar78 = false;
                }
                else {
                  auVar225 = vandps_avx(auVar165,auVar253);
                  if ((float)local_7e0._0_4_ * 1.9073486e-06 + fVar217 + fVar111 <= auVar225._0_4_)
                  goto LAB_0103ed91;
                  local_be0 = local_be0 + (float)local_900._0_4_;
                  auVar367 = ZEXT464((uint)local_be0);
                  bVar78 = true;
                  if ((((fVar155 <= local_be0) &&
                       (fVar111 = *(float *)(ray + k * 4 + 0x80), local_be0 <= fVar111)) &&
                      (0.0 <= fVar300)) && (fVar300 <= 1.0)) {
                    auVar161 = vrsqrtss_avx(auVar161,auVar161);
                    fVar217 = auVar161._0_4_;
                    auVar101 = (undefined1  [8])(context->scene->geometries).items[uVar98].ptr;
                    if ((((Geometry *)auVar101)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar161 = ZEXT416((uint)(fVar217 * 1.5 +
                                               fVar110 * -0.5 * fVar217 * fVar217 * fVar217));
                      auVar161 = vshufps_avx(auVar161,auVar161,0);
                      auVar172._0_4_ = auVar161._0_4_ * (float)local_b00._0_4_;
                      auVar172._4_4_ = auVar161._4_4_ * (float)local_b00._4_4_;
                      auVar172._8_4_ = auVar161._8_4_ * fStack_af8;
                      auVar172._12_4_ = auVar161._12_4_ * fStack_af4;
                      auVar124._0_4_ = local_b20._0_4_ + auVar26._0_4_ * auVar172._0_4_;
                      auVar124._4_4_ = local_b20._4_4_ + auVar26._4_4_ * auVar172._4_4_;
                      auVar124._8_4_ = local_b20._8_4_ + auVar26._8_4_ * auVar172._8_4_;
                      auVar124._12_4_ = local_b20._12_4_ + auVar26._12_4_ * auVar172._12_4_;
                      auVar161 = vshufps_avx(auVar172,auVar172,0xc9);
                      auVar225 = vshufps_avx(local_b20._0_16_,local_b20._0_16_,0xc9);
                      auVar173._0_4_ = auVar225._0_4_ * auVar172._0_4_;
                      auVar173._4_4_ = auVar225._4_4_ * auVar172._4_4_;
                      auVar173._8_4_ = auVar225._8_4_ * auVar172._8_4_;
                      auVar173._12_4_ = auVar225._12_4_ * auVar172._12_4_;
                      auVar208._0_4_ = local_b20._0_4_ * auVar161._0_4_;
                      auVar208._4_4_ = local_b20._4_4_ * auVar161._4_4_;
                      auVar208._8_4_ = local_b20._8_4_ * auVar161._8_4_;
                      auVar208._12_4_ = local_b20._12_4_ * auVar161._12_4_;
                      auVar118 = vsubps_avx(auVar208,auVar173);
                      auVar161 = vshufps_avx(auVar118,auVar118,0xc9);
                      auVar225 = vshufps_avx(auVar124,auVar124,0xc9);
                      auVar209._0_4_ = auVar225._0_4_ * auVar161._0_4_;
                      auVar209._4_4_ = auVar225._4_4_ * auVar161._4_4_;
                      auVar209._8_4_ = auVar225._8_4_ * auVar161._8_4_;
                      auVar209._12_4_ = auVar225._12_4_ * auVar161._12_4_;
                      auVar161 = vshufps_avx(auVar118,auVar118,0xd2);
                      auVar125._0_4_ = auVar124._0_4_ * auVar161._0_4_;
                      auVar125._4_4_ = auVar124._4_4_ * auVar161._4_4_;
                      auVar125._8_4_ = auVar124._8_4_ * auVar161._8_4_;
                      auVar125._12_4_ = auVar124._12_4_ * auVar161._12_4_;
                      auVar161 = vsubps_avx(auVar209,auVar125);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar101)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        uVar9 = vextractps_avx(auVar161,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar9;
                        uVar9 = vextractps_avx(auVar161,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                        *(int *)(ray + k * 4 + 0xe0) = auVar161._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar300;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9e8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar98;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar225 = vshufps_avx(ZEXT416((uint)fVar300),ZEXT416((uint)fVar300),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar161,auVar161,0x55);
                        auVar118 = vshufps_avx(auVar161,auVar161,0xaa);
                        local_6e0 = vshufps_avx(auVar161,auVar161,0);
                        auStack_6f0 = auVar118;
                        local_6d0 = auVar225;
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar18 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar18,uVar18);
                        _uStack_688 = CONCAT44(uVar18,uVar18);
                        uVar18 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar18,uVar18);
                        _uStack_678 = CONCAT44(uVar18,uVar18);
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        local_b40 = *local_9f0;
                        uStack_b38 = local_9f0[1];
                        local_a50.valid = (int *)&local_b40;
                        local_a50.geometryUserPtr = ((Geometry *)auVar101)->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_700;
                        local_a50.N = 4;
                        local_a50.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar101)->intersectionFilterN != (RTCFilterFunctionN)0x0)
                        {
                          local_b00 = auVar101;
                          auVar312 = ZEXT464((uint)fVar237);
                          auVar385 = ZEXT1664(local_b20._0_16_);
                          (*((Geometry *)auVar101)->intersectionFilterN)(&local_a50);
                          auVar236._8_56_ = extraout_var_00;
                          auVar236._0_8_ = extraout_XMM1_Qa_00;
                          auVar225 = auVar236._0_16_;
                          auVar101 = local_b00;
                        }
                        auVar92._8_8_ = uStack_b38;
                        auVar92._0_8_ = local_b40;
                        if (auVar92 == (undefined1  [16])0x0) {
                          auVar161 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar225 = vpcmpeqd_avx(auVar225,auVar225);
                          auVar161 = auVar161 ^ auVar225;
                          auVar236 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar336 = ZEXT864(0);
                        }
                        else {
                          p_Var17 = context->args->filter;
                          auVar236 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar336 = ZEXT1664(ZEXT816(0));
                          auVar225 = vpcmpeqd_avx(auVar118,auVar118);
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar101)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar312 = ZEXT1664(auVar312._0_16_);
                            auVar385 = ZEXT1664(auVar385._0_16_);
                            (*p_Var17)(&local_a50);
                            auVar225 = vpcmpeqd_avx(auVar225,auVar225);
                            auVar336 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar236 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar93._8_8_ = uStack_b38;
                          auVar93._0_8_ = local_b40;
                          auVar118 = vpcmpeqd_avx(auVar93,_DAT_01feba10);
                          auVar161 = auVar118 ^ auVar225;
                          if (auVar93 != (undefined1  [16])0x0) {
                            auVar118 = auVar118 ^ auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])local_a50.hit);
                            *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x10));
                            *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x20));
                            *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x30));
                            *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x40));
                            *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x50));
                            *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x60));
                            *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x70));
                            *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar118,*(undefined1 (*) [16])
                                                                (local_a50.hit + 0x80));
                            *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar225;
                          }
                        }
                        auVar367 = ZEXT464((uint)local_be0);
                        auVar174._8_8_ = 0x100000001;
                        auVar174._0_8_ = 0x100000001;
                        if ((auVar174 & auVar161) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar111;
                        }
                      }
                    }
                  }
                }
                auVar127 = local_600;
                bVar106 = lVar102 != 0;
                lVar102 = lVar102 + -1;
              } while ((!bVar78) && (bVar106));
              uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar136._4_4_ = uVar9;
              auVar136._0_4_ = uVar9;
              auVar136._8_4_ = uVar9;
              auVar136._12_4_ = uVar9;
              auVar136._16_4_ = uVar9;
              auVar136._20_4_ = uVar9;
              auVar136._24_4_ = uVar9;
              auVar136._28_4_ = uVar9;
              auVar128 = vcmpps_avx(_local_860,auVar136,2);
              local_600 = vandps_avx(auVar128,local_600);
              auVar127 = auVar127 & auVar128;
              uVar104 = local_620._0_8_;
            } while ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar127 >> 0x7f,0) != '\0') ||
                       (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar127 >> 0xbf,0) != '\0') ||
                     (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar127[0x1f] < '\0');
          }
          auVar127 = vandps_avx(local_560,local_540);
          auVar128 = vandps_avx(_local_8e0,_local_880);
          auVar213._0_4_ = (float)local_7c0._0_4_ + local_4a0._0_4_;
          auVar213._4_4_ = (float)local_7c0._4_4_ + local_4a0._4_4_;
          auVar213._8_4_ = fStack_7b8 + local_4a0._8_4_;
          auVar213._12_4_ = fStack_7b4 + local_4a0._12_4_;
          auVar213._16_4_ = fStack_7b0 + local_4a0._16_4_;
          auVar213._20_4_ = fStack_7ac + local_4a0._20_4_;
          auVar213._24_4_ = fStack_7a8 + local_4a0._24_4_;
          auVar213._28_4_ = fStack_7a4 + local_4a0._28_4_;
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar258._4_4_ = uVar9;
          auVar258._0_4_ = uVar9;
          auVar258._8_4_ = uVar9;
          auVar258._12_4_ = uVar9;
          auVar258._16_4_ = uVar9;
          auVar258._20_4_ = uVar9;
          auVar258._24_4_ = uVar9;
          auVar258._28_4_ = uVar9;
          auVar255 = vcmpps_avx(auVar213,auVar258,2);
          auVar127 = vandps_avx(auVar255,auVar127);
          auVar288._0_4_ = (float)local_7c0._0_4_ + local_460._0_4_;
          auVar288._4_4_ = (float)local_7c0._4_4_ + local_460._4_4_;
          auVar288._8_4_ = fStack_7b8 + local_460._8_4_;
          auVar288._12_4_ = fStack_7b4 + local_460._12_4_;
          auVar288._16_4_ = fStack_7b0 + local_460._16_4_;
          auVar288._20_4_ = fStack_7ac + local_460._20_4_;
          auVar288._24_4_ = fStack_7a8 + local_460._24_4_;
          auVar288._28_4_ = fStack_7a4 + local_460._28_4_;
          auVar255 = vcmpps_avx(auVar288,auVar258,2);
          auVar128 = vandps_avx(auVar255,auVar128);
          auVar128 = vorps_avx(auVar127,auVar128);
          if ((((((((auVar128 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar128 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar128 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar128 >> 0x7f,0) != '\0') ||
                (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar128 >> 0xbf,0) != '\0') ||
              (auVar128 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar128[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar128;
            auVar127 = vblendvps_avx(_local_460,_local_4a0,auVar127);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar127;
            auVar95._8_8_ = uStack_908;
            auVar95._0_8_ = local_910;
            uVar10 = vmovlps_avx(auVar95);
            *(undefined8 *)(afStack_140 + uVar99 * 0x18) = uVar10;
            auStack_138[uVar99 * 0x18] = (int)uVar104 + 1;
            uVar99 = (ulong)((int)uVar99 + 1);
          }
        }
        auVar255._8_4_ = 0x3f800000;
        auVar255._0_8_ = &DAT_3f8000003f800000;
        auVar255._12_4_ = 0x3f800000;
        auVar255._16_4_ = 0x3f800000;
        auVar255._20_4_ = 0x3f800000;
        auVar255._24_4_ = 0x3f800000;
        auVar255._28_4_ = 0x3f800000;
      }
    }
    do {
      if ((int)uVar99 == 0) {
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar126._4_4_ = uVar9;
        auVar126._0_4_ = uVar9;
        auVar126._8_4_ = uVar9;
        auVar126._12_4_ = uVar9;
        auVar161 = vcmpps_avx(local_4d0,auVar126,2);
        uVar98 = vmovmskps_avx(auVar161);
        uVar98 = (uint)local_8e8 - 1 & (uint)local_8e8 & uVar98;
        if (uVar98 == 0) {
          return;
        }
        goto LAB_0103c769;
      }
      uVar105 = (ulong)((int)uVar99 - 1);
      lVar102 = uVar105 * 0x60;
      auVar127 = *(undefined1 (*) [32])(auStack_160 + lVar102);
      auVar137._0_4_ = auVar127._0_4_ + (float)local_7c0._0_4_;
      auVar137._4_4_ = auVar127._4_4_ + (float)local_7c0._4_4_;
      auVar137._8_4_ = auVar127._8_4_ + fStack_7b8;
      auVar137._12_4_ = auVar127._12_4_ + fStack_7b4;
      auVar137._16_4_ = auVar127._16_4_ + fStack_7b0;
      auVar137._20_4_ = auVar127._20_4_ + fStack_7ac;
      auVar137._24_4_ = auVar127._24_4_ + fStack_7a8;
      auVar137._28_4_ = auVar127._28_4_ + fStack_7a4;
      uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar235._4_4_ = uVar9;
      auVar235._0_4_ = uVar9;
      auVar235._8_4_ = uVar9;
      auVar235._12_4_ = uVar9;
      auVar235._16_4_ = uVar9;
      auVar235._20_4_ = uVar9;
      auVar235._24_4_ = uVar9;
      auVar235._28_4_ = uVar9;
      auVar175 = vcmpps_avx(auVar137,auVar235,2);
      auVar128 = vandps_avx(auVar175,*(undefined1 (*) [32])(auStack_180 + lVar102));
      _local_700 = auVar128;
      auVar31 = *(undefined1 (*) [32])(auStack_180 + lVar102) & auVar175;
      bVar84 = (auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar85 = (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar83 = (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar82 = SUB321(auVar31 >> 0x7f,0) == '\0';
      bVar81 = (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar80 = SUB321(auVar31 >> 0xbf,0) == '\0';
      bVar106 = (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar78 = -1 < auVar31[0x1f];
      if (((((((!bVar84 || !bVar85) || !bVar83) || !bVar82) || !bVar81) || !bVar80) || !bVar106) ||
          !bVar78) {
        auVar214._8_4_ = 0x7f800000;
        auVar214._0_8_ = 0x7f8000007f800000;
        auVar214._12_4_ = 0x7f800000;
        auVar214._16_4_ = 0x7f800000;
        auVar214._20_4_ = 0x7f800000;
        auVar214._24_4_ = 0x7f800000;
        auVar214._28_4_ = 0x7f800000;
        auVar127 = vblendvps_avx(auVar214,auVar127,auVar128);
        auVar175 = vshufps_avx(auVar127,auVar127,0xb1);
        auVar175 = vminps_avx(auVar127,auVar175);
        auVar31 = vshufpd_avx(auVar175,auVar175,5);
        auVar31 = vminps_avx(auVar175,auVar31);
        auVar175 = vperm2f128_avx(auVar31,auVar31,1);
        auVar31 = vminps_avx(auVar31,auVar175);
        auVar127 = vcmpps_avx(auVar127,auVar31,0);
        auVar31 = auVar128 & auVar127;
        if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar31 >> 0x7f,0) != '\0') ||
              (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar31 >> 0xbf,0) != '\0') ||
            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar31[0x1f] < '\0') {
          auVar128 = vandps_avx(auVar127,auVar128);
        }
        fVar300 = afStack_140[uVar105 * 0x18 + 1];
        uVar104 = (ulong)auStack_138[uVar105 * 0x18];
        uVar103 = vmovmskps_avx(auVar128);
        uVar18 = 0;
        if (uVar103 != 0) {
          for (; (uVar103 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        fVar110 = afStack_140[uVar105 * 0x18];
        *(undefined4 *)(local_700 + (ulong)uVar18 * 4) = 0;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar105 = uVar99;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar102) = _local_700;
        auVar161 = vshufps_avx(ZEXT416((uint)(fVar300 - fVar110)),ZEXT416((uint)(fVar300 - fVar110))
                               ,0);
        local_4a0._4_4_ = fVar110 + auVar161._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar110 + auVar161._0_4_ * 0.0;
        fStack_498 = fVar110 + auVar161._8_4_ * 0.2857143;
        fStack_494 = fVar110 + auVar161._12_4_ * 0.42857146;
        fStack_490 = fVar110 + auVar161._0_4_ * 0.5714286;
        fStack_48c = fVar110 + auVar161._4_4_ * 0.71428573;
        fStack_488 = fVar110 + auVar161._8_4_ * 0.8571429;
        fStack_484 = fVar110 + auVar161._12_4_;
        local_910 = *(undefined8 *)(local_4a0 + (ulong)uVar18 * 4);
        uStack_908 = 0;
      }
      uVar99 = uVar105;
      auVar236 = ZEXT3264(auVar175);
    } while (((((((bVar84 && bVar85) && bVar83) && bVar82) && bVar81) && bVar80) && bVar106) &&
             bVar78);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }